

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  Primitive PVar9;
  Geometry *pGVar10;
  __int_type_conflict _Var11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  ulong uVar79;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  uint uVar89;
  ulong uVar90;
  ulong uVar91;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar92;
  byte bVar93;
  uint uVar94;
  long lVar95;
  long lVar96;
  ulong uVar97;
  uint uVar98;
  bool bVar99;
  byte bVar100;
  vint4 bi_2;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar126;
  float fVar151;
  float fVar152;
  vint4 ai;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar127;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar139 [32];
  float fVar153;
  float fVar155;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar154;
  float fVar156;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar160;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar173 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar220;
  vint4 bi_1;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar221;
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar219 [64];
  float fVar242;
  float fVar243;
  vint4 bi;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [28];
  float fVar245;
  float fVar246;
  undefined1 auVar234 [32];
  float fVar244;
  float fVar247;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  float fVar248;
  float fVar249;
  float fVar258;
  float fVar260;
  vint4 ai_1;
  undefined1 auVar250 [16];
  float fVar263;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar259;
  float fVar261;
  float fVar264;
  float fVar265;
  float fVar267;
  float fVar268;
  undefined1 auVar255 [28];
  float fVar262;
  float fVar266;
  float fVar269;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  float fVar270;
  float fVar279;
  float fVar280;
  vint4 ai_2;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar281;
  undefined1 auVar273 [16];
  undefined1 auVar274 [28];
  float fVar282;
  float fVar283;
  float fVar284;
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar292;
  float fVar295;
  undefined1 auVar288 [16];
  float fVar293;
  float fVar294;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar302;
  float fVar303;
  float fVar305;
  float fVar306;
  float fVar308;
  float fVar309;
  float fVar310;
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  float fVar301;
  float fVar304;
  float fVar307;
  undefined1 auVar291 [64];
  float s;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar319;
  float fVar322;
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  float fVar320;
  float fVar321;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar327;
  float fVar329;
  float fVar330;
  float fVar332;
  float fVar333;
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  float fVar326;
  float fVar328;
  float fVar331;
  undefined1 auVar318 [64];
  float fVar334;
  float fVar335;
  float fVar341;
  float fVar343;
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  float fVar345;
  float fVar347;
  float fVar348;
  float fVar349;
  undefined1 auVar339 [32];
  float fVar342;
  float fVar344;
  float fVar346;
  float fVar350;
  undefined1 auVar340 [32];
  float fVar351;
  float fVar360;
  float fVar361;
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  undefined1 auVar359 [64];
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar375;
  float fVar378;
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  float fVar376;
  float fVar380;
  float fVar382;
  float fVar384;
  float fVar386;
  undefined1 auVar373 [32];
  float fVar377;
  float fVar379;
  float fVar381;
  float fVar383;
  float fVar385;
  float fVar387;
  undefined1 auVar374 [32];
  float fVar388;
  float fVar391;
  float fVar392;
  undefined1 auVar389 [16];
  float fVar393;
  float fVar394;
  float fVar395;
  float fVar396;
  undefined1 auVar390 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  float fVar399;
  float fVar402;
  float fVar403;
  undefined1 auVar400 [16];
  float fVar404;
  float fVar405;
  float fVar406;
  undefined1 auVar401 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_c88;
  float local_bf0;
  float fStack_bec;
  float fStack_be8;
  float fStack_be4;
  undefined1 local_be0 [8];
  float fStack_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float fStack_bc8;
  undefined1 local_ba0 [8];
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  undefined4 uStack_b84;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  float local_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float local_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  RTCFilterFunctionNArguments local_a10;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [16];
  Primitive *local_8b0;
  ulong local_8a8;
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [16];
  undefined1 local_810 [16];
  RTCHitN local_800 [16];
  undefined1 auStack_7f0 [16];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [16];
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined1 local_7a0 [16];
  uint local_790;
  uint uStack_78c;
  uint uStack_788;
  uint uStack_784;
  uint uStack_780;
  uint uStack_77c;
  uint uStack_778;
  uint uStack_774;
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [16];
  undefined1 auStack_6d0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar9 = prim[1];
  uVar90 = (ulong)(byte)PVar9;
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 4 + 6)));
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 5 + 6)));
  lVar95 = uVar90 * 0x25;
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 6 + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 0xf + 6)));
  auVar228 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar9 * 0x10 + 6)));
  auVar208 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 0x11 + 6)));
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 0x1a + 6)));
  auVar190 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 0x1b + 6)));
  auVar161 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 0x1c + 6)));
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar18 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar18 = vinsertps_avx(auVar18,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar334 = *(float *)(prim + lVar95 + 0x12);
  auVar17 = vsubps_avx(auVar17,*(undefined1 (*) [16])(prim + lVar95 + 6));
  auVar204._0_4_ = fVar334 * auVar17._0_4_;
  auVar204._4_4_ = fVar334 * auVar17._4_4_;
  auVar204._8_4_ = fVar334 * auVar17._8_4_;
  auVar204._12_4_ = fVar334 * auVar17._12_4_;
  auVar101._0_4_ = fVar334 * auVar18._0_4_;
  auVar101._4_4_ = fVar334 * auVar18._4_4_;
  auVar101._8_4_ = fVar334 * auVar18._8_4_;
  auVar101._12_4_ = fVar334 * auVar18._12_4_;
  auVar15 = vcvtdq2ps_avx(auVar130);
  auVar16 = vcvtdq2ps_avx(auVar22);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar228 = vcvtdq2ps_avx(auVar228);
  auVar208 = vcvtdq2ps_avx(auVar208);
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar17 = vshufps_avx(auVar101,auVar101,0);
  auVar18 = vshufps_avx(auVar101,auVar101,0x55);
  auVar130 = vshufps_avx(auVar101,auVar101,0xaa);
  fVar334 = auVar130._0_4_;
  fVar341 = auVar130._4_4_;
  fVar343 = auVar130._8_4_;
  fVar345 = auVar130._12_4_;
  fVar126 = auVar18._0_4_;
  fVar19 = auVar18._4_4_;
  fVar20 = auVar18._8_4_;
  fVar153 = auVar18._12_4_;
  fVar270 = auVar17._0_4_;
  fVar279 = auVar17._4_4_;
  fVar280 = auVar17._8_4_;
  fVar281 = auVar17._12_4_;
  auVar271._0_4_ = fVar270 * auVar15._0_4_ + auVar16._0_4_ * fVar126 + auVar23._0_4_ * fVar334;
  auVar271._4_4_ = fVar279 * auVar15._4_4_ + auVar16._4_4_ * fVar19 + auVar23._4_4_ * fVar341;
  auVar271._8_4_ = fVar280 * auVar15._8_4_ + auVar16._8_4_ * fVar20 + auVar23._8_4_ * fVar343;
  auVar271._12_4_ = fVar281 * auVar15._12_4_ + auVar16._12_4_ * fVar153 + auVar23._12_4_ * fVar345;
  auVar250._0_4_ = auVar228._0_4_ * fVar126 + auVar208._0_4_ * fVar334 + fVar270 * auVar24._0_4_;
  auVar250._4_4_ = auVar228._4_4_ * fVar19 + auVar208._4_4_ * fVar341 + fVar279 * auVar24._4_4_;
  auVar250._8_4_ = auVar228._8_4_ * fVar20 + auVar208._8_4_ * fVar343 + fVar280 * auVar24._8_4_;
  auVar250._12_4_ = auVar228._12_4_ * fVar153 + auVar208._12_4_ * fVar345 + fVar281 * auVar24._12_4_
  ;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar90 * 7 + 6);
  auVar101 = vpmovsxwd_avx(auVar17);
  auVar17 = vcvtdq2ps_avx(auVar107);
  auVar336._0_4_ = fVar270 * auVar17._0_4_ + fVar126 * auVar190._0_4_ + auVar161._0_4_ * fVar334;
  auVar336._4_4_ = fVar279 * auVar17._4_4_ + fVar19 * auVar190._4_4_ + auVar161._4_4_ * fVar341;
  auVar336._8_4_ = fVar280 * auVar17._8_4_ + fVar20 * auVar190._8_4_ + auVar161._8_4_ * fVar343;
  auVar336._12_4_ = fVar281 * auVar17._12_4_ + fVar153 * auVar190._12_4_ + auVar161._12_4_ * fVar345
  ;
  auVar18 = vshufps_avx(auVar204,auVar204,0xaa);
  fVar334 = auVar18._0_4_;
  fVar341 = auVar18._4_4_;
  fVar343 = auVar18._8_4_;
  fVar345 = auVar18._12_4_;
  auVar18 = vshufps_avx(auVar204,auVar204,0x55);
  fVar126 = auVar18._0_4_;
  fVar19 = auVar18._4_4_;
  fVar20 = auVar18._8_4_;
  fVar153 = auVar18._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar90 * 0xb + 6);
  auVar107 = vpmovsxwd_avx(auVar18);
  auVar130._8_8_ = 0;
  auVar130._0_8_ = *(ulong *)(prim + uVar90 * 9 + 6);
  auVar103 = vpmovsxwd_avx(auVar130);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar90 * 0xd + 6);
  auVar22 = vpmovsxwd_avx(auVar22);
  auVar18 = vshufps_avx(auVar204,auVar204,0);
  fVar270 = auVar18._0_4_;
  fVar279 = auVar18._4_4_;
  fVar280 = auVar18._8_4_;
  fVar281 = auVar18._12_4_;
  auVar225._0_4_ = auVar16._0_4_ * fVar126 + auVar23._0_4_ * fVar334 + fVar270 * auVar15._0_4_;
  auVar225._4_4_ = auVar16._4_4_ * fVar19 + auVar23._4_4_ * fVar341 + fVar279 * auVar15._4_4_;
  auVar225._8_4_ = auVar16._8_4_ * fVar20 + auVar23._8_4_ * fVar343 + fVar280 * auVar15._8_4_;
  auVar225._12_4_ = auVar16._12_4_ * fVar153 + auVar23._12_4_ * fVar345 + fVar281 * auVar15._12_4_;
  auVar205._0_4_ = auVar228._0_4_ * fVar126 + auVar208._0_4_ * fVar334 + fVar270 * auVar24._0_4_;
  auVar205._4_4_ = auVar228._4_4_ * fVar19 + auVar208._4_4_ * fVar341 + fVar279 * auVar24._4_4_;
  auVar205._8_4_ = auVar228._8_4_ * fVar20 + auVar208._8_4_ * fVar343 + fVar280 * auVar24._8_4_;
  auVar205._12_4_ = auVar228._12_4_ * fVar153 + auVar208._12_4_ * fVar345 + fVar281 * auVar24._12_4_
  ;
  auVar186._0_4_ = fVar270 * auVar17._0_4_ + fVar126 * auVar190._0_4_ + auVar161._0_4_ * fVar334;
  auVar186._4_4_ = fVar279 * auVar17._4_4_ + fVar19 * auVar190._4_4_ + auVar161._4_4_ * fVar341;
  auVar186._8_4_ = fVar280 * auVar17._8_4_ + fVar20 * auVar190._8_4_ + auVar161._8_4_ * fVar343;
  auVar186._12_4_ = fVar281 * auVar17._12_4_ + fVar153 * auVar190._12_4_ + auVar161._12_4_ * fVar345
  ;
  auVar370._8_4_ = 0x7fffffff;
  auVar370._0_8_ = 0x7fffffff7fffffff;
  auVar370._12_4_ = 0x7fffffff;
  auVar17 = vandps_avx(auVar370,auVar271);
  auVar352._8_4_ = 0x219392ef;
  auVar352._0_8_ = 0x219392ef219392ef;
  auVar352._12_4_ = 0x219392ef;
  auVar17 = vcmpps_avx(auVar17,auVar352,1);
  auVar18 = vblendvps_avx(auVar271,auVar352,auVar17);
  auVar17 = vandps_avx(auVar370,auVar250);
  auVar17 = vcmpps_avx(auVar17,auVar352,1);
  auVar130 = vblendvps_avx(auVar250,auVar352,auVar17);
  auVar17 = vandps_avx(auVar336,auVar370);
  auVar17 = vcmpps_avx(auVar17,auVar352,1);
  auVar17 = vblendvps_avx(auVar336,auVar352,auVar17);
  auVar15 = vrcpps_avx(auVar18);
  fVar248 = auVar15._0_4_;
  auVar102._0_4_ = fVar248 * auVar18._0_4_;
  fVar258 = auVar15._4_4_;
  auVar102._4_4_ = fVar258 * auVar18._4_4_;
  fVar260 = auVar15._8_4_;
  auVar102._8_4_ = fVar260 * auVar18._8_4_;
  fVar263 = auVar15._12_4_;
  auVar102._12_4_ = fVar263 * auVar18._12_4_;
  auVar353._8_4_ = 0x3f800000;
  auVar353._0_8_ = 0x3f8000003f800000;
  auVar353._12_4_ = 0x3f800000;
  auVar18 = vsubps_avx(auVar353,auVar102);
  fVar248 = fVar248 + fVar248 * auVar18._0_4_;
  fVar258 = fVar258 + fVar258 * auVar18._4_4_;
  fVar260 = fVar260 + fVar260 * auVar18._8_4_;
  fVar263 = fVar263 + fVar263 * auVar18._12_4_;
  auVar18 = vrcpps_avx(auVar130);
  fVar270 = auVar18._0_4_;
  auVar272._0_4_ = fVar270 * auVar130._0_4_;
  fVar279 = auVar18._4_4_;
  auVar272._4_4_ = fVar279 * auVar130._4_4_;
  fVar280 = auVar18._8_4_;
  auVar272._8_4_ = fVar280 * auVar130._8_4_;
  fVar281 = auVar18._12_4_;
  auVar272._12_4_ = fVar281 * auVar130._12_4_;
  auVar18 = vsubps_avx(auVar353,auVar272);
  fVar270 = fVar270 + fVar270 * auVar18._0_4_;
  fVar279 = fVar279 + fVar279 * auVar18._4_4_;
  fVar280 = fVar280 + fVar280 * auVar18._8_4_;
  fVar281 = fVar281 + fVar281 * auVar18._12_4_;
  auVar18 = vrcpps_avx(auVar17);
  fVar334 = auVar18._0_4_;
  auVar337._0_4_ = auVar17._0_4_ * fVar334;
  fVar341 = auVar18._4_4_;
  auVar337._4_4_ = auVar17._4_4_ * fVar341;
  fVar343 = auVar18._8_4_;
  auVar337._8_4_ = auVar17._8_4_ * fVar343;
  fVar345 = auVar18._12_4_;
  auVar337._12_4_ = auVar17._12_4_ * fVar345;
  auVar17 = vsubps_avx(auVar353,auVar337);
  fVar334 = auVar17._0_4_ * fVar334 + fVar334;
  fVar341 = auVar17._4_4_ * fVar341 + fVar341;
  fVar343 = auVar17._8_4_ * fVar343 + fVar343;
  fVar345 = auVar17._12_4_ * fVar345 + fVar345;
  auVar130 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) -
                                          *(float *)(prim + lVar95 + 0x16)) *
                                         *(float *)(prim + lVar95 + 0x1a))),0);
  auVar17 = vcvtdq2ps_avx(auVar101);
  auVar18 = vcvtdq2ps_avx(auVar107);
  auVar18 = vsubps_avx(auVar18,auVar17);
  fVar126 = auVar130._0_4_;
  fVar19 = auVar130._4_4_;
  fVar20 = auVar130._8_4_;
  fVar153 = auVar130._12_4_;
  auVar128._0_4_ = auVar18._0_4_ * fVar126 + auVar17._0_4_;
  auVar128._4_4_ = auVar18._4_4_ * fVar19 + auVar17._4_4_;
  auVar128._8_4_ = auVar18._8_4_ * fVar20 + auVar17._8_4_;
  auVar128._12_4_ = auVar18._12_4_ * fVar153 + auVar17._12_4_;
  auVar17 = vcvtdq2ps_avx(auVar103);
  auVar18 = vcvtdq2ps_avx(auVar22);
  auVar18 = vsubps_avx(auVar18,auVar17);
  auVar288._0_4_ = auVar18._0_4_ * fVar126 + auVar17._0_4_;
  auVar288._4_4_ = auVar18._4_4_ * fVar19 + auVar17._4_4_;
  auVar288._8_4_ = auVar18._8_4_ * fVar20 + auVar17._8_4_;
  auVar288._12_4_ = auVar18._12_4_ * fVar153 + auVar17._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar90 * 0x12 + 6);
  auVar17 = vpmovsxwd_avx(auVar15);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar90 * 0x16 + 6);
  auVar18 = vpmovsxwd_avx(auVar16);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar130 = vsubps_avx(auVar18,auVar17);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar90 * 0x14 + 6);
  auVar18 = vpmovsxwd_avx(auVar23);
  auVar314._0_4_ = auVar130._0_4_ * fVar126 + auVar17._0_4_;
  auVar314._4_4_ = auVar130._4_4_ * fVar19 + auVar17._4_4_;
  auVar314._8_4_ = auVar130._8_4_ * fVar20 + auVar17._8_4_;
  auVar314._12_4_ = auVar130._12_4_ * fVar153 + auVar17._12_4_;
  auVar17 = vcvtdq2ps_avx(auVar18);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar90 * 0x18 + 6);
  auVar18 = vpmovsxwd_avx(auVar24);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar18 = vsubps_avx(auVar18,auVar17);
  auVar354._0_4_ = auVar18._0_4_ * fVar126 + auVar17._0_4_;
  auVar354._4_4_ = auVar18._4_4_ * fVar19 + auVar17._4_4_;
  auVar354._8_4_ = auVar18._8_4_ * fVar20 + auVar17._8_4_;
  auVar354._12_4_ = auVar18._12_4_ * fVar153 + auVar17._12_4_;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = *(ulong *)(prim + uVar90 * 0x1d + 6);
  auVar17 = vpmovsxwd_avx(auVar228);
  auVar208._8_8_ = 0;
  auVar208._0_8_ = *(ulong *)(prim + uVar90 * 0x21 + 6);
  auVar18 = vpmovsxwd_avx(auVar208);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar18 = vsubps_avx(auVar18,auVar17);
  auVar371._0_4_ = auVar18._0_4_ * fVar126 + auVar17._0_4_;
  auVar371._4_4_ = auVar18._4_4_ * fVar19 + auVar17._4_4_;
  auVar371._8_4_ = auVar18._8_4_ * fVar20 + auVar17._8_4_;
  auVar371._12_4_ = auVar18._12_4_ * fVar153 + auVar17._12_4_;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = *(ulong *)(prim + uVar90 * 0x1f + 6);
  auVar17 = vpmovsxwd_avx(auVar190);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *(ulong *)(prim + uVar90 * 0x23 + 6);
  auVar18 = vpmovsxwd_avx(auVar161);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar18 = vsubps_avx(auVar18,auVar17);
  auVar107._0_4_ = auVar17._0_4_ + auVar18._0_4_ * fVar126;
  auVar107._4_4_ = auVar17._4_4_ + auVar18._4_4_ * fVar19;
  auVar107._8_4_ = auVar17._8_4_ + auVar18._8_4_ * fVar20;
  auVar107._12_4_ = auVar17._12_4_ + auVar18._12_4_ * fVar153;
  auVar17 = vsubps_avx(auVar128,auVar225);
  auVar133._0_4_ = fVar248 * auVar17._0_4_;
  auVar133._4_4_ = fVar258 * auVar17._4_4_;
  auVar133._8_4_ = fVar260 * auVar17._8_4_;
  auVar133._12_4_ = fVar263 * auVar17._12_4_;
  auVar17 = vsubps_avx(auVar288,auVar225);
  auVar226._0_4_ = fVar248 * auVar17._0_4_;
  auVar226._4_4_ = fVar258 * auVar17._4_4_;
  auVar226._8_4_ = fVar260 * auVar17._8_4_;
  auVar226._12_4_ = fVar263 * auVar17._12_4_;
  auVar17 = vsubps_avx(auVar314,auVar205);
  auVar251._0_4_ = fVar270 * auVar17._0_4_;
  auVar251._4_4_ = fVar279 * auVar17._4_4_;
  auVar251._8_4_ = fVar280 * auVar17._8_4_;
  auVar251._12_4_ = fVar281 * auVar17._12_4_;
  auVar17 = vsubps_avx(auVar354,auVar205);
  auVar206._0_4_ = fVar270 * auVar17._0_4_;
  auVar206._4_4_ = fVar279 * auVar17._4_4_;
  auVar206._8_4_ = fVar280 * auVar17._8_4_;
  auVar206._12_4_ = fVar281 * auVar17._12_4_;
  auVar17 = vsubps_avx(auVar371,auVar186);
  auVar273._0_4_ = fVar334 * auVar17._0_4_;
  auVar273._4_4_ = fVar341 * auVar17._4_4_;
  auVar273._8_4_ = fVar343 * auVar17._8_4_;
  auVar273._12_4_ = fVar345 * auVar17._12_4_;
  auVar17 = vsubps_avx(auVar107,auVar186);
  auVar103._0_4_ = fVar334 * auVar17._0_4_;
  auVar103._4_4_ = fVar341 * auVar17._4_4_;
  auVar103._8_4_ = fVar343 * auVar17._8_4_;
  auVar103._12_4_ = fVar345 * auVar17._12_4_;
  auVar17 = vpminsd_avx(auVar133,auVar226);
  auVar18 = vpminsd_avx(auVar251,auVar206);
  auVar17 = vmaxps_avx(auVar17,auVar18);
  auVar18 = vpminsd_avx(auVar273,auVar103);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar315._4_4_ = uVar8;
  auVar315._0_4_ = uVar8;
  auVar315._8_4_ = uVar8;
  auVar315._12_4_ = uVar8;
  auVar18 = vmaxps_avx(auVar18,auVar315);
  auVar17 = vmaxps_avx(auVar17,auVar18);
  local_660._0_4_ = auVar17._0_4_ * 0.99999964;
  local_660._4_4_ = auVar17._4_4_ * 0.99999964;
  local_660._8_4_ = auVar17._8_4_ * 0.99999964;
  local_660._12_4_ = auVar17._12_4_ * 0.99999964;
  auVar17 = vpmaxsd_avx(auVar133,auVar226);
  auVar18 = vpmaxsd_avx(auVar251,auVar206);
  auVar17 = vminps_avx(auVar17,auVar18);
  auVar18 = vpmaxsd_avx(auVar273,auVar103);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar187._4_4_ = uVar8;
  auVar187._0_4_ = uVar8;
  auVar187._8_4_ = uVar8;
  auVar187._12_4_ = uVar8;
  auVar18 = vminps_avx(auVar18,auVar187);
  auVar17 = vminps_avx(auVar17,auVar18);
  auVar104._0_4_ = auVar17._0_4_ * 1.0000004;
  auVar104._4_4_ = auVar17._4_4_ * 1.0000004;
  auVar104._8_4_ = auVar17._8_4_ * 1.0000004;
  auVar104._12_4_ = auVar17._12_4_ * 1.0000004;
  auVar17 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar18 = vpcmpgtd_avx(auVar17,_DAT_01f4ad30);
  auVar17 = vcmpps_avx(local_660,auVar104,2);
  auVar17 = vandps_avx(auVar17,auVar18);
  auVar139._16_16_ = mm_lookupmask_ps._240_16_;
  auVar139._0_16_ = mm_lookupmask_ps._240_16_;
  uVar94 = vmovmskps_avx(auVar17);
  local_5e0 = vblendps_avx(auVar139,ZEXT832(0) << 0x20,0x80);
  auVar318 = ZEXT3264(CONCAT428(0x7fffffff,
                                CONCAT424(0x7fffffff,
                                          CONCAT420(0x7fffffff,
                                                    CONCAT416(0x7fffffff,
                                                              CONCAT412(0x7fffffff,
                                                                        CONCAT48(0x7fffffff,
                                                                                 0x7fffffff7fffffff)
                                                                       ))))));
  local_8b0 = prim;
LAB_0092a5a7:
  local_8a8 = (ulong)uVar94;
  if (local_8a8 == 0) {
LAB_0092d360:
    return local_8a8 != 0;
  }
  lVar95 = 0;
  if (local_8a8 != 0) {
    for (; (uVar94 >> lVar95 & 1) == 0; lVar95 = lVar95 + 1) {
    }
  }
  uVar94 = *(uint *)(local_8b0 + 2);
  pGVar10 = (context->scene->geometries).items[uVar94].ptr;
  uVar90 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                           (ulong)*(uint *)(local_8b0 + lVar95 * 4 + 6) *
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar334 = (pGVar10->time_range).lower;
  fVar334 = pGVar10->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar334) / ((pGVar10->time_range).upper - fVar334));
  auVar17 = vroundss_avx(ZEXT416((uint)fVar334),ZEXT416((uint)fVar334),9);
  auVar17 = vminss_avx(auVar17,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
  auVar17 = vmaxss_avx(ZEXT816(0) << 0x20,auVar17);
  fVar334 = fVar334 - auVar17._0_4_;
  _Var11 = pGVar10[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar96 = (long)(int)auVar17._0_4_ * 0x38;
  lVar12 = *(long *)(_Var11 + lVar96);
  lVar13 = *(long *)(_Var11 + 0x10 + lVar96);
  auVar17 = vshufps_avx(ZEXT416((uint)(1.0 - fVar334)),ZEXT416((uint)(1.0 - fVar334)),0);
  pfVar1 = (float *)(lVar12 + lVar13 * uVar90);
  fVar270 = auVar17._0_4_;
  fVar279 = auVar17._4_4_;
  fVar280 = auVar17._8_4_;
  fVar281 = auVar17._12_4_;
  pfVar2 = (float *)(lVar12 + lVar13 * (uVar90 + 1));
  pfVar3 = (float *)(lVar12 + lVar13 * (uVar90 + 2));
  pfVar4 = (float *)(lVar12 + lVar13 * (uVar90 + 3));
  lVar12 = *(long *)(_Var11 + 0x38 + lVar96);
  lVar13 = *(long *)(_Var11 + 0x48 + lVar96);
  auVar17 = vshufps_avx(ZEXT416((uint)fVar334),ZEXT416((uint)fVar334),0);
  pfVar5 = (float *)(lVar12 + uVar90 * lVar13);
  fVar248 = auVar17._0_4_;
  fVar258 = auVar17._4_4_;
  fVar260 = auVar17._8_4_;
  fVar263 = auVar17._12_4_;
  pfVar6 = (float *)(lVar12 + (uVar90 + 1) * lVar13);
  pfVar7 = (float *)(lVar12 + (uVar90 + 2) * lVar13);
  auVar207._0_4_ = fVar248 * *pfVar5 + fVar270 * *pfVar1;
  auVar207._4_4_ = fVar258 * pfVar5[1] + fVar279 * pfVar1[1];
  auVar207._8_4_ = fVar260 * pfVar5[2] + fVar280 * pfVar1[2];
  auVar207._12_4_ = fVar263 * pfVar5[3] + fVar281 * pfVar1[3];
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar18 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar291 = ZEXT1664(auVar18);
  fVar334 = *(float *)(ray + k * 4 + 0x40);
  auVar372._4_4_ = fVar334;
  auVar372._0_4_ = fVar334;
  auVar372._8_4_ = fVar334;
  auVar372._12_4_ = fVar334;
  fStack_6f0 = fVar334;
  _local_700 = auVar372;
  fStack_6ec = fVar334;
  fStack_6e8 = fVar334;
  fStack_6e4 = fVar334;
  fVar126 = *(float *)(ray + k * 4 + 0x50);
  auVar389._4_4_ = fVar126;
  auVar389._0_4_ = fVar126;
  auVar389._8_4_ = fVar126;
  auVar389._12_4_ = fVar126;
  fStack_710 = fVar126;
  _local_720 = auVar389;
  fStack_70c = fVar126;
  fStack_708 = fVar126;
  fStack_704 = fVar126;
  auVar227._0_4_ = fVar270 * *pfVar2 + fVar248 * *pfVar6;
  auVar227._4_4_ = fVar279 * pfVar2[1] + fVar258 * pfVar6[1];
  auVar227._8_4_ = fVar280 * pfVar2[2] + fVar260 * pfVar6[2];
  auVar227._12_4_ = fVar281 * pfVar2[3] + fVar263 * pfVar6[3];
  auVar17 = vunpcklps_avx(auVar372,auVar389);
  fVar341 = *(float *)(ray + k * 4 + 0x60);
  auVar400._4_4_ = fVar341;
  auVar400._0_4_ = fVar341;
  auVar400._8_4_ = fVar341;
  auVar400._12_4_ = fVar341;
  fStack_730 = fVar341;
  _local_740 = auVar400;
  fStack_72c = fVar341;
  fStack_728 = fVar341;
  fStack_724 = fVar341;
  _local_8e0 = vinsertps_avx(auVar17,auVar400,0x28);
  auVar105._0_4_ = (auVar207._0_4_ + auVar227._0_4_) * 0.5;
  auVar105._4_4_ = (auVar207._4_4_ + auVar227._4_4_) * 0.5;
  auVar105._8_4_ = (auVar207._8_4_ + auVar227._8_4_) * 0.5;
  auVar105._12_4_ = (auVar207._12_4_ + auVar227._12_4_) * 0.5;
  auVar17 = vsubps_avx(auVar105,auVar18);
  auVar17 = vdpps_avx(auVar17,_local_8e0,0x7f);
  local_8f0 = vdpps_avx(_local_8e0,_local_8e0,0x7f);
  auVar188._0_4_ = fVar270 * *pfVar3 + fVar248 * *pfVar7;
  auVar188._4_4_ = fVar279 * pfVar3[1] + fVar258 * pfVar7[1];
  auVar188._8_4_ = fVar280 * pfVar3[2] + fVar260 * pfVar7[2];
  auVar188._12_4_ = fVar281 * pfVar3[3] + fVar263 * pfVar7[3];
  auVar130 = vrcpss_avx(local_8f0,local_8f0);
  fVar153 = auVar17._0_4_ * auVar130._0_4_ * (2.0 - local_8f0._0_4_ * auVar130._0_4_);
  auVar17 = vshufps_avx(ZEXT416((uint)fVar153),ZEXT416((uint)fVar153),0);
  fVar19 = auVar17._0_4_;
  fVar343 = auVar17._4_4_;
  fVar20 = auVar17._8_4_;
  fVar345 = auVar17._12_4_;
  auVar252._0_4_ = auVar18._0_4_ + local_8e0._0_4_ * fVar19;
  auVar252._4_4_ = auVar18._4_4_ + local_8e0._4_4_ * fVar343;
  auVar252._8_4_ = auVar18._8_4_ + local_8e0._8_4_ * fVar20;
  auVar252._12_4_ = auVar18._12_4_ + local_8e0._12_4_ * fVar345;
  auVar17 = vblendps_avx(auVar252,_DAT_01f45a50,8);
  auVar15 = vsubps_avx(auVar207,auVar17);
  auVar16 = vsubps_avx(auVar188,auVar17);
  pfVar1 = (float *)(lVar12 + lVar13 * (uVar90 + 3));
  auVar129._0_4_ = fVar270 * *pfVar4 + fVar248 * *pfVar1;
  auVar129._4_4_ = fVar279 * pfVar4[1] + fVar258 * pfVar1[1];
  auVar129._8_4_ = fVar280 * pfVar4[2] + fVar260 * pfVar1[2];
  auVar129._12_4_ = fVar281 * pfVar4[3] + fVar263 * pfVar1[3];
  auVar23 = vsubps_avx(auVar227,auVar17);
  auVar24 = vsubps_avx(auVar129,auVar17);
  auVar17 = vshufps_avx(auVar15,auVar15,0);
  register0x00001250 = auVar17;
  _local_4e0 = auVar17;
  auVar17 = vshufps_avx(auVar15,auVar15,0x55);
  register0x00001250 = auVar17;
  _local_1e0 = auVar17;
  auVar17 = vshufps_avx(auVar15,auVar15,0xaa);
  register0x00001250 = auVar17;
  _local_200 = auVar17;
  auVar17 = vshufps_avx(auVar15,auVar15,0xff);
  register0x00001290 = auVar17;
  _local_220 = auVar17;
  auVar17 = vshufps_avx(auVar23,auVar23,0);
  register0x00001290 = auVar17;
  _local_500 = auVar17;
  auVar17 = vshufps_avx(auVar23,auVar23,0x55);
  register0x00001290 = auVar17;
  _local_520 = auVar17;
  auVar17 = vshufps_avx(auVar23,auVar23,0xaa);
  register0x00001290 = auVar17;
  _local_540 = auVar17;
  auVar17 = vshufps_avx(auVar23,auVar23,0xff);
  register0x00001290 = auVar17;
  _local_240 = auVar17;
  auVar17 = vshufps_avx(auVar16,auVar16,0);
  auVar18 = vshufps_avx(auVar16,auVar16,0x55);
  register0x00001290 = auVar18;
  _local_560 = auVar18;
  auVar18 = vshufps_avx(auVar16,auVar16,0xaa);
  register0x00001290 = auVar18;
  _local_580 = auVar18;
  auVar18 = vshufps_avx(auVar16,auVar16,0xff);
  register0x00001290 = auVar18;
  _local_5a0 = auVar18;
  auVar18 = vshufps_avx(auVar24,auVar24,0);
  auVar339._16_16_ = auVar18;
  auVar339._0_16_ = auVar18;
  auVar18 = vshufps_avx(auVar24,auVar24,0x55);
  local_5c0._16_16_ = auVar18;
  local_5c0._0_16_ = auVar18;
  auVar18 = vshufps_avx(auVar24,auVar24,0xaa);
  auVar130 = vshufps_avx(auVar24,auVar24,0xff);
  register0x00001290 = auVar130;
  _local_260 = auVar130;
  auVar130 = ZEXT416((uint)(fVar334 * fVar334 + fVar126 * fVar126 + fVar341 * fVar341));
  auVar130 = vshufps_avx(auVar130,auVar130,0);
  local_280._16_16_ = auVar130;
  local_280._0_16_ = auVar130;
  auVar219 = ZEXT3264(local_280);
  fVar334 = *(float *)(ray + k * 4 + 0x30);
  local_8d0 = ZEXT416((uint)fVar153);
  auVar130 = vshufps_avx(ZEXT416((uint)(fVar334 - fVar153)),ZEXT416((uint)(fVar334 - fVar153)),0);
  local_360._16_16_ = auVar130;
  local_360._0_16_ = auVar130;
  local_810 = vpshufd_avx(ZEXT416(uVar94),0);
  local_820 = vpshufd_avx(ZEXT416(*(uint *)(local_8b0 + lVar95 * 4 + 6)),0);
  uVar90 = 0;
  bVar93 = 0;
  local_c88 = 1;
  local_600 = vandps_avx(auVar318._0_32_,local_280);
  auVar130 = vsqrtss_avx(local_8f0,local_8f0);
  auVar22 = vsqrtss_avx(local_8f0,local_8f0);
  auVar318 = ZEXT1664(ZEXT816(0x3f80000000000000));
  local_940 = auVar339;
  do {
    auVar234._8_4_ = 0x3f800000;
    auVar234._0_8_ = 0x3f8000003f800000;
    auVar234._12_4_ = 0x3f800000;
    auVar234._16_4_ = 0x3f800000;
    auVar234._20_4_ = 0x3f800000;
    auVar234._24_4_ = 0x3f800000;
    auVar234._28_4_ = 0x3f800000;
    local_650 = auVar318._0_16_;
    auVar228 = vmovshdup_avx(local_650);
    auVar190 = vsubps_avx(auVar228,local_650);
    auVar228 = vshufps_avx(local_650,local_650,0);
    local_840._16_16_ = auVar228;
    local_840._0_16_ = auVar228;
    auVar208 = vshufps_avx(auVar190,auVar190,0);
    local_860._16_16_ = auVar208;
    local_860._0_16_ = auVar208;
    fVar405 = auVar208._0_4_;
    fVar406 = auVar208._4_4_;
    fVar152 = auVar208._8_4_;
    fVar155 = auVar208._12_4_;
    fVar399 = auVar228._0_4_;
    auVar200._0_4_ = fVar399 + fVar405 * 0.0;
    fVar402 = auVar228._4_4_;
    auVar200._4_4_ = fVar402 + fVar406 * 0.14285715;
    fVar403 = auVar228._8_4_;
    auVar200._8_4_ = fVar403 + fVar152 * 0.2857143;
    fVar404 = auVar228._12_4_;
    auVar200._12_4_ = fVar404 + fVar155 * 0.42857146;
    auVar200._16_4_ = fVar399 + fVar405 * 0.5714286;
    auVar200._20_4_ = fVar402 + fVar406 * 0.71428573;
    auVar200._24_4_ = fVar403 + fVar152 * 0.8571429;
    auVar200._28_4_ = fVar404 + fVar155;
    auVar139 = vsubps_avx(auVar234,auVar200);
    local_9e0._4_4_ = auVar200._4_4_ * auVar200._4_4_;
    local_9e0._0_4_ = auVar200._0_4_ * auVar200._0_4_;
    fStack_9d8 = auVar200._8_4_ * auVar200._8_4_;
    fStack_9d4 = auVar200._12_4_ * auVar200._12_4_;
    fStack_9d0 = auVar200._16_4_ * auVar200._16_4_;
    fStack_9cc = auVar200._20_4_ * auVar200._20_4_;
    fStack_9c8 = auVar200._24_4_ * auVar200._24_4_;
    fStack_9c4 = fVar404;
    fVar258 = auVar200._0_4_ * 3.0;
    fVar260 = auVar200._4_4_ * 3.0;
    fVar220 = auVar200._8_4_ * 3.0;
    fVar221 = auVar200._12_4_ * 3.0;
    fVar222 = auVar200._16_4_ * 3.0;
    fVar223 = auVar200._20_4_ * 3.0;
    fVar224 = auVar200._24_4_ * 3.0;
    fVar126 = auVar139._0_4_;
    auVar318._0_4_ = fVar126 * fVar126;
    fVar341 = auVar139._4_4_;
    auVar318._4_4_ = fVar341 * fVar341;
    fVar153 = auVar139._8_4_;
    auVar318._8_4_ = fVar153 * fVar153;
    fVar270 = auVar139._12_4_;
    auVar318._12_4_ = fVar270 * fVar270;
    fVar279 = auVar139._16_4_;
    auVar318._16_4_ = fVar279 * fVar279;
    fVar280 = auVar139._20_4_;
    auVar318._20_4_ = fVar280 * fVar280;
    fVar281 = auVar139._24_4_;
    auVar318._28_36_ = auVar291._28_36_;
    auVar318._24_4_ = fVar281 * fVar281;
    fVar248 = auVar139._28_4_;
    fVar263 = (auVar318._0_4_ * (fVar126 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar242 = (auVar318._4_4_ * (fVar341 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar243 = (auVar318._8_4_ * (fVar153 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar244 = (auVar318._12_4_ * (fVar270 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar245 = (auVar318._16_4_ * (fVar279 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar246 = (auVar318._20_4_ * (fVar280 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar247 = (auVar318._24_4_ * (fVar281 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar311 = -fVar126 * auVar200._0_4_ * auVar200._0_4_ * 0.5;
    fVar319 = -fVar341 * auVar200._4_4_ * auVar200._4_4_ * 0.5;
    fVar322 = -fVar153 * auVar200._8_4_ * auVar200._8_4_ * 0.5;
    fVar324 = -fVar270 * auVar200._12_4_ * auVar200._12_4_ * 0.5;
    fVar326 = -fVar279 * auVar200._16_4_ * auVar200._16_4_ * 0.5;
    fVar328 = -fVar280 * auVar200._20_4_ * auVar200._20_4_ * 0.5;
    fVar331 = -fVar281 * auVar200._24_4_ * auVar200._24_4_ * 0.5;
    fVar367 = auVar18._0_4_;
    fVar375 = auVar18._4_4_;
    fVar313 = auVar18._8_4_;
    fVar321 = auVar18._12_4_;
    fVar330 = auVar17._0_4_;
    fVar262 = auVar17._4_4_;
    fVar266 = auVar17._8_4_;
    fVar269 = auVar17._12_4_;
    fVar350 = auVar339._28_4_ + fVar269;
    fVar366 = local_5c0._28_4_ + fVar269;
    fVar388 = (auVar200._0_4_ * auVar200._0_4_ * (fVar258 + -5.0) + 2.0) * 0.5;
    fVar391 = (auVar200._4_4_ * auVar200._4_4_ * (fVar260 + -5.0) + 2.0) * 0.5;
    fVar392 = (auVar200._8_4_ * auVar200._8_4_ * (fVar220 + -5.0) + 2.0) * 0.5;
    fVar393 = (auVar200._12_4_ * auVar200._12_4_ * (fVar221 + -5.0) + 2.0) * 0.5;
    fVar394 = (auVar200._16_4_ * auVar200._16_4_ * (fVar222 + -5.0) + 2.0) * 0.5;
    fVar395 = (auVar200._20_4_ * auVar200._20_4_ * (fVar223 + -5.0) + 2.0) * 0.5;
    fVar396 = (auVar200._24_4_ * auVar200._24_4_ * (fVar224 + -5.0) + 2.0) * 0.5;
    fVar368 = -auVar200._0_4_ * fVar126 * fVar126 * 0.5;
    fVar376 = -auVar200._4_4_ * fVar341 * fVar341 * 0.5;
    fVar378 = -auVar200._8_4_ * fVar153 * fVar153 * 0.5;
    fVar380 = -auVar200._12_4_ * fVar270 * fVar270 * 0.5;
    fVar382 = -auVar200._16_4_ * fVar279 * fVar279 * 0.5;
    fVar384 = -auVar200._20_4_ * fVar280 * fVar280 * 0.5;
    fVar386 = -auVar200._24_4_ * fVar281 * fVar281 * 0.5;
    local_920 = fVar368 * (float)local_4e0._0_4_ +
                fVar388 * (float)local_500._0_4_ + auVar339._0_4_ * fVar311 + fVar330 * fVar263;
    fStack_91c = fVar376 * (float)local_4e0._4_4_ +
                 fVar391 * (float)local_500._4_4_ + auVar339._4_4_ * fVar319 + fVar262 * fVar242;
    fStack_918 = fVar378 * fStack_4d8 +
                 fVar392 * fStack_4f8 + auVar339._8_4_ * fVar322 + fVar266 * fVar243;
    fStack_914 = fVar380 * fStack_4d4 +
                 fVar393 * fStack_4f4 + auVar339._12_4_ * fVar324 + fVar269 * fVar244;
    fStack_910 = fVar382 * fStack_4d0 +
                 fVar394 * fStack_4f0 + auVar339._16_4_ * fVar326 + fVar330 * fVar245;
    fStack_90c = fVar384 * fStack_4cc +
                 fVar395 * fStack_4ec + auVar339._20_4_ * fVar328 + fVar262 * fVar246;
    fStack_908 = fVar386 * fStack_4c8 +
                 fVar396 * fStack_4e8 + auVar339._24_4_ * fVar331 + fVar266 * fVar247;
    fStack_904 = fVar269 + 2.0 + -fVar248 + fVar350;
    fVar312 = (float)local_1e0._0_4_ * fVar368 +
              fVar388 * (float)local_520._0_4_ +
              local_5c0._0_4_ * fVar311 + fVar263 * (float)local_560._0_4_;
    fVar320 = (float)local_1e0._4_4_ * fVar376 +
              fVar391 * (float)local_520._4_4_ +
              local_5c0._4_4_ * fVar319 + fVar242 * (float)local_560._4_4_;
    fVar323 = fStack_1d8 * fVar378 +
              fVar392 * fStack_518 + local_5c0._8_4_ * fVar322 + fVar243 * fStack_558;
    fVar325 = fStack_1d4 * fVar380 +
              fVar393 * fStack_514 + local_5c0._12_4_ * fVar324 + fVar244 * fStack_554;
    fVar327 = fStack_1d0 * fVar382 +
              fVar394 * fStack_510 + local_5c0._16_4_ * fVar326 + fVar245 * fStack_550;
    fVar329 = fStack_1cc * fVar384 +
              fVar395 * fStack_50c + local_5c0._20_4_ * fVar328 + fVar246 * fStack_54c;
    fVar332 = fStack_1c8 * fVar386 +
              fVar396 * fStack_508 + local_5c0._24_4_ * fVar331 + fVar247 * fStack_548;
    fVar333 = fStack_904 + fVar350 + fVar366;
    fVar160 = (float)local_200._0_4_ * fVar368 +
              fVar388 * (float)local_540._0_4_ +
              fVar367 * fVar311 + fVar263 * (float)local_580._0_4_;
    fVar179 = (float)local_200._4_4_ * fVar376 +
              fVar391 * (float)local_540._4_4_ +
              fVar375 * fVar319 + fVar242 * (float)local_580._4_4_;
    fVar180 = fStack_1f8 * fVar378 + fVar392 * fStack_538 + fVar313 * fVar322 + fVar243 * fStack_578
    ;
    fVar181 = fStack_1f4 * fVar380 + fVar393 * fStack_534 + fVar321 * fVar324 + fVar244 * fStack_574
    ;
    fVar182 = fStack_1f0 * fVar382 + fVar394 * fStack_530 + fVar367 * fVar326 + fVar245 * fStack_570
    ;
    fVar183 = fStack_1ec * fVar384 + fVar395 * fStack_52c + fVar375 * fVar328 + fVar246 * fStack_56c
    ;
    fVar184 = fStack_1e8 * fVar386 + fVar396 * fStack_528 + fVar313 * fVar331 + fVar247 * fStack_568
    ;
    fVar185 = fVar333 + fVar366 + fVar321 + fVar269;
    auVar235._0_4_ =
         (float)local_220._0_4_ * fVar368 +
         (float)local_240._0_4_ * fVar388 +
         fVar311 * (float)local_260._0_4_ + fVar263 * (float)local_5a0._0_4_;
    auVar235._4_4_ =
         (float)local_220._4_4_ * fVar376 +
         (float)local_240._4_4_ * fVar391 +
         fVar319 * (float)local_260._4_4_ + fVar242 * (float)local_5a0._4_4_;
    auVar235._8_4_ =
         fStack_218 * fVar378 + fStack_238 * fVar392 + fVar322 * fStack_258 + fVar243 * fStack_598;
    auVar235._12_4_ =
         fStack_214 * fVar380 + fStack_234 * fVar393 + fVar324 * fStack_254 + fVar244 * fStack_594;
    auVar235._16_4_ =
         fStack_210 * fVar382 + fStack_230 * fVar394 + fVar326 * fStack_250 + fVar245 * fStack_590;
    auVar235._20_4_ =
         fStack_20c * fVar384 + fStack_22c * fVar395 + fVar328 * fStack_24c + fVar246 * fStack_58c;
    auVar235._24_4_ =
         fStack_208 * fVar386 + fStack_228 * fVar396 + fVar331 * fStack_248 + fVar247 * fStack_588;
    auVar235._28_4_ = fVar333 + fVar269 + 2.0 + -fVar248 + -3.0;
    auVar27._4_4_ = (fVar341 + fVar341) * auVar200._4_4_;
    auVar27._0_4_ = (fVar126 + fVar126) * auVar200._0_4_;
    auVar27._8_4_ = (fVar153 + fVar153) * auVar200._8_4_;
    auVar27._12_4_ = (fVar270 + fVar270) * auVar200._12_4_;
    auVar27._16_4_ = (fVar279 + fVar279) * auVar200._16_4_;
    auVar27._20_4_ = (fVar280 + fVar280) * auVar200._20_4_;
    auVar27._24_4_ = (fVar281 + fVar281) * auVar200._24_4_;
    auVar27._28_4_ = auVar200._28_4_ + auVar200._28_4_;
    auVar139 = vsubps_avx(auVar27,auVar318._0_32_);
    fVar380 = auVar219._28_4_ + 2.0;
    auVar26._4_4_ = (fVar341 + fVar341) * (fVar260 + 2.0);
    auVar26._0_4_ = (fVar126 + fVar126) * (fVar258 + 2.0);
    auVar26._8_4_ = (fVar153 + fVar153) * (fVar220 + 2.0);
    auVar26._12_4_ = (fVar270 + fVar270) * (fVar221 + 2.0);
    auVar26._16_4_ = (fVar279 + fVar279) * (fVar222 + 2.0);
    auVar26._20_4_ = (fVar280 + fVar280) * (fVar223 + 2.0);
    auVar26._24_4_ = (fVar281 + fVar281) * (fVar224 + 2.0);
    auVar26._28_4_ = fVar380;
    auVar25._4_4_ = fVar341 * fVar341 * 3.0;
    auVar25._0_4_ = fVar126 * fVar126 * 3.0;
    auVar25._8_4_ = fVar153 * fVar153 * 3.0;
    auVar25._12_4_ = fVar270 * fVar270 * 3.0;
    auVar25._16_4_ = fVar279 * fVar279 * 3.0;
    auVar25._20_4_ = fVar280 * fVar280 * 3.0;
    auVar25._24_4_ = fVar281 * fVar281 * 3.0;
    auVar25._28_4_ = fVar248;
    auVar26 = vsubps_avx(auVar26,auVar25);
    auVar27 = vsubps_avx(_local_9e0,auVar27);
    fVar319 = auVar139._0_4_ * 0.5;
    fVar322 = auVar139._4_4_ * 0.5;
    fVar326 = auVar139._8_4_ * 0.5;
    fVar328 = auVar139._12_4_ * 0.5;
    fVar331 = auVar139._16_4_ * 0.5;
    fVar350 = auVar139._20_4_ * 0.5;
    fVar368 = auVar139._24_4_ * 0.5;
    fVar263 = (auVar200._0_4_ * fVar258 + (auVar200._0_4_ + auVar200._0_4_) * (fVar258 + -5.0)) *
              0.5;
    fVar242 = (auVar200._4_4_ * fVar260 + (auVar200._4_4_ + auVar200._4_4_) * (fVar260 + -5.0)) *
              0.5;
    fVar243 = (auVar200._8_4_ * fVar220 + (auVar200._8_4_ + auVar200._8_4_) * (fVar220 + -5.0)) *
              0.5;
    fVar244 = (auVar200._12_4_ * fVar221 + (auVar200._12_4_ + auVar200._12_4_) * (fVar221 + -5.0)) *
              0.5;
    fVar245 = (auVar200._16_4_ * fVar222 + (auVar200._16_4_ + auVar200._16_4_) * (fVar222 + -5.0)) *
              0.5;
    fVar247 = (auVar200._20_4_ * fVar223 + (auVar200._20_4_ + auVar200._20_4_) * (fVar223 + -5.0)) *
              0.5;
    fVar311 = (auVar200._24_4_ * fVar224 + (auVar200._24_4_ + auVar200._24_4_) * (fVar224 + -5.0)) *
              0.5;
    fVar126 = auVar26._0_4_ * 0.5;
    fVar341 = auVar26._4_4_ * 0.5;
    fVar153 = auVar26._8_4_ * 0.5;
    fVar270 = auVar26._12_4_ * 0.5;
    fVar279 = auVar26._16_4_ * 0.5;
    fVar281 = auVar26._20_4_ * 0.5;
    fVar258 = auVar26._24_4_ * 0.5;
    fVar280 = auVar27._0_4_ * 0.5;
    fVar260 = auVar27._4_4_ * 0.5;
    fVar220 = auVar27._8_4_ * 0.5;
    fVar221 = auVar27._12_4_ * 0.5;
    fVar222 = auVar27._16_4_ * 0.5;
    fVar223 = auVar27._20_4_ * 0.5;
    fVar224 = auVar27._24_4_ * 0.5;
    fVar310 = fVar248 + fVar248 + auVar139._28_4_;
    fVar380 = fVar380 + auVar200._28_4_ + auVar219._28_4_ + -5.0 + auVar26._28_4_ + auVar27._28_4_;
    auVar228 = vpermilps_avx(ZEXT416((uint)(auVar190._0_4_ * 0.04761905)),0);
    fVar324 = auVar228._0_4_;
    fVar393 = fVar324 * (fVar319 * (float)local_4e0._0_4_ +
                        fVar263 * (float)local_500._0_4_ +
                        fVar126 * fVar330 + auVar339._0_4_ * fVar280);
    fVar366 = auVar228._4_4_;
    fVar394 = fVar366 * (fVar322 * (float)local_4e0._4_4_ +
                        fVar242 * (float)local_500._4_4_ +
                        fVar341 * fVar262 + auVar339._4_4_ * fVar260);
    auVar33._4_4_ = fVar394;
    auVar33._0_4_ = fVar393;
    fVar378 = auVar228._8_4_;
    fVar395 = fVar378 * (fVar326 * fStack_4d8 +
                        fVar243 * fStack_4f8 + fVar153 * fVar266 + auVar339._8_4_ * fVar220);
    auVar33._8_4_ = fVar395;
    fVar246 = auVar228._12_4_;
    fVar396 = fVar246 * (fVar328 * fStack_4d4 +
                        fVar244 * fStack_4f4 + fVar270 * fVar269 + auVar339._12_4_ * fVar221);
    auVar33._12_4_ = fVar396;
    fVar282 = fVar324 * (fVar331 * fStack_4d0 +
                        fVar245 * fStack_4f0 + fVar279 * fVar330 + auVar339._16_4_ * fVar222);
    auVar33._16_4_ = fVar282;
    fVar283 = fVar366 * (fVar350 * fStack_4cc +
                        fVar247 * fStack_4ec + fVar281 * fVar262 + auVar339._20_4_ * fVar223);
    auVar33._20_4_ = fVar283;
    fVar284 = fVar378 * (fVar368 * fStack_4c8 +
                        fVar311 * fStack_4e8 + fVar258 * fVar266 + auVar339._24_4_ * fVar224);
    auVar33._24_4_ = fVar284;
    auVar33._28_4_ = fVar310 + fVar248 + fVar248 + 0.5;
    fVar285 = fVar324 * ((float)local_1e0._0_4_ * fVar319 +
                        fVar263 * (float)local_520._0_4_ +
                        fVar126 * (float)local_560._0_4_ + fVar280 * local_5c0._0_4_);
    fVar292 = fVar366 * ((float)local_1e0._4_4_ * fVar322 +
                        fVar242 * (float)local_520._4_4_ +
                        fVar341 * (float)local_560._4_4_ + fVar260 * local_5c0._4_4_);
    auVar32._4_4_ = fVar292;
    auVar32._0_4_ = fVar285;
    fVar295 = fVar378 * (fStack_1d8 * fVar326 +
                        fVar243 * fStack_518 + fVar153 * fStack_558 + fVar220 * local_5c0._8_4_);
    auVar32._8_4_ = fVar295;
    fVar298 = fVar246 * (fStack_1d4 * fVar328 +
                        fVar244 * fStack_514 + fVar270 * fStack_554 + fVar221 * local_5c0._12_4_);
    auVar32._12_4_ = fVar298;
    fVar301 = fVar324 * (fStack_1d0 * fVar331 +
                        fVar245 * fStack_510 + fVar279 * fStack_550 + fVar222 * local_5c0._16_4_);
    auVar32._16_4_ = fVar301;
    fVar304 = fVar366 * (fStack_1cc * fVar350 +
                        fVar247 * fStack_50c + fVar281 * fStack_54c + fVar223 * local_5c0._20_4_);
    auVar32._20_4_ = fVar304;
    fVar307 = fVar378 * (fStack_1c8 * fVar368 +
                        fVar311 * fStack_508 + fVar258 * fStack_548 + fVar224 * local_5c0._24_4_);
    auVar32._24_4_ = fVar307;
    auVar32._28_4_ = fVar310;
    fVar351 = fVar324 * ((float)local_200._0_4_ * fVar319 +
                        fVar126 * (float)local_580._0_4_ + fVar280 * fVar367 +
                        fVar263 * (float)local_540._0_4_);
    fVar360 = fVar366 * ((float)local_200._4_4_ * fVar322 +
                        fVar341 * (float)local_580._4_4_ + fVar260 * fVar375 +
                        fVar242 * (float)local_540._4_4_);
    auVar34._4_4_ = fVar360;
    auVar34._0_4_ = fVar351;
    fVar361 = fVar378 * (fStack_1f8 * fVar326 +
                        fVar153 * fStack_578 + fVar220 * fVar313 + fVar243 * fStack_538);
    auVar34._8_4_ = fVar361;
    fVar362 = fVar246 * (fStack_1f4 * fVar328 +
                        fVar270 * fStack_574 + fVar221 * fVar321 + fVar244 * fStack_534);
    auVar34._12_4_ = fVar362;
    fVar363 = fVar324 * (fStack_1f0 * fVar331 +
                        fVar279 * fStack_570 + fVar222 * fVar367 + fVar245 * fStack_530);
    auVar34._16_4_ = fVar363;
    fVar364 = fVar366 * (fStack_1ec * fVar350 +
                        fVar281 * fStack_56c + fVar223 * fVar375 + fVar247 * fStack_52c);
    auVar34._20_4_ = fVar364;
    fVar365 = fVar378 * (fStack_1e8 * fVar368 +
                        fVar258 * fStack_568 + fVar224 * fVar313 + fVar311 * fStack_528);
    auVar34._24_4_ = fVar365;
    auVar34._28_4_ = fStack_1e4;
    fVar280 = fVar324 * ((float)local_220._0_4_ * fVar319 +
                        (float)local_240._0_4_ * fVar263 +
                        fVar126 * (float)local_5a0._0_4_ + (float)local_260._0_4_ * fVar280);
    fVar263 = fVar366 * ((float)local_220._4_4_ * fVar322 +
                        (float)local_240._4_4_ * fVar242 +
                        fVar341 * (float)local_5a0._4_4_ + (float)local_260._4_4_ * fVar260);
    auVar28._4_4_ = fVar263;
    auVar28._0_4_ = fVar280;
    fVar242 = fVar378 * (fStack_218 * fVar326 +
                        fStack_238 * fVar243 + fVar153 * fStack_598 + fStack_258 * fVar220);
    auVar28._8_4_ = fVar242;
    fVar246 = fVar246 * (fStack_214 * fVar328 +
                        fStack_234 * fVar244 + fVar270 * fStack_594 + fStack_254 * fVar221);
    auVar28._12_4_ = fVar246;
    fVar324 = fVar324 * (fStack_210 * fVar331 +
                        fStack_230 * fVar245 + fVar279 * fStack_590 + fStack_250 * fVar222);
    auVar28._16_4_ = fVar324;
    fVar366 = fVar366 * (fStack_20c * fVar350 +
                        fStack_22c * fVar247 + fVar281 * fStack_58c + fStack_24c * fVar223);
    auVar28._20_4_ = fVar366;
    fVar378 = fVar378 * (fStack_208 * fVar368 +
                        fStack_228 * fVar311 + fVar258 * fStack_588 + fStack_248 * fVar224);
    auVar28._24_4_ = fVar378;
    auVar28._28_4_ = fVar380;
    auVar82._4_4_ = fVar320;
    auVar82._0_4_ = fVar312;
    auVar82._8_4_ = fVar323;
    auVar82._12_4_ = fVar325;
    auVar82._16_4_ = fVar327;
    auVar82._20_4_ = fVar329;
    auVar82._24_4_ = fVar332;
    auVar82._28_4_ = fVar333;
    auVar139 = vperm2f128_avx(auVar82,auVar82,1);
    auVar139 = vshufps_avx(auVar139,auVar82,0x30);
    auVar27 = vshufps_avx(auVar82,auVar139,0x29);
    auVar80._4_4_ = fVar179;
    auVar80._0_4_ = fVar160;
    auVar80._8_4_ = fVar180;
    auVar80._12_4_ = fVar181;
    auVar80._16_4_ = fVar182;
    auVar80._20_4_ = fVar183;
    auVar80._24_4_ = fVar184;
    auVar80._28_4_ = fVar185;
    auVar139 = vperm2f128_avx(auVar80,auVar80,1);
    auVar139 = vshufps_avx(auVar139,auVar80,0x30);
    _local_9e0 = vshufps_avx(auVar80,auVar139,0x29);
    auVar339 = vsubps_avx(auVar235,auVar28);
    auVar139 = vperm2f128_avx(auVar339,auVar339,1);
    auVar139 = vshufps_avx(auVar139,auVar339,0x30);
    auVar25 = vshufps_avx(auVar339,auVar139,0x29);
    local_2c0 = vsubps_avx(auVar27,auVar82);
    local_2a0 = vsubps_avx(_local_9e0,auVar80);
    fVar341 = local_2c0._0_4_;
    fVar281 = local_2c0._4_4_;
    auVar29._4_4_ = fVar360 * fVar281;
    auVar29._0_4_ = fVar351 * fVar341;
    fVar220 = local_2c0._8_4_;
    auVar29._8_4_ = fVar361 * fVar220;
    fVar224 = local_2c0._12_4_;
    auVar29._12_4_ = fVar362 * fVar224;
    fVar247 = local_2c0._16_4_;
    auVar29._16_4_ = fVar363 * fVar247;
    fVar326 = local_2c0._20_4_;
    auVar29._20_4_ = fVar364 * fVar326;
    fVar368 = local_2c0._24_4_;
    auVar29._24_4_ = fVar365 * fVar368;
    auVar29._28_4_ = auVar339._28_4_;
    fVar153 = local_2a0._0_4_;
    fVar248 = local_2a0._4_4_;
    auVar30._4_4_ = fVar292 * fVar248;
    auVar30._0_4_ = fVar285 * fVar153;
    fVar221 = local_2a0._8_4_;
    auVar30._8_4_ = fVar295 * fVar221;
    fVar243 = local_2a0._12_4_;
    auVar30._12_4_ = fVar298 * fVar243;
    fVar311 = local_2a0._16_4_;
    auVar30._16_4_ = fVar301 * fVar311;
    fVar328 = local_2a0._20_4_;
    auVar30._20_4_ = fVar304 * fVar328;
    fVar367 = local_2a0._24_4_;
    auVar30._24_4_ = fVar307 * fVar367;
    auVar30._28_4_ = auVar139._28_4_;
    auVar28 = vsubps_avx(auVar30,auVar29);
    auVar84._4_4_ = fStack_91c;
    auVar84._0_4_ = local_920;
    auVar84._8_4_ = fStack_918;
    auVar84._12_4_ = fStack_914;
    auVar84._16_4_ = fStack_910;
    auVar84._20_4_ = fStack_90c;
    auVar84._24_4_ = fStack_908;
    auVar84._28_4_ = fStack_904;
    auVar139 = vperm2f128_avx(auVar84,auVar84,1);
    auVar139 = vshufps_avx(auVar139,auVar84,0x30);
    local_960 = vshufps_avx(auVar84,auVar139,0x29);
    local_2e0 = vsubps_avx(local_960,auVar84);
    auVar31._4_4_ = fVar248 * fVar394;
    auVar31._0_4_ = fVar153 * fVar393;
    auVar31._8_4_ = fVar221 * fVar395;
    auVar31._12_4_ = fVar243 * fVar396;
    auVar31._16_4_ = fVar311 * fVar282;
    auVar31._20_4_ = fVar328 * fVar283;
    auVar31._24_4_ = fVar367 * fVar284;
    auVar31._28_4_ = auVar139._28_4_;
    fVar270 = local_2e0._0_4_;
    fVar258 = local_2e0._4_4_;
    auVar276._4_4_ = fVar360 * fVar258;
    auVar276._0_4_ = fVar351 * fVar270;
    fVar222 = local_2e0._8_4_;
    auVar276._8_4_ = fVar361 * fVar222;
    fVar244 = local_2e0._12_4_;
    auVar276._12_4_ = fVar362 * fVar244;
    fVar319 = local_2e0._16_4_;
    auVar276._16_4_ = fVar363 * fVar319;
    fVar331 = local_2e0._20_4_;
    auVar276._20_4_ = fVar364 * fVar331;
    fVar375 = local_2e0._24_4_;
    auVar276._24_4_ = fVar365 * fVar375;
    auVar276._28_4_ = fStack_904;
    auVar29 = vsubps_avx(auVar276,auVar31);
    auVar35._4_4_ = fVar292 * fVar258;
    auVar35._0_4_ = fVar285 * fVar270;
    auVar35._8_4_ = fVar295 * fVar222;
    auVar35._12_4_ = fVar298 * fVar244;
    auVar35._16_4_ = fVar301 * fVar319;
    auVar35._20_4_ = fVar304 * fVar331;
    auVar35._24_4_ = fVar307 * fVar375;
    auVar35._28_4_ = fStack_904;
    auVar36._4_4_ = fVar394 * fVar281;
    auVar36._0_4_ = fVar393 * fVar341;
    auVar36._8_4_ = fVar395 * fVar220;
    auVar36._12_4_ = fVar396 * fVar224;
    auVar36._16_4_ = fVar282 * fVar247;
    auVar36._20_4_ = fVar283 * fVar326;
    auVar36._24_4_ = fVar284 * fVar368;
    auVar36._28_4_ = fVar185;
    auVar30 = vsubps_avx(auVar36,auVar35);
    fVar126 = auVar30._28_4_;
    auVar201._0_4_ = fVar270 * fVar270 + fVar341 * fVar341 + fVar153 * fVar153;
    auVar201._4_4_ = fVar258 * fVar258 + fVar281 * fVar281 + fVar248 * fVar248;
    auVar201._8_4_ = fVar222 * fVar222 + fVar220 * fVar220 + fVar221 * fVar221;
    auVar201._12_4_ = fVar244 * fVar244 + fVar224 * fVar224 + fVar243 * fVar243;
    auVar201._16_4_ = fVar319 * fVar319 + fVar247 * fVar247 + fVar311 * fVar311;
    auVar201._20_4_ = fVar331 * fVar331 + fVar326 * fVar326 + fVar328 * fVar328;
    auVar201._24_4_ = fVar375 * fVar375 + fVar368 * fVar368 + fVar367 * fVar367;
    auVar201._28_4_ = fVar126 + fVar126 + auVar28._28_4_;
    auVar139 = vrcpps_avx(auVar201);
    fVar313 = auVar139._0_4_;
    fVar321 = auVar139._4_4_;
    auVar37._4_4_ = fVar321 * auVar201._4_4_;
    auVar37._0_4_ = fVar313 * auVar201._0_4_;
    fVar382 = auVar139._8_4_;
    auVar37._8_4_ = fVar382 * auVar201._8_4_;
    fVar384 = auVar139._12_4_;
    auVar37._12_4_ = fVar384 * auVar201._12_4_;
    fVar386 = auVar139._16_4_;
    auVar37._16_4_ = fVar386 * auVar201._16_4_;
    fVar330 = auVar139._20_4_;
    auVar37._20_4_ = fVar330 * auVar201._20_4_;
    fVar388 = auVar139._24_4_;
    auVar37._24_4_ = fVar388 * auVar201._24_4_;
    auVar37._28_4_ = fVar185;
    auVar373._8_4_ = 0x3f800000;
    auVar373._0_8_ = 0x3f8000003f800000;
    auVar373._12_4_ = 0x3f800000;
    auVar373._16_4_ = 0x3f800000;
    auVar373._20_4_ = 0x3f800000;
    auVar373._24_4_ = 0x3f800000;
    auVar373._28_4_ = 0x3f800000;
    auVar31 = vsubps_avx(auVar373,auVar37);
    fVar313 = fVar313 + fVar313 * auVar31._0_4_;
    fVar321 = fVar321 + fVar321 * auVar31._4_4_;
    fVar382 = fVar382 + fVar382 * auVar31._8_4_;
    fVar384 = fVar384 + fVar384 * auVar31._12_4_;
    fVar386 = fVar386 + fVar386 * auVar31._16_4_;
    fVar330 = fVar330 + fVar330 * auVar31._20_4_;
    fVar388 = fVar388 + fVar388 * auVar31._24_4_;
    auVar339 = vperm2f128_avx(auVar32,auVar32,1);
    auVar339 = vshufps_avx(auVar339,auVar32,0x30);
    auVar339 = vshufps_avx(auVar32,auVar339,0x29);
    auVar26 = vperm2f128_avx(auVar34,auVar34,1);
    auVar26 = vshufps_avx(auVar26,auVar34,0x30);
    local_980 = vshufps_avx(auVar34,auVar26,0x29);
    fVar369 = local_980._0_4_;
    fVar377 = local_980._4_4_;
    auVar38._4_4_ = fVar377 * fVar281;
    auVar38._0_4_ = fVar369 * fVar341;
    fVar379 = local_980._8_4_;
    auVar38._8_4_ = fVar379 * fVar220;
    fVar381 = local_980._12_4_;
    auVar38._12_4_ = fVar381 * fVar224;
    fVar383 = local_980._16_4_;
    auVar38._16_4_ = fVar383 * fVar247;
    fVar385 = local_980._20_4_;
    auVar38._20_4_ = fVar385 * fVar326;
    fVar387 = local_980._24_4_;
    auVar38._24_4_ = fVar387 * fVar368;
    auVar38._28_4_ = auVar26._28_4_;
    fVar286 = auVar339._0_4_;
    fVar293 = auVar339._4_4_;
    auVar39._4_4_ = fVar293 * fVar248;
    auVar39._0_4_ = fVar286 * fVar153;
    fVar296 = auVar339._8_4_;
    auVar39._8_4_ = fVar296 * fVar221;
    fVar299 = auVar339._12_4_;
    auVar39._12_4_ = fVar299 * fVar243;
    fVar302 = auVar339._16_4_;
    auVar39._16_4_ = fVar302 * fVar311;
    fVar305 = auVar339._20_4_;
    auVar39._20_4_ = fVar305 * fVar328;
    fVar308 = auVar339._24_4_;
    auVar39._24_4_ = fVar308 * fVar367;
    auVar39._28_4_ = fStack_1e4;
    auVar32 = vsubps_avx(auVar39,auVar38);
    auVar339 = vperm2f128_avx(auVar33,auVar33,1);
    auVar339 = vshufps_avx(auVar339,auVar33,0x30);
    auVar26 = vshufps_avx(auVar33,auVar339,0x29);
    fVar279 = auVar26._0_4_;
    fVar260 = auVar26._4_4_;
    auVar40._4_4_ = fVar248 * fVar260;
    auVar40._0_4_ = fVar153 * fVar279;
    fVar223 = auVar26._8_4_;
    auVar40._8_4_ = fVar221 * fVar223;
    fVar245 = auVar26._12_4_;
    auVar40._12_4_ = fVar243 * fVar245;
    fVar322 = auVar26._16_4_;
    auVar40._16_4_ = fVar311 * fVar322;
    fVar350 = auVar26._20_4_;
    auVar40._20_4_ = fVar328 * fVar350;
    fVar376 = auVar26._24_4_;
    auVar40._24_4_ = fVar367 * fVar376;
    auVar40._28_4_ = auVar339._28_4_;
    auVar41._4_4_ = fVar377 * fVar258;
    auVar41._0_4_ = fVar369 * fVar270;
    auVar41._8_4_ = fVar379 * fVar222;
    auVar41._12_4_ = fVar381 * fVar244;
    auVar41._16_4_ = fVar383 * fVar319;
    auVar41._20_4_ = fVar385 * fVar331;
    uVar98 = local_980._28_4_;
    auVar41._24_4_ = fVar387 * fVar375;
    auVar41._28_4_ = uVar98;
    auVar339 = vsubps_avx(auVar41,auVar40);
    auVar42._4_4_ = fVar293 * fVar258;
    auVar42._0_4_ = fVar286 * fVar270;
    auVar42._8_4_ = fVar296 * fVar222;
    auVar42._12_4_ = fVar299 * fVar244;
    auVar42._16_4_ = fVar302 * fVar319;
    auVar42._20_4_ = fVar305 * fVar331;
    auVar42._24_4_ = fVar308 * fVar375;
    auVar42._28_4_ = uVar98;
    auVar43._4_4_ = fVar260 * fVar281;
    auVar43._0_4_ = fVar279 * fVar341;
    auVar43._8_4_ = fVar223 * fVar220;
    auVar43._12_4_ = fVar245 * fVar224;
    auVar43._16_4_ = fVar322 * fVar247;
    auVar43._20_4_ = fVar350 * fVar326;
    auVar43._24_4_ = fVar376 * fVar368;
    auVar43._28_4_ = fStack_1c4;
    auVar33 = vsubps_avx(auVar43,auVar42);
    auVar44._4_4_ =
         fVar321 * (auVar28._4_4_ * auVar28._4_4_ +
                   auVar30._4_4_ * auVar30._4_4_ + auVar29._4_4_ * auVar29._4_4_);
    auVar44._0_4_ =
         fVar313 * (auVar28._0_4_ * auVar28._0_4_ +
                   auVar30._0_4_ * auVar30._0_4_ + auVar29._0_4_ * auVar29._0_4_);
    auVar44._8_4_ =
         fVar382 * (auVar28._8_4_ * auVar28._8_4_ +
                   auVar30._8_4_ * auVar30._8_4_ + auVar29._8_4_ * auVar29._8_4_);
    auVar44._12_4_ =
         fVar384 * (auVar28._12_4_ * auVar28._12_4_ +
                   auVar30._12_4_ * auVar30._12_4_ + auVar29._12_4_ * auVar29._12_4_);
    auVar44._16_4_ =
         fVar386 * (auVar28._16_4_ * auVar28._16_4_ +
                   auVar30._16_4_ * auVar30._16_4_ + auVar29._16_4_ * auVar29._16_4_);
    auVar44._20_4_ =
         fVar330 * (auVar28._20_4_ * auVar28._20_4_ +
                   auVar30._20_4_ * auVar30._20_4_ + auVar29._20_4_ * auVar29._20_4_);
    auVar44._24_4_ =
         fVar388 * (auVar28._24_4_ * auVar28._24_4_ +
                   auVar30._24_4_ * auVar30._24_4_ + auVar29._24_4_ * auVar29._24_4_);
    auVar44._28_4_ = auVar28._28_4_ + fVar126 + auVar29._28_4_;
    auVar45._4_4_ =
         (auVar32._4_4_ * auVar32._4_4_ +
         auVar339._4_4_ * auVar339._4_4_ + auVar33._4_4_ * auVar33._4_4_) * fVar321;
    auVar45._0_4_ =
         (auVar32._0_4_ * auVar32._0_4_ +
         auVar339._0_4_ * auVar339._0_4_ + auVar33._0_4_ * auVar33._0_4_) * fVar313;
    auVar45._8_4_ =
         (auVar32._8_4_ * auVar32._8_4_ +
         auVar339._8_4_ * auVar339._8_4_ + auVar33._8_4_ * auVar33._8_4_) * fVar382;
    auVar45._12_4_ =
         (auVar32._12_4_ * auVar32._12_4_ +
         auVar339._12_4_ * auVar339._12_4_ + auVar33._12_4_ * auVar33._12_4_) * fVar384;
    auVar45._16_4_ =
         (auVar32._16_4_ * auVar32._16_4_ +
         auVar339._16_4_ * auVar339._16_4_ + auVar33._16_4_ * auVar33._16_4_) * fVar386;
    auVar45._20_4_ =
         (auVar32._20_4_ * auVar32._20_4_ +
         auVar339._20_4_ * auVar339._20_4_ + auVar33._20_4_ * auVar33._20_4_) * fVar330;
    auVar45._24_4_ =
         (auVar32._24_4_ * auVar32._24_4_ +
         auVar339._24_4_ * auVar339._24_4_ + auVar33._24_4_ * auVar33._24_4_) * fVar388;
    auVar45._28_4_ = auVar139._28_4_ + auVar31._28_4_;
    auVar139 = vmaxps_avx(auVar44,auVar45);
    auVar339 = vperm2f128_avx(auVar235,auVar235,1);
    auVar339 = vshufps_avx(auVar339,auVar235,0x30);
    auVar28 = vshufps_avx(auVar235,auVar339,0x29);
    auVar140._0_4_ = auVar235._0_4_ + fVar280;
    auVar140._4_4_ = auVar235._4_4_ + fVar263;
    auVar140._8_4_ = auVar235._8_4_ + fVar242;
    auVar140._12_4_ = auVar235._12_4_ + fVar246;
    auVar140._16_4_ = auVar235._16_4_ + fVar324;
    auVar140._20_4_ = auVar235._20_4_ + fVar366;
    auVar140._24_4_ = auVar235._24_4_ + fVar378;
    auVar140._28_4_ = auVar235._28_4_ + fVar380;
    auVar339 = vmaxps_avx(auVar235,auVar140);
    auVar26 = vmaxps_avx(auVar25,auVar28);
    auVar339 = vmaxps_avx(auVar339,auVar26);
    auVar26 = vrsqrtps_avx(auVar201);
    fVar126 = auVar26._0_4_;
    fVar280 = auVar26._4_4_;
    fVar263 = auVar26._8_4_;
    fVar242 = auVar26._12_4_;
    fVar246 = auVar26._16_4_;
    fVar324 = auVar26._20_4_;
    fVar366 = auVar26._24_4_;
    auVar46._4_4_ = fVar280 * fVar280 * fVar280 * auVar201._4_4_ * 0.5;
    auVar46._0_4_ = fVar126 * fVar126 * fVar126 * auVar201._0_4_ * 0.5;
    auVar46._8_4_ = fVar263 * fVar263 * fVar263 * auVar201._8_4_ * 0.5;
    auVar46._12_4_ = fVar242 * fVar242 * fVar242 * auVar201._12_4_ * 0.5;
    auVar46._16_4_ = fVar246 * fVar246 * fVar246 * auVar201._16_4_ * 0.5;
    auVar46._20_4_ = fVar324 * fVar324 * fVar324 * auVar201._20_4_ * 0.5;
    auVar46._24_4_ = fVar366 * fVar366 * fVar366 * auVar201._24_4_ * 0.5;
    auVar46._28_4_ = auVar201._28_4_;
    auVar47._4_4_ = fVar280 * 1.5;
    auVar47._0_4_ = fVar126 * 1.5;
    auVar47._8_4_ = fVar263 * 1.5;
    auVar47._12_4_ = fVar242 * 1.5;
    auVar47._16_4_ = fVar246 * 1.5;
    auVar47._20_4_ = fVar324 * 1.5;
    auVar47._24_4_ = fVar366 * 1.5;
    auVar47._28_4_ = auVar26._28_4_;
    local_300 = vsubps_avx(auVar47,auVar46);
    auVar83._4_4_ = fVar320;
    auVar83._0_4_ = fVar312;
    auVar83._8_4_ = fVar323;
    auVar83._12_4_ = fVar325;
    auVar83._16_4_ = fVar327;
    auVar83._20_4_ = fVar329;
    auVar83._24_4_ = fVar332;
    auVar83._28_4_ = fVar333;
    local_9a0 = vsubps_avx(ZEXT832(0) << 0x20,auVar83);
    auVar81._4_4_ = fVar179;
    auVar81._0_4_ = fVar160;
    auVar81._8_4_ = fVar180;
    auVar81._12_4_ = fVar181;
    auVar81._16_4_ = fVar182;
    auVar81._20_4_ = fVar183;
    auVar81._24_4_ = fVar184;
    auVar81._28_4_ = fVar185;
    local_9c0 = vsubps_avx(ZEXT832(0) << 0x20,auVar81);
    fVar335 = local_9c0._0_4_;
    fVar342 = local_9c0._4_4_;
    fVar344 = local_9c0._8_4_;
    fVar346 = local_9c0._12_4_;
    fVar347 = local_9c0._16_4_;
    fVar348 = local_9c0._20_4_;
    fVar349 = local_9c0._24_4_;
    fVar287 = local_9a0._0_4_;
    fVar294 = local_9a0._4_4_;
    fVar297 = local_9a0._8_4_;
    fVar300 = local_9a0._12_4_;
    fVar303 = local_9a0._16_4_;
    fVar306 = local_9a0._20_4_;
    fVar309 = local_9a0._24_4_;
    auVar85._4_4_ = fStack_91c;
    auVar85._0_4_ = local_920;
    auVar85._8_4_ = fStack_918;
    auVar85._12_4_ = fStack_914;
    auVar85._16_4_ = fStack_910;
    auVar85._20_4_ = fStack_90c;
    auVar85._24_4_ = fStack_908;
    auVar85._28_4_ = fStack_904;
    auVar29 = vsubps_avx(ZEXT832(0) << 0x20,auVar85);
    fVar280 = auVar29._0_4_;
    fVar263 = auVar29._4_4_;
    fVar242 = auVar29._8_4_;
    fVar246 = auVar29._12_4_;
    fVar324 = auVar29._16_4_;
    fVar366 = auVar29._20_4_;
    fVar378 = auVar29._24_4_;
    auVar316._0_4_ =
         (float)local_700._0_4_ * fVar280 +
         fVar287 * (float)local_720._0_4_ + fVar335 * (float)local_740._0_4_;
    auVar316._4_4_ =
         (float)local_700._4_4_ * fVar263 +
         fVar294 * (float)local_720._4_4_ + fVar342 * (float)local_740._4_4_;
    auVar316._8_4_ = fStack_6f8 * fVar242 + fVar297 * fStack_718 + fVar344 * fStack_738;
    auVar316._12_4_ = fStack_6f4 * fVar246 + fVar300 * fStack_714 + fVar346 * fStack_734;
    auVar316._16_4_ = fStack_6f0 * fVar324 + fVar303 * fStack_710 + fVar347 * fStack_730;
    auVar316._20_4_ = fStack_6ec * fVar366 + fVar306 * fStack_70c + fVar348 * fStack_72c;
    auVar316._24_4_ = fStack_6e8 * fVar378 + fVar309 * fStack_708 + fVar349 * fStack_728;
    auVar316._28_4_ = auVar33._28_4_ + auVar26._28_4_ + auVar201._28_4_;
    auVar374._0_4_ = fVar280 * fVar280 + fVar287 * fVar287 + fVar335 * fVar335;
    auVar374._4_4_ = fVar263 * fVar263 + fVar294 * fVar294 + fVar342 * fVar342;
    auVar374._8_4_ = fVar242 * fVar242 + fVar297 * fVar297 + fVar344 * fVar344;
    auVar374._12_4_ = fVar246 * fVar246 + fVar300 * fVar300 + fVar346 * fVar346;
    auVar374._16_4_ = fVar324 * fVar324 + fVar303 * fVar303 + fVar347 * fVar347;
    auVar374._20_4_ = fVar366 * fVar366 + fVar306 * fVar306 + fVar348 * fVar348;
    auVar374._24_4_ = fVar378 * fVar378 + fVar309 * fVar309 + fVar349 * fVar349;
    auVar374._28_4_ = fStack_1c4 + fStack_1c4 + auVar33._28_4_;
    fVar330 = local_300._0_4_;
    fVar388 = local_300._4_4_;
    fVar262 = local_300._8_4_;
    fVar391 = local_300._12_4_;
    fVar266 = local_300._16_4_;
    fVar392 = local_300._20_4_;
    fVar269 = local_300._24_4_;
    local_620 = (float)local_700._0_4_ * fVar330 * fVar270 +
                fVar330 * fVar341 * (float)local_720._0_4_ +
                fVar153 * fVar330 * (float)local_740._0_4_;
    fStack_61c = (float)local_700._4_4_ * fVar388 * fVar258 +
                 fVar388 * fVar281 * (float)local_720._4_4_ +
                 fVar248 * fVar388 * (float)local_740._4_4_;
    fStack_618 = fStack_6f8 * fVar262 * fVar222 +
                 fVar262 * fVar220 * fStack_718 + fVar221 * fVar262 * fStack_738;
    fStack_614 = fStack_6f4 * fVar391 * fVar244 +
                 fVar391 * fVar224 * fStack_714 + fVar243 * fVar391 * fStack_734;
    fStack_610 = fStack_6f0 * fVar266 * fVar319 +
                 fVar266 * fVar247 * fStack_710 + fVar311 * fVar266 * fStack_730;
    fStack_60c = fStack_6ec * fVar392 * fVar331 +
                 fVar392 * fVar326 * fStack_70c + fVar328 * fVar392 * fStack_72c;
    fStack_608 = fStack_6e8 * fVar269 * fVar375 +
                 fVar269 * fVar368 * fStack_708 + fVar367 * fVar269 * fStack_728;
    fStack_604 = fStack_6e4 + fStack_704 + fStack_724;
    fVar126 = fStack_6e4 + fStack_704 + fStack_724;
    local_640._0_4_ =
         fVar280 * fVar330 * fVar270 + fVar287 * fVar330 * fVar341 + fVar335 * fVar153 * fVar330;
    local_640._4_4_ =
         fVar263 * fVar388 * fVar258 + fVar294 * fVar388 * fVar281 + fVar342 * fVar248 * fVar388;
    local_640._8_4_ =
         fVar242 * fVar262 * fVar222 + fVar297 * fVar262 * fVar220 + fVar344 * fVar221 * fVar262;
    local_640._12_4_ =
         fVar246 * fVar391 * fVar244 + fVar300 * fVar391 * fVar224 + fVar346 * fVar243 * fVar391;
    local_640._16_4_ =
         fVar324 * fVar266 * fVar319 + fVar303 * fVar266 * fVar247 + fVar347 * fVar311 * fVar266;
    local_640._20_4_ =
         fVar366 * fVar392 * fVar331 + fVar306 * fVar392 * fVar326 + fVar348 * fVar328 * fVar392;
    local_640._24_4_ =
         fVar378 * fVar269 * fVar375 + fVar309 * fVar269 * fVar368 + fVar349 * fVar367 * fVar269;
    local_640._28_4_ = fStack_704 + fVar126;
    auVar48._4_4_ = local_640._4_4_ * fStack_61c;
    auVar48._0_4_ = local_640._0_4_ * local_620;
    auVar48._8_4_ = local_640._8_4_ * fStack_618;
    auVar48._12_4_ = local_640._12_4_ * fStack_614;
    auVar48._16_4_ = local_640._16_4_ * fStack_610;
    auVar48._20_4_ = local_640._20_4_ * fStack_60c;
    auVar48._24_4_ = local_640._24_4_ * fStack_608;
    auVar48._28_4_ = fVar126;
    auVar29 = vsubps_avx(auVar316,auVar48);
    auVar49._4_4_ = local_640._4_4_ * local_640._4_4_;
    auVar49._0_4_ = local_640._0_4_ * local_640._0_4_;
    auVar49._8_4_ = local_640._8_4_ * local_640._8_4_;
    auVar49._12_4_ = local_640._12_4_ * local_640._12_4_;
    auVar49._16_4_ = local_640._16_4_ * local_640._16_4_;
    auVar49._20_4_ = local_640._20_4_ * local_640._20_4_;
    auVar49._24_4_ = local_640._24_4_ * local_640._24_4_;
    auVar49._28_4_ = fStack_704;
    auVar30 = vsubps_avx(auVar374,auVar49);
    auVar26 = vsqrtps_avx(auVar139);
    fVar126 = (auVar26._0_4_ + auVar339._0_4_) * 1.0000002;
    fVar380 = (auVar26._4_4_ + auVar339._4_4_) * 1.0000002;
    fVar313 = (auVar26._8_4_ + auVar339._8_4_) * 1.0000002;
    fVar321 = (auVar26._12_4_ + auVar339._12_4_) * 1.0000002;
    fVar382 = (auVar26._16_4_ + auVar339._16_4_) * 1.0000002;
    fVar384 = (auVar26._20_4_ + auVar339._20_4_) * 1.0000002;
    fVar386 = (auVar26._24_4_ + auVar339._24_4_) * 1.0000002;
    auVar50._4_4_ = fVar380 * fVar380;
    auVar50._0_4_ = fVar126 * fVar126;
    auVar50._8_4_ = fVar313 * fVar313;
    auVar50._12_4_ = fVar321 * fVar321;
    auVar50._16_4_ = fVar382 * fVar382;
    auVar50._20_4_ = fVar384 * fVar384;
    auVar50._24_4_ = fVar386 * fVar386;
    auVar50._28_4_ = auVar26._28_4_ + auVar339._28_4_;
    local_3c0._0_4_ = auVar29._0_4_ + auVar29._0_4_;
    local_3c0._4_4_ = auVar29._4_4_ + auVar29._4_4_;
    local_3c0._8_4_ = auVar29._8_4_ + auVar29._8_4_;
    local_3c0._12_4_ = auVar29._12_4_ + auVar29._12_4_;
    local_3c0._16_4_ = auVar29._16_4_ + auVar29._16_4_;
    local_3c0._20_4_ = auVar29._20_4_ + auVar29._20_4_;
    local_3c0._24_4_ = auVar29._24_4_ + auVar29._24_4_;
    fVar126 = auVar29._28_4_;
    local_3c0._28_4_ = fVar126 + fVar126;
    auVar339 = vsubps_avx(auVar30,auVar50);
    auVar51._4_4_ = fStack_61c * fStack_61c;
    auVar51._0_4_ = local_620 * local_620;
    auVar51._8_4_ = fStack_618 * fStack_618;
    auVar51._12_4_ = fStack_614 * fStack_614;
    auVar51._16_4_ = fStack_610 * fStack_610;
    auVar51._20_4_ = fStack_60c * fStack_60c;
    auVar51._24_4_ = fStack_608 * fStack_608;
    auVar51._28_4_ = fVar126;
    auVar29 = vsubps_avx(local_280,auVar51);
    auVar52._4_4_ = local_3c0._4_4_ * local_3c0._4_4_;
    auVar52._0_4_ = local_3c0._0_4_ * local_3c0._0_4_;
    auVar52._8_4_ = local_3c0._8_4_ * local_3c0._8_4_;
    auVar52._12_4_ = local_3c0._12_4_ * local_3c0._12_4_;
    auVar52._16_4_ = local_3c0._16_4_ * local_3c0._16_4_;
    auVar52._20_4_ = local_3c0._20_4_ * local_3c0._20_4_;
    auVar52._24_4_ = local_3c0._24_4_ * local_3c0._24_4_;
    auVar52._28_4_ = local_280._28_4_;
    fVar126 = auVar29._0_4_;
    fVar380 = auVar29._4_4_;
    fVar313 = auVar29._8_4_;
    fVar321 = auVar29._12_4_;
    fVar382 = auVar29._16_4_;
    fVar384 = auVar29._20_4_;
    fVar386 = auVar29._24_4_;
    auVar53._4_4_ = auVar339._4_4_ * fVar380 * 4.0;
    auVar53._0_4_ = auVar339._0_4_ * fVar126 * 4.0;
    auVar53._8_4_ = auVar339._8_4_ * fVar313 * 4.0;
    auVar53._12_4_ = auVar339._12_4_ * fVar321 * 4.0;
    auVar53._16_4_ = auVar339._16_4_ * fVar382 * 4.0;
    auVar53._20_4_ = auVar339._20_4_ * fVar384 * 4.0;
    auVar53._24_4_ = auVar339._24_4_ * fVar386 * 4.0;
    auVar53._28_4_ = 0x40800000;
    auVar31 = vsubps_avx(auVar52,auVar53);
    auVar139 = vcmpps_avx(auVar31,_DAT_01f7b000,5);
    auVar275._8_4_ = 0x7fffffff;
    auVar275._0_8_ = 0x7fffffff7fffffff;
    auVar275._12_4_ = 0x7fffffff;
    auVar275._16_4_ = 0x7fffffff;
    auVar275._20_4_ = 0x7fffffff;
    auVar275._24_4_ = 0x7fffffff;
    auVar275._28_4_ = 0x7fffffff;
    local_320 = vandps_avx(auVar51,auVar275);
    local_400._0_4_ = fVar126 + fVar126;
    local_400._4_4_ = fVar380 + fVar380;
    local_400._8_4_ = fVar313 + fVar313;
    local_400._12_4_ = fVar321 + fVar321;
    local_400._16_4_ = fVar382 + fVar382;
    local_400._20_4_ = fVar384 + fVar384;
    local_400._24_4_ = fVar386 + fVar386;
    local_400._28_4_ = auVar29._28_4_ + auVar29._28_4_;
    local_340 = vandps_avx(auVar29,auVar275);
    uVar91 = CONCAT44(local_3c0._4_4_,local_3c0._0_4_);
    local_3e0._0_8_ = uVar91 ^ 0x8000000080000000;
    local_3e0._8_4_ = -local_3c0._8_4_;
    local_3e0._12_4_ = -local_3c0._12_4_;
    local_3e0._16_4_ = -local_3c0._16_4_;
    local_3e0._20_4_ = -local_3c0._20_4_;
    local_3e0._24_4_ = -local_3c0._24_4_;
    local_3e0._28_4_ = -local_3c0._28_4_;
    if ((((((((auVar139 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar139 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar139 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar139 >> 0x7f,0) == '\0') &&
          (auVar139 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar139 >> 0xbf,0) == '\0') &&
        (auVar139 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar139[0x1f])
    {
      fStack_b98 = INFINITY;
      local_ba0 = (undefined1  [8])0x7f8000007f800000;
      fStack_b94 = INFINITY;
      fStack_b90 = INFINITY;
      fStack_b8c = INFINITY;
      fStack_b88 = INFINITY;
      uStack_b84 = 0x7f800000;
      auVar141._8_4_ = 0xff800000;
      auVar141._0_8_ = 0xff800000ff800000;
      auVar141._12_4_ = 0xff800000;
      auVar141._16_4_ = 0xff800000;
      auVar141._20_4_ = 0xff800000;
      auVar141._24_4_ = 0xff800000;
      auVar141._28_4_ = 0xff800000;
    }
    else {
      auVar33 = vsqrtps_avx(auVar31);
      auVar32 = vrcpps_avx(local_400);
      auVar29 = vcmpps_avx(auVar31,_DAT_01f7b000,5);
      fVar127 = auVar32._0_4_;
      fVar151 = auVar32._4_4_;
      auVar54._4_4_ = local_400._4_4_ * fVar151;
      auVar54._0_4_ = local_400._0_4_ * fVar127;
      fVar154 = auVar32._8_4_;
      auVar54._8_4_ = local_400._8_4_ * fVar154;
      fVar156 = auVar32._12_4_;
      auVar54._12_4_ = local_400._12_4_ * fVar156;
      fVar157 = auVar32._16_4_;
      auVar54._16_4_ = local_400._16_4_ * fVar157;
      fVar158 = auVar32._20_4_;
      auVar54._20_4_ = local_400._20_4_ * fVar158;
      fVar159 = auVar32._24_4_;
      auVar54._24_4_ = local_400._24_4_ * fVar159;
      auVar54._28_4_ = auVar31._28_4_;
      auVar116._8_4_ = 0x3f800000;
      auVar116._0_8_ = 0x3f8000003f800000;
      auVar116._12_4_ = 0x3f800000;
      auVar116._16_4_ = 0x3f800000;
      auVar116._20_4_ = 0x3f800000;
      auVar116._24_4_ = 0x3f800000;
      auVar116._28_4_ = 0x3f800000;
      auVar31 = vsubps_avx(auVar116,auVar54);
      fVar127 = fVar127 + fVar127 * auVar31._0_4_;
      fVar151 = fVar151 + fVar151 * auVar31._4_4_;
      fVar154 = fVar154 + fVar154 * auVar31._8_4_;
      fVar156 = fVar156 + fVar156 * auVar31._12_4_;
      fVar157 = fVar157 + fVar157 * auVar31._16_4_;
      fVar158 = fVar158 + fVar158 * auVar31._20_4_;
      fVar159 = fVar159 + fVar159 * auVar31._24_4_;
      auVar34 = vsubps_avx(local_3e0,auVar33);
      fVar249 = auVar34._0_4_ * fVar127;
      fVar259 = auVar34._4_4_ * fVar151;
      auVar55._4_4_ = fVar259;
      auVar55._0_4_ = fVar249;
      fVar261 = auVar34._8_4_ * fVar154;
      auVar55._8_4_ = fVar261;
      fVar264 = auVar34._12_4_ * fVar156;
      auVar55._12_4_ = fVar264;
      fVar265 = auVar34._16_4_ * fVar157;
      auVar55._16_4_ = fVar265;
      fVar267 = auVar34._20_4_ * fVar158;
      auVar55._20_4_ = fVar267;
      fVar268 = auVar34._24_4_ * fVar159;
      auVar55._24_4_ = fVar268;
      auVar55._28_4_ = auVar34._28_4_;
      auVar33 = vsubps_avx(auVar33,local_3c0);
      fVar127 = auVar33._0_4_ * fVar127;
      fVar151 = auVar33._4_4_ * fVar151;
      auVar56._4_4_ = fVar151;
      auVar56._0_4_ = fVar127;
      fVar154 = auVar33._8_4_ * fVar154;
      auVar56._8_4_ = fVar154;
      fVar156 = auVar33._12_4_ * fVar156;
      auVar56._12_4_ = fVar156;
      fVar157 = auVar33._16_4_ * fVar157;
      auVar56._16_4_ = fVar157;
      fVar158 = auVar33._20_4_ * fVar158;
      auVar56._20_4_ = fVar158;
      fVar159 = auVar33._24_4_ * fVar159;
      auVar56._24_4_ = fVar159;
      auVar56._28_4_ = auVar32._28_4_ + auVar31._28_4_;
      fStack_384 = local_640._28_4_ + auVar33._28_4_;
      local_3a0 = fVar330 * (local_640._0_4_ + local_620 * fVar249);
      fStack_39c = fVar388 * (local_640._4_4_ + fStack_61c * fVar259);
      fStack_398 = fVar262 * (local_640._8_4_ + fStack_618 * fVar261);
      fStack_394 = fVar391 * (local_640._12_4_ + fStack_614 * fVar264);
      fStack_390 = fVar266 * (local_640._16_4_ + fStack_610 * fVar265);
      fStack_38c = fVar392 * (local_640._20_4_ + fStack_60c * fVar267);
      fStack_388 = fVar269 * (local_640._24_4_ + fStack_608 * fVar268);
      local_380 = fVar330 * (local_640._0_4_ + local_620 * fVar127);
      fStack_37c = fVar388 * (local_640._4_4_ + fStack_61c * fVar151);
      fStack_378 = fVar262 * (local_640._8_4_ + fStack_618 * fVar154);
      fStack_374 = fVar391 * (local_640._12_4_ + fStack_614 * fVar156);
      fStack_370 = fVar266 * (local_640._16_4_ + fStack_610 * fVar157);
      fStack_36c = fVar392 * (local_640._20_4_ + fStack_60c * fVar158);
      fStack_368 = fVar269 * (local_640._24_4_ + fStack_608 * fVar159);
      fStack_364 = local_640._28_4_ + fStack_384;
      auVar236._8_4_ = 0x7f800000;
      auVar236._0_8_ = 0x7f8000007f800000;
      auVar236._12_4_ = 0x7f800000;
      auVar236._16_4_ = 0x7f800000;
      auVar236._20_4_ = 0x7f800000;
      auVar236._24_4_ = 0x7f800000;
      auVar236._28_4_ = 0x7f800000;
      _local_ba0 = vblendvps_avx(auVar236,auVar55,auVar29);
      auVar237._8_4_ = 0xff800000;
      auVar237._0_8_ = 0xff800000ff800000;
      auVar237._12_4_ = 0xff800000;
      auVar237._16_4_ = 0xff800000;
      auVar237._20_4_ = 0xff800000;
      auVar237._24_4_ = 0xff800000;
      auVar237._28_4_ = 0xff800000;
      auVar141 = vblendvps_avx(auVar237,auVar56,auVar29);
      auVar31 = vmaxps_avx(local_600,local_320);
      auVar57._4_4_ = auVar31._4_4_ * 1.9073486e-06;
      auVar57._0_4_ = auVar31._0_4_ * 1.9073486e-06;
      auVar57._8_4_ = auVar31._8_4_ * 1.9073486e-06;
      auVar57._12_4_ = auVar31._12_4_ * 1.9073486e-06;
      auVar57._16_4_ = auVar31._16_4_ * 1.9073486e-06;
      auVar57._20_4_ = auVar31._20_4_ * 1.9073486e-06;
      auVar57._24_4_ = auVar31._24_4_ * 1.9073486e-06;
      auVar57._28_4_ = auVar31._28_4_;
      auVar31 = vcmpps_avx(local_340,auVar57,1);
      auVar32 = auVar29 & auVar31;
      if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar32 >> 0x7f,0) != '\0') ||
            (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar32 >> 0xbf,0) != '\0') ||
          (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar32[0x1f] < '\0') {
        auVar139 = vandps_avx(auVar31,auVar29);
        auVar228 = vpackssdw_avx(auVar139._0_16_,auVar139._16_16_);
        auVar31 = vcmpps_avx(auVar339,_DAT_01f7b000,2);
        auVar278._8_4_ = 0xff800000;
        auVar278._0_8_ = 0xff800000ff800000;
        auVar278._12_4_ = 0xff800000;
        auVar278._16_4_ = 0xff800000;
        auVar278._20_4_ = 0xff800000;
        auVar278._24_4_ = 0xff800000;
        auVar278._28_4_ = 0xff800000;
        auVar358._8_4_ = 0x7f800000;
        auVar358._0_8_ = 0x7f8000007f800000;
        auVar358._12_4_ = 0x7f800000;
        auVar358._16_4_ = 0x7f800000;
        auVar358._20_4_ = 0x7f800000;
        auVar358._24_4_ = 0x7f800000;
        auVar358._28_4_ = 0x7f800000;
        auVar339 = vblendvps_avx(auVar358,auVar278,auVar31);
        auVar208 = vpmovsxwd_avx(auVar228);
        auVar228 = vpunpckhwd_avx(auVar228,auVar228);
        auVar241._16_16_ = auVar228;
        auVar241._0_16_ = auVar208;
        _local_ba0 = vblendvps_avx(_local_ba0,auVar339,auVar241);
        auVar339 = vblendvps_avx(auVar278,auVar358,auVar31);
        auVar141 = vblendvps_avx(auVar141,auVar339,auVar241);
        auVar218._0_8_ = auVar139._0_8_ ^ 0xffffffffffffffff;
        auVar218._8_4_ = auVar139._8_4_ ^ 0xffffffff;
        auVar218._12_4_ = auVar139._12_4_ ^ 0xffffffff;
        auVar218._16_4_ = auVar139._16_4_ ^ 0xffffffff;
        auVar218._20_4_ = auVar139._20_4_ ^ 0xffffffff;
        auVar218._24_4_ = auVar139._24_4_ ^ 0xffffffff;
        auVar218._28_4_ = auVar139._28_4_ ^ 0xffffffff;
        auVar139 = vorps_avx(auVar31,auVar218);
        auVar139 = vandps_avx(auVar29,auVar139);
      }
    }
    auVar317._8_4_ = 0x7fffffff;
    auVar317._0_8_ = 0x7fffffff7fffffff;
    auVar317._12_4_ = 0x7fffffff;
    auVar317._16_4_ = 0x7fffffff;
    auVar317._20_4_ = 0x7fffffff;
    auVar317._24_4_ = 0x7fffffff;
    auVar317._28_4_ = 0x7fffffff;
    auVar318 = ZEXT3264(auVar317);
    auVar291 = ZEXT3264(local_3e0);
    auVar219 = ZEXT3264(auVar139);
    auVar339 = local_5e0 & auVar139;
    if ((((((((auVar339 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar339 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar339 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar339 >> 0x7f,0) == '\0') &&
          (auVar339 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar339 >> 0xbf,0) == '\0') &&
        (auVar339 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar339[0x1f])
    {
      auVar359 = ZEXT3264(local_940);
    }
    else {
      auVar117 = ZEXT432((uint)*(float *)(ray + k * 4 + 0x80));
      local_420 = auVar117;
      auVar228 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_8d0._0_4_));
      auVar228 = vshufps_avx(auVar228,auVar228,0);
      auVar238._16_16_ = auVar228;
      auVar238._0_16_ = auVar228;
      auVar32 = vminps_avx(auVar238,auVar141);
      auVar118._0_4_ =
           fVar393 * (float)local_700._0_4_ +
           (float)local_720._0_4_ * fVar285 + (float)local_740._0_4_ * fVar351;
      auVar118._4_4_ =
           fVar394 * (float)local_700._4_4_ +
           (float)local_720._4_4_ * fVar292 + (float)local_740._4_4_ * fVar360;
      auVar118._8_4_ = fVar395 * fStack_6f8 + fStack_718 * fVar295 + fStack_738 * fVar361;
      auVar118._12_4_ = fVar396 * fStack_6f4 + fStack_714 * fVar298 + fStack_734 * fVar362;
      auVar118._16_4_ = fVar282 * fStack_6f0 + fStack_710 * fVar301 + fStack_730 * fVar363;
      auVar118._20_4_ = fVar283 * fStack_6ec + fStack_70c * fVar304 + fStack_72c * fVar364;
      auVar118._24_4_ = fVar284 * fStack_6e8 + fStack_708 * fVar307 + fStack_728 * fVar365;
      auVar118._28_4_ = fStack_1e4 + fVar310 + fStack_1e4;
      auVar31 = vrcpps_avx(auVar118);
      fVar310 = auVar31._0_4_;
      fVar127 = auVar31._4_4_;
      auVar58._4_4_ = auVar118._4_4_ * fVar127;
      auVar58._0_4_ = auVar118._0_4_ * fVar310;
      fVar151 = auVar31._8_4_;
      auVar58._8_4_ = auVar118._8_4_ * fVar151;
      fVar154 = auVar31._12_4_;
      auVar58._12_4_ = auVar118._12_4_ * fVar154;
      fVar156 = auVar31._16_4_;
      auVar58._16_4_ = auVar118._16_4_ * fVar156;
      fVar157 = auVar31._20_4_;
      auVar58._20_4_ = auVar118._20_4_ * fVar157;
      fVar158 = auVar31._24_4_;
      auVar58._24_4_ = auVar118._24_4_ * fVar158;
      auVar58._28_4_ = fVar345 + auVar228._12_4_;
      auVar340._8_4_ = 0x3f800000;
      auVar340._0_8_ = 0x3f8000003f800000;
      auVar340._12_4_ = 0x3f800000;
      auVar340._16_4_ = 0x3f800000;
      auVar340._20_4_ = 0x3f800000;
      auVar340._24_4_ = 0x3f800000;
      auVar340._28_4_ = 0x3f800000;
      auVar33 = vsubps_avx(auVar340,auVar58);
      auVar339 = vandps_avx(auVar317,auVar118);
      auVar401._8_4_ = 0x219392ef;
      auVar401._0_8_ = 0x219392ef219392ef;
      auVar401._12_4_ = 0x219392ef;
      auVar401._16_4_ = 0x219392ef;
      auVar401._20_4_ = 0x219392ef;
      auVar401._24_4_ = 0x219392ef;
      auVar401._28_4_ = 0x219392ef;
      auVar29 = vcmpps_avx(auVar339,auVar401,1);
      auVar59._4_4_ =
           (fVar127 + fVar127 * auVar33._4_4_) *
           -(fVar394 * fVar263 + fVar292 * fVar294 + fVar360 * fVar342);
      auVar59._0_4_ =
           (fVar310 + fVar310 * auVar33._0_4_) *
           -(fVar393 * fVar280 + fVar285 * fVar287 + fVar351 * fVar335);
      auVar59._8_4_ =
           (fVar151 + fVar151 * auVar33._8_4_) *
           -(fVar395 * fVar242 + fVar295 * fVar297 + fVar361 * fVar344);
      auVar59._12_4_ =
           (fVar154 + fVar154 * auVar33._12_4_) *
           -(fVar396 * fVar246 + fVar298 * fVar300 + fVar362 * fVar346);
      auVar59._16_4_ =
           (fVar156 + fVar156 * auVar33._16_4_) *
           -(fVar282 * fVar324 + fVar301 * fVar303 + fVar363 * fVar347);
      auVar59._20_4_ =
           (fVar157 + fVar157 * auVar33._20_4_) *
           -(fVar283 * fVar366 + fVar304 * fVar306 + fVar364 * fVar348);
      auVar59._24_4_ =
           (fVar158 + fVar158 * auVar33._24_4_) *
           -(fVar284 * fVar378 + fVar307 * fVar309 + fVar365 * fVar349);
      auVar59._28_4_ = auVar31._28_4_ + auVar33._28_4_;
      auVar339 = vcmpps_avx(auVar118,ZEXT832(0) << 0x20,1);
      auVar339 = vorps_avx(auVar29,auVar339);
      auVar390._8_4_ = 0xff800000;
      auVar390._0_8_ = 0xff800000ff800000;
      auVar390._12_4_ = 0xff800000;
      auVar390._16_4_ = 0xff800000;
      auVar390._20_4_ = 0xff800000;
      auVar390._24_4_ = 0xff800000;
      auVar390._28_4_ = 0xff800000;
      auVar339 = vblendvps_avx(auVar59,auVar390,auVar339);
      auVar31 = vcmpps_avx(auVar118,ZEXT832(0) << 0x20,6);
      auVar29 = vorps_avx(auVar29,auVar31);
      auVar397._8_4_ = 0x7f800000;
      auVar397._0_8_ = 0x7f8000007f800000;
      auVar397._12_4_ = 0x7f800000;
      auVar397._16_4_ = 0x7f800000;
      auVar397._20_4_ = 0x7f800000;
      auVar397._24_4_ = 0x7f800000;
      auVar397._28_4_ = 0x7f800000;
      auVar29 = vblendvps_avx(auVar59,auVar397,auVar29);
      auVar31 = vmaxps_avx(local_360,_local_ba0);
      auVar31 = vmaxps_avx(auVar31,auVar339);
      auVar29 = vminps_avx(auVar32,auVar29);
      auVar276 = ZEXT832(0) << 0x20;
      auVar339 = vsubps_avx(auVar276,auVar27);
      auVar27 = vsubps_avx(auVar276,_local_9e0);
      auVar60._4_4_ = auVar27._4_4_ * -fVar377;
      auVar60._0_4_ = auVar27._0_4_ * -fVar369;
      auVar60._8_4_ = auVar27._8_4_ * -fVar379;
      auVar60._12_4_ = auVar27._12_4_ * -fVar381;
      auVar60._16_4_ = auVar27._16_4_ * -fVar383;
      auVar60._20_4_ = auVar27._20_4_ * -fVar385;
      auVar60._24_4_ = auVar27._24_4_ * -fVar387;
      auVar60._28_4_ = auVar27._28_4_;
      auVar61._4_4_ = fVar293 * auVar339._4_4_;
      auVar61._0_4_ = fVar286 * auVar339._0_4_;
      auVar61._8_4_ = fVar296 * auVar339._8_4_;
      auVar61._12_4_ = fVar299 * auVar339._12_4_;
      auVar61._16_4_ = fVar302 * auVar339._16_4_;
      auVar61._20_4_ = fVar305 * auVar339._20_4_;
      auVar61._24_4_ = fVar308 * auVar339._24_4_;
      auVar61._28_4_ = auVar339._28_4_;
      auVar339 = vsubps_avx(auVar60,auVar61);
      auVar27 = vsubps_avx(auVar276,local_960);
      auVar62._4_4_ = fVar260 * auVar27._4_4_;
      auVar62._0_4_ = fVar279 * auVar27._0_4_;
      auVar62._8_4_ = fVar223 * auVar27._8_4_;
      auVar62._12_4_ = fVar245 * auVar27._12_4_;
      auVar62._16_4_ = fVar322 * auVar27._16_4_;
      auVar62._20_4_ = fVar350 * auVar27._20_4_;
      uVar8 = auVar27._28_4_;
      auVar62._24_4_ = fVar376 * auVar27._24_4_;
      auVar62._28_4_ = uVar8;
      auVar32 = vsubps_avx(auVar339,auVar62);
      auVar63._4_4_ = (float)local_740._4_4_ * -fVar377;
      auVar63._0_4_ = (float)local_740._0_4_ * -fVar369;
      auVar63._8_4_ = fStack_738 * -fVar379;
      auVar63._12_4_ = fStack_734 * -fVar381;
      auVar63._16_4_ = fStack_730 * -fVar383;
      auVar63._20_4_ = fStack_72c * -fVar385;
      auVar63._24_4_ = fStack_728 * -fVar387;
      auVar63._28_4_ = uVar98 ^ 0x80000000;
      auVar64._4_4_ = (float)local_720._4_4_ * fVar293;
      auVar64._0_4_ = (float)local_720._0_4_ * fVar286;
      auVar64._8_4_ = fStack_718 * fVar296;
      auVar64._12_4_ = fStack_714 * fVar299;
      auVar64._16_4_ = fStack_710 * fVar302;
      auVar64._20_4_ = fStack_70c * fVar305;
      auVar64._24_4_ = fStack_708 * fVar308;
      auVar64._28_4_ = uVar8;
      auVar339 = vsubps_avx(auVar63,auVar64);
      auVar65._4_4_ = (float)local_700._4_4_ * fVar260;
      auVar65._0_4_ = (float)local_700._0_4_ * fVar279;
      auVar65._8_4_ = fStack_6f8 * fVar223;
      auVar65._12_4_ = fStack_6f4 * fVar245;
      auVar65._16_4_ = fStack_6f0 * fVar322;
      auVar65._20_4_ = fStack_6ec * fVar350;
      auVar65._24_4_ = fStack_6e8 * fVar376;
      auVar65._28_4_ = uVar8;
      auVar33 = vsubps_avx(auVar339,auVar65);
      auVar339 = vrcpps_avx(auVar33);
      fVar279 = auVar339._0_4_;
      fVar280 = auVar339._4_4_;
      auVar66._4_4_ = auVar33._4_4_ * fVar280;
      auVar66._0_4_ = auVar33._0_4_ * fVar279;
      fVar260 = auVar339._8_4_;
      auVar66._8_4_ = auVar33._8_4_ * fVar260;
      fVar263 = auVar339._12_4_;
      auVar66._12_4_ = auVar33._12_4_ * fVar263;
      fVar223 = auVar339._16_4_;
      auVar66._16_4_ = auVar33._16_4_ * fVar223;
      fVar242 = auVar339._20_4_;
      auVar66._20_4_ = auVar33._20_4_ * fVar242;
      fVar245 = auVar339._24_4_;
      auVar66._24_4_ = auVar33._24_4_ * fVar245;
      auVar66._28_4_ = fStack_704;
      auVar119._8_4_ = 0x3f800000;
      auVar119._0_8_ = 0x3f8000003f800000;
      auVar119._12_4_ = 0x3f800000;
      auVar119._16_4_ = 0x3f800000;
      auVar119._20_4_ = 0x3f800000;
      auVar119._24_4_ = 0x3f800000;
      auVar119._28_4_ = 0x3f800000;
      auVar291 = ZEXT3264(auVar119);
      auVar34 = vsubps_avx(auVar119,auVar66);
      auVar339 = vandps_avx(auVar317,auVar33);
      auVar120._8_4_ = 0x219392ef;
      auVar120._0_8_ = 0x219392ef219392ef;
      auVar120._12_4_ = 0x219392ef;
      auVar120._16_4_ = 0x219392ef;
      auVar120._20_4_ = 0x219392ef;
      auVar120._24_4_ = 0x219392ef;
      auVar120._28_4_ = 0x219392ef;
      auVar27 = vcmpps_avx(auVar339,auVar120,1);
      auVar67._4_4_ = (fVar280 + fVar280 * auVar34._4_4_) * -auVar32._4_4_;
      auVar67._0_4_ = (fVar279 + fVar279 * auVar34._0_4_) * -auVar32._0_4_;
      auVar67._8_4_ = (fVar260 + fVar260 * auVar34._8_4_) * -auVar32._8_4_;
      auVar67._12_4_ = (fVar263 + fVar263 * auVar34._12_4_) * -auVar32._12_4_;
      auVar67._16_4_ = (fVar223 + fVar223 * auVar34._16_4_) * -auVar32._16_4_;
      auVar67._20_4_ = (fVar242 + fVar242 * auVar34._20_4_) * -auVar32._20_4_;
      auVar67._24_4_ = (fVar245 + fVar245 * auVar34._24_4_) * -auVar32._24_4_;
      auVar67._28_4_ = auVar32._28_4_ ^ 0x80000000;
      auVar339 = vcmpps_avx(auVar33,auVar276,1);
      auVar339 = vorps_avx(auVar27,auVar339);
      auVar339 = vblendvps_avx(auVar67,auVar390,auVar339);
      local_760 = vmaxps_avx(auVar31,auVar339);
      auVar233 = SUB6428(ZEXT864(0),0) << 0x20;
      auVar339 = vcmpps_avx(auVar33,ZEXT832(0) << 0x20,6);
      auVar339 = vorps_avx(auVar27,auVar339);
      auVar339 = vblendvps_avx(auVar67,auVar397,auVar339);
      auVar139 = vandps_avx(auVar139,local_5e0);
      local_440 = vminps_avx(auVar29,auVar339);
      auVar339 = vcmpps_avx(local_760,local_440,2);
      auVar27 = auVar139 & auVar339;
      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar27 >> 0x7f,0) == '\0') &&
            (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar27 >> 0xbf,0) == '\0') &&
          (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar27[0x1f])
      {
        auVar318 = ZEXT3264(CONCAT428(0x7fffffff,
                                      CONCAT424(0x7fffffff,
                                                CONCAT420(0x7fffffff,
                                                          CONCAT416(0x7fffffff,
                                                                    CONCAT412(0x7fffffff,
                                                                              CONCAT48(0x7fffffff,
                                                                                                                                                                              
                                                  0x7fffffff7fffffff)))))));
        auVar359 = ZEXT3264(local_940);
      }
      else {
        auVar27 = vminps_avx(auVar235,auVar140);
        auVar25 = vminps_avx(auVar25,auVar28);
        auVar27 = vminps_avx(auVar27,auVar25);
        auVar27 = vsubps_avx(auVar27,auVar26);
        auVar139 = vandps_avx(auVar339,auVar139);
        auVar86._4_4_ = fStack_39c;
        auVar86._0_4_ = local_3a0;
        auVar86._8_4_ = fStack_398;
        auVar86._12_4_ = fStack_394;
        auVar86._16_4_ = fStack_390;
        auVar86._20_4_ = fStack_38c;
        auVar86._24_4_ = fStack_388;
        auVar86._28_4_ = fStack_384;
        auVar339 = vminps_avx(auVar86,auVar119);
        auVar219 = ZEXT864(0) << 0x20;
        auVar339 = vmaxps_avx(auVar339,ZEXT832(0) << 0x20);
        fVar279 = DAT_01f7b060._28_4_;
        local_1a0[0] = fVar399 + fVar405 * (auVar339._0_4_ + (float)DAT_01f7b060) * 0.125;
        local_1a0[1] = fVar402 + fVar406 * (auVar339._4_4_ + DAT_01f7b060._4_4_) * 0.125;
        local_1a0[2] = fVar403 + fVar152 * (auVar339._8_4_ + DAT_01f7b060._8_4_) * 0.125;
        local_1a0[3] = fVar404 + fVar155 * (auVar339._12_4_ + DAT_01f7b060._12_4_) * 0.125;
        fStack_190 = fVar399 + fVar405 * (auVar339._16_4_ + DAT_01f7b060._16_4_) * 0.125;
        fStack_18c = fVar402 + fVar406 * (auVar339._20_4_ + DAT_01f7b060._20_4_) * 0.125;
        fStack_188 = fVar403 + fVar152 * (auVar339._24_4_ + DAT_01f7b060._24_4_) * 0.125;
        fStack_184 = fVar404 + auVar339._28_4_ + fVar279;
        auVar87._4_4_ = fStack_37c;
        auVar87._0_4_ = local_380;
        auVar87._8_4_ = fStack_378;
        auVar87._12_4_ = fStack_374;
        auVar87._16_4_ = fStack_370;
        auVar87._20_4_ = fStack_36c;
        auVar87._24_4_ = fStack_368;
        auVar87._28_4_ = fStack_364;
        auVar339 = vminps_avx(auVar87,auVar119);
        auVar339 = vmaxps_avx(auVar339,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar399 + fVar405 * (auVar339._0_4_ + (float)DAT_01f7b060) * 0.125;
        local_1c0[1] = fVar402 + fVar406 * (auVar339._4_4_ + DAT_01f7b060._4_4_) * 0.125;
        local_1c0[2] = fVar403 + fVar152 * (auVar339._8_4_ + DAT_01f7b060._8_4_) * 0.125;
        local_1c0[3] = fVar404 + fVar155 * (auVar339._12_4_ + DAT_01f7b060._12_4_) * 0.125;
        fStack_1b0 = fVar399 + fVar405 * (auVar339._16_4_ + DAT_01f7b060._16_4_) * 0.125;
        fStack_1ac = fVar402 + fVar406 * (auVar339._20_4_ + DAT_01f7b060._20_4_) * 0.125;
        fStack_1a8 = fVar403 + fVar152 * (auVar339._24_4_ + DAT_01f7b060._24_4_) * 0.125;
        fStack_1a4 = fVar404 + auVar339._28_4_ + fVar279;
        auVar68._4_4_ = auVar27._4_4_ * 0.99999976;
        auVar68._0_4_ = auVar27._0_4_ * 0.99999976;
        auVar68._8_4_ = auVar27._8_4_ * 0.99999976;
        auVar68._12_4_ = auVar27._12_4_ * 0.99999976;
        auVar68._16_4_ = auVar27._16_4_ * 0.99999976;
        auVar68._20_4_ = auVar27._20_4_ * 0.99999976;
        auVar68._24_4_ = auVar27._24_4_ * 0.99999976;
        auVar68._28_4_ = 0x3f7ffffc;
        auVar339 = vmaxps_avx(ZEXT832(0) << 0x20,auVar68);
        auVar69._4_4_ = auVar339._4_4_ * auVar339._4_4_;
        auVar69._0_4_ = auVar339._0_4_ * auVar339._0_4_;
        auVar69._8_4_ = auVar339._8_4_ * auVar339._8_4_;
        auVar69._12_4_ = auVar339._12_4_ * auVar339._12_4_;
        auVar69._16_4_ = auVar339._16_4_ * auVar339._16_4_;
        auVar69._20_4_ = auVar339._20_4_ * auVar339._20_4_;
        auVar69._24_4_ = auVar339._24_4_ * auVar339._24_4_;
        auVar69._28_4_ = auVar339._28_4_;
        auVar27 = vsubps_avx(auVar30,auVar69);
        auVar70._4_4_ = auVar27._4_4_ * fVar380 * 4.0;
        auVar70._0_4_ = auVar27._0_4_ * fVar126 * 4.0;
        auVar70._8_4_ = auVar27._8_4_ * fVar313 * 4.0;
        auVar70._12_4_ = auVar27._12_4_ * fVar321 * 4.0;
        auVar70._16_4_ = auVar27._16_4_ * fVar382 * 4.0;
        auVar70._20_4_ = auVar27._20_4_ * fVar384 * 4.0;
        auVar70._24_4_ = auVar27._24_4_ * fVar386 * 4.0;
        auVar70._28_4_ = auVar339._28_4_;
        auVar25 = vsubps_avx(auVar52,auVar70);
        auVar339 = vcmpps_avx(auVar25,ZEXT832(0) << 0x20,5);
        if ((((((((auVar339 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar339 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar339 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar339 >> 0x7f,0) == '\0') &&
              (auVar339 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar339 >> 0xbf,0) == '\0') &&
            (auVar339 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar339[0x1f]) {
          auVar274 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar255 = ZEXT1628(ZEXT816(0) << 0x40);
          _local_ba0 = SUB3228(ZEXT832(0),0) << 0x20;
          auVar289._8_4_ = 0x7f800000;
          auVar289._0_8_ = 0x7f8000007f800000;
          auVar289._12_4_ = 0x7f800000;
          auVar289._16_4_ = 0x7f800000;
          auVar289._20_4_ = 0x7f800000;
          auVar289._24_4_ = 0x7f800000;
          auVar289._28_4_ = 0x7f800000;
          auVar356._8_4_ = 0xff800000;
          auVar356._0_8_ = 0xff800000ff800000;
          auVar356._12_4_ = 0xff800000;
          auVar356._16_4_ = 0xff800000;
          auVar356._20_4_ = 0xff800000;
          auVar356._24_4_ = 0xff800000;
          auVar356._28_4_ = 0xff800000;
          auVar21 = auVar27;
          _local_be0 = _local_ba0;
        }
        else {
          auVar28 = vrcpps_avx(local_400);
          fVar126 = auVar28._0_4_;
          auVar213._0_4_ = local_400._0_4_ * fVar126;
          fVar280 = auVar28._4_4_;
          auVar213._4_4_ = local_400._4_4_ * fVar280;
          fVar260 = auVar28._8_4_;
          auVar213._8_4_ = local_400._8_4_ * fVar260;
          fVar263 = auVar28._12_4_;
          auVar213._12_4_ = local_400._12_4_ * fVar263;
          fVar223 = auVar28._16_4_;
          auVar213._16_4_ = local_400._16_4_ * fVar223;
          fVar242 = auVar28._20_4_;
          auVar213._20_4_ = local_400._20_4_ * fVar242;
          fVar245 = auVar28._24_4_;
          auVar213._24_4_ = local_400._24_4_ * fVar245;
          auVar213._28_4_ = 0;
          auVar30 = vsubps_avx(auVar119,auVar213);
          auVar29 = vsqrtps_avx(auVar25);
          fVar126 = fVar126 + fVar126 * auVar30._0_4_;
          fVar280 = fVar280 + fVar280 * auVar30._4_4_;
          fVar260 = fVar260 + fVar260 * auVar30._8_4_;
          fVar263 = fVar263 + fVar263 * auVar30._12_4_;
          fVar223 = fVar223 + fVar223 * auVar30._16_4_;
          fVar242 = fVar242 + fVar242 * auVar30._20_4_;
          fVar245 = fVar245 + fVar245 * auVar30._24_4_;
          auVar31 = vsubps_avx(local_3e0,auVar29);
          fVar399 = auVar31._0_4_ * fVar126;
          fVar402 = auVar31._4_4_ * fVar280;
          auVar71._4_4_ = fVar402;
          auVar71._0_4_ = fVar399;
          fVar403 = auVar31._8_4_ * fVar260;
          auVar71._8_4_ = fVar403;
          fVar404 = auVar31._12_4_ * fVar263;
          auVar71._12_4_ = fVar404;
          fVar405 = auVar31._16_4_ * fVar223;
          auVar71._16_4_ = fVar405;
          fVar406 = auVar31._20_4_ * fVar242;
          auVar71._20_4_ = fVar406;
          fVar380 = auVar31._24_4_ * fVar245;
          auVar71._24_4_ = fVar380;
          auVar71._28_4_ = 0x80000000;
          auVar31 = vsubps_avx(auVar29,local_3c0);
          fVar126 = auVar31._0_4_ * fVar126;
          fVar280 = auVar31._4_4_ * fVar280;
          auVar72._4_4_ = fVar280;
          auVar72._0_4_ = fVar126;
          fVar260 = auVar31._8_4_ * fVar260;
          auVar72._8_4_ = fVar260;
          fVar263 = auVar31._12_4_ * fVar263;
          auVar72._12_4_ = fVar263;
          fVar223 = auVar31._16_4_ * fVar223;
          auVar72._16_4_ = fVar223;
          fVar242 = auVar31._20_4_ * fVar242;
          auVar72._20_4_ = fVar242;
          fVar245 = auVar31._24_4_ * fVar245;
          auVar72._24_4_ = fVar245;
          auVar72._28_4_ = 0x7f800000;
          fVar246 = fVar330 * (fVar399 * local_620 + local_640._0_4_);
          fVar322 = fVar388 * (fVar402 * fStack_61c + local_640._4_4_);
          fVar324 = fVar262 * (fVar403 * fStack_618 + local_640._8_4_);
          fVar350 = fVar391 * (fVar404 * fStack_614 + local_640._12_4_);
          fVar366 = fVar266 * (fVar405 * fStack_610 + local_640._16_4_);
          fVar376 = fVar392 * (fVar406 * fStack_60c + local_640._20_4_);
          fVar378 = fVar269 * (fVar380 * fStack_608 + local_640._24_4_);
          auVar21._4_4_ = fStack_91c;
          auVar21._0_4_ = local_920;
          auVar21._8_4_ = fStack_918;
          auVar21._12_4_ = fStack_914;
          auVar21._16_4_ = fStack_910;
          auVar21._20_4_ = fStack_90c;
          auVar21._24_4_ = fStack_908;
          auVar21._28_4_ = fStack_904;
          auVar142._0_4_ = local_920 + fVar270 * fVar246;
          auVar142._4_4_ = fStack_91c + fVar258 * fVar322;
          auVar142._8_4_ = fStack_918 + fVar222 * fVar324;
          auVar142._12_4_ = fStack_914 + fVar244 * fVar350;
          auVar142._16_4_ = fStack_910 + fVar319 * fVar366;
          auVar142._20_4_ = fStack_90c + fVar331 * fVar376;
          auVar142._24_4_ = fStack_908 + fVar375 * fVar378;
          auVar142._28_4_ = fStack_904 + auVar28._28_4_ + auVar30._28_4_ + local_640._28_4_;
          auVar73._4_4_ = fVar402 * (float)local_700._4_4_;
          auVar73._0_4_ = fVar399 * (float)local_700._0_4_;
          auVar73._8_4_ = fVar403 * fStack_6f8;
          auVar73._12_4_ = fVar404 * fStack_6f4;
          auVar73._16_4_ = fVar405 * fStack_6f0;
          auVar73._20_4_ = fVar406 * fStack_6ec;
          auVar73._24_4_ = fVar380 * fStack_6e8;
          auVar73._28_4_ = auVar29._28_4_;
          _local_9e0 = vsubps_avx(auVar73,auVar142);
          auVar239._0_4_ = fVar312 + fVar341 * fVar246;
          auVar239._4_4_ = fVar320 + fVar281 * fVar322;
          auVar239._8_4_ = fVar323 + fVar220 * fVar324;
          auVar239._12_4_ = fVar325 + fVar224 * fVar350;
          auVar239._16_4_ = fVar327 + fVar247 * fVar366;
          auVar239._20_4_ = fVar329 + fVar326 * fVar376;
          auVar239._24_4_ = fVar332 + fVar368 * fVar378;
          auVar239._28_4_ = fVar333 + auVar29._28_4_;
          auVar88._4_4_ = (float)local_720._4_4_ * fVar402;
          auVar88._0_4_ = (float)local_720._0_4_ * fVar399;
          auVar88._8_4_ = fStack_718 * fVar403;
          auVar88._12_4_ = fStack_714 * fVar404;
          auVar88._16_4_ = fStack_710 * fVar405;
          auVar88._20_4_ = fStack_70c * fVar406;
          auVar88._24_4_ = fStack_708 * fVar380;
          auVar88._28_4_ = fVar279;
          auVar28 = vsubps_avx(auVar88,auVar239);
          _local_ba0 = auVar28._0_28_;
          auVar214._0_4_ = fVar160 + fVar153 * fVar246;
          auVar214._4_4_ = fVar179 + fVar248 * fVar322;
          auVar214._8_4_ = fVar180 + fVar221 * fVar324;
          auVar214._12_4_ = fVar181 + fVar243 * fVar350;
          auVar214._16_4_ = fVar182 + fVar311 * fVar366;
          auVar214._20_4_ = fVar183 + fVar328 * fVar376;
          auVar214._24_4_ = fVar184 + fVar367 * fVar378;
          auVar214._28_4_ = fVar185 + auVar31._28_4_;
          auVar74._4_4_ = (float)local_740._4_4_ * fVar402;
          auVar74._0_4_ = (float)local_740._0_4_ * fVar399;
          auVar74._8_4_ = fStack_738 * fVar403;
          auVar74._12_4_ = fStack_734 * fVar404;
          auVar74._16_4_ = fStack_730 * fVar405;
          auVar74._20_4_ = fStack_72c * fVar406;
          auVar74._24_4_ = fStack_728 * fVar380;
          auVar74._28_4_ = fVar279;
          auVar28 = vsubps_avx(auVar74,auVar214);
          _local_be0 = auVar28._0_28_;
          fVar330 = fVar330 * (fVar126 * local_620 + local_640._0_4_);
          fVar388 = fVar388 * (fVar280 * fStack_61c + local_640._4_4_);
          fVar262 = fVar262 * (fVar260 * fStack_618 + local_640._8_4_);
          fVar391 = fVar391 * (fVar263 * fStack_614 + local_640._12_4_);
          fVar266 = fVar266 * (fVar223 * fStack_610 + local_640._16_4_);
          fVar392 = fVar392 * (fVar242 * fStack_60c + local_640._20_4_);
          fVar269 = fVar269 * (fVar245 * fStack_608 + local_640._24_4_);
          auVar215._0_4_ = local_920 + fVar270 * fVar330;
          auVar215._4_4_ = fStack_91c + fVar258 * fVar388;
          auVar215._8_4_ = fStack_918 + fVar222 * fVar262;
          auVar215._12_4_ = fStack_914 + fVar244 * fVar391;
          auVar215._16_4_ = fStack_910 + fVar319 * fVar266;
          auVar215._20_4_ = fStack_90c + fVar331 * fVar392;
          auVar215._24_4_ = fStack_908 + fVar375 * fVar269;
          auVar215._28_4_ = fStack_904 + auVar28._28_4_ + local_640._28_4_;
          auVar75._4_4_ = fVar280 * (float)local_700._4_4_;
          auVar75._0_4_ = fVar126 * (float)local_700._0_4_;
          auVar75._8_4_ = fVar260 * fStack_6f8;
          auVar75._12_4_ = fVar263 * fStack_6f4;
          auVar75._16_4_ = fVar223 * fStack_6f0;
          auVar75._20_4_ = fVar242 * fStack_6ec;
          auVar75._24_4_ = fVar245 * fStack_6e8;
          auVar75._28_4_ = fStack_6e4;
          auVar28 = vsubps_avx(auVar75,auVar215);
          auVar219 = ZEXT3264(auVar28);
          auVar277._0_4_ = fVar312 + fVar341 * fVar330;
          auVar277._4_4_ = fVar320 + fVar281 * fVar388;
          auVar277._8_4_ = fVar323 + fVar220 * fVar262;
          auVar277._12_4_ = fVar325 + fVar224 * fVar391;
          auVar277._16_4_ = fVar327 + fVar247 * fVar266;
          auVar277._20_4_ = fVar329 + fVar326 * fVar392;
          auVar277._24_4_ = fVar332 + fVar368 * fVar269;
          auVar277._28_4_ = fVar333 + fStack_6e4;
          auVar76._4_4_ = (float)local_720._4_4_ * fVar280;
          auVar76._0_4_ = (float)local_720._0_4_ * fVar126;
          auVar76._8_4_ = fStack_718 * fVar260;
          auVar76._12_4_ = fStack_714 * fVar263;
          auVar76._16_4_ = fStack_710 * fVar223;
          auVar76._20_4_ = fStack_70c * fVar242;
          auVar76._24_4_ = fStack_708 * fVar245;
          auVar76._28_4_ = fStack_704;
          auVar28 = vsubps_avx(auVar76,auVar277);
          auVar274 = auVar28._0_28_;
          auVar256._0_4_ = fVar160 + fVar153 * fVar330;
          auVar256._4_4_ = fVar179 + fVar248 * fVar388;
          auVar256._8_4_ = fVar180 + fVar221 * fVar262;
          auVar256._12_4_ = fVar181 + fVar243 * fVar391;
          auVar256._16_4_ = fVar182 + fVar311 * fVar266;
          auVar256._20_4_ = fVar183 + fVar328 * fVar392;
          auVar256._24_4_ = fVar184 + fVar367 * fVar269;
          auVar256._28_4_ = fVar185 + fVar279;
          auVar77._4_4_ = (float)local_740._4_4_ * fVar280;
          auVar77._0_4_ = (float)local_740._0_4_ * fVar126;
          auVar77._8_4_ = fStack_738 * fVar260;
          auVar77._12_4_ = fStack_734 * fVar263;
          auVar77._16_4_ = fStack_730 * fVar223;
          auVar77._20_4_ = fStack_72c * fVar242;
          auVar77._24_4_ = fStack_728 * fVar245;
          auVar77._28_4_ = fStack_704;
          auVar28 = vsubps_avx(auVar77,auVar256);
          auVar255 = auVar28._0_28_;
          auVar25 = vcmpps_avx(auVar25,_DAT_01f7b000,5);
          auVar290._8_4_ = 0x7f800000;
          auVar290._0_8_ = 0x7f8000007f800000;
          auVar290._12_4_ = 0x7f800000;
          auVar290._16_4_ = 0x7f800000;
          auVar290._20_4_ = 0x7f800000;
          auVar290._24_4_ = 0x7f800000;
          auVar290._28_4_ = 0x7f800000;
          auVar289 = vblendvps_avx(auVar290,auVar71,auVar25);
          auVar28 = vmaxps_avx(local_600,local_320);
          auVar78._4_4_ = auVar28._4_4_ * 1.9073486e-06;
          auVar78._0_4_ = auVar28._0_4_ * 1.9073486e-06;
          auVar78._8_4_ = auVar28._8_4_ * 1.9073486e-06;
          auVar78._12_4_ = auVar28._12_4_ * 1.9073486e-06;
          auVar78._16_4_ = auVar28._16_4_ * 1.9073486e-06;
          auVar78._20_4_ = auVar28._20_4_ * 1.9073486e-06;
          auVar78._24_4_ = auVar28._24_4_ * 1.9073486e-06;
          auVar78._28_4_ = auVar28._28_4_;
          auVar28 = vcmpps_avx(local_340,auVar78,1);
          auVar357._8_4_ = 0xff800000;
          auVar357._0_8_ = 0xff800000ff800000;
          auVar357._12_4_ = 0xff800000;
          auVar357._16_4_ = 0xff800000;
          auVar357._20_4_ = 0xff800000;
          auVar357._24_4_ = 0xff800000;
          auVar357._28_4_ = 0xff800000;
          auVar356 = vblendvps_avx(auVar357,auVar72,auVar25);
          auVar29 = auVar25 & auVar28;
          if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar29 >> 0x7f,0) != '\0') ||
                (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar29 >> 0xbf,0) != '\0') ||
              (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar29[0x1f] < '\0') {
            auVar339 = vandps_avx(auVar28,auVar25);
            auVar228 = vpackssdw_avx(auVar339._0_16_,auVar339._16_16_);
            auVar28 = vcmpps_avx(auVar27,_DAT_01f7b000,2);
            auVar150._8_4_ = 0xff800000;
            auVar150._0_8_ = 0xff800000ff800000;
            auVar150._12_4_ = 0xff800000;
            auVar150._16_4_ = 0xff800000;
            auVar150._20_4_ = 0xff800000;
            auVar150._24_4_ = 0xff800000;
            auVar150._28_4_ = 0xff800000;
            auVar178._8_4_ = 0x7f800000;
            auVar178._0_8_ = 0x7f8000007f800000;
            auVar178._12_4_ = 0x7f800000;
            auVar178._16_4_ = 0x7f800000;
            auVar178._20_4_ = 0x7f800000;
            auVar178._24_4_ = 0x7f800000;
            auVar178._28_4_ = 0x7f800000;
            auVar27 = vblendvps_avx(auVar178,auVar150,auVar28);
            auVar208 = vpmovsxwd_avx(auVar228);
            auVar228 = vpunpckhwd_avx(auVar228,auVar228);
            auVar398._16_16_ = auVar228;
            auVar398._0_16_ = auVar208;
            auVar289 = vblendvps_avx(auVar289,auVar27,auVar398);
            auVar27 = vblendvps_avx(auVar150,auVar178,auVar28);
            auVar356 = vblendvps_avx(auVar356,auVar27,auVar398);
            auVar203._0_8_ = auVar339._0_8_ ^ 0xffffffffffffffff;
            auVar203._8_4_ = auVar339._8_4_ ^ 0xffffffff;
            auVar203._12_4_ = auVar339._12_4_ ^ 0xffffffff;
            auVar203._16_4_ = auVar339._16_4_ ^ 0xffffffff;
            auVar203._20_4_ = auVar339._20_4_ ^ 0xffffffff;
            auVar203._24_4_ = auVar339._24_4_ ^ 0xffffffff;
            auVar203._28_4_ = auVar339._28_4_ ^ 0xffffffff;
            auVar21 = vorps_avx(auVar28,auVar203);
            auVar339 = vandps_avx(auVar25,auVar21);
          }
          auVar233 = local_9e0._0_28_;
        }
        _local_4a0 = local_760;
        local_480 = vminps_avx(local_440,auVar289);
        auVar28 = vmaxps_avx(local_760,auVar356);
        _local_460 = auVar28;
        auVar27 = vcmpps_avx(local_760,local_480,2);
        auVar291 = ZEXT3264(auVar27);
        auVar27 = vandps_avx(auVar27,auVar139);
        auVar25 = vcmpps_avx(auVar28,local_440,2);
        auVar139 = vandps_avx(auVar139,auVar25);
        auVar25 = vorps_avx(auVar27,auVar139);
        if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar25 >> 0x7f,0) == '\0') &&
              (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar25 >> 0xbf,0) == '\0') &&
            (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar25[0x1f]) {
          auVar318 = ZEXT3264(CONCAT428(0x7fffffff,
                                        CONCAT424(0x7fffffff,
                                                  CONCAT420(0x7fffffff,
                                                            CONCAT416(0x7fffffff,
                                                                      CONCAT412(0x7fffffff,
                                                                                CONCAT48(0x7fffffff,
                                                                                                                                                                                  
                                                  0x7fffffff7fffffff)))))));
          auVar359 = ZEXT3264(local_940);
        }
        else {
          auVar291 = ZEXT3264(_local_720);
          auVar174._0_8_ = auVar339._0_8_ ^ 0xffffffffffffffff;
          auVar174._8_4_ = auVar339._8_4_ ^ 0xffffffff;
          auVar174._12_4_ = auVar339._12_4_ ^ 0xffffffff;
          auVar174._16_4_ = auVar339._16_4_ ^ 0xffffffff;
          auVar174._20_4_ = auVar339._20_4_ ^ 0xffffffff;
          auVar174._24_4_ = auVar339._24_4_ ^ 0xffffffff;
          auVar174._28_4_ = auVar339._28_4_ ^ 0xffffffff;
          auVar121._0_4_ =
               (float)local_700._0_4_ * auVar219._0_4_ +
               (float)local_720._0_4_ * auVar274._0_4_ + (float)local_740._0_4_ * auVar255._0_4_;
          auVar121._4_4_ =
               (float)local_700._4_4_ * auVar219._4_4_ +
               (float)local_720._4_4_ * auVar274._4_4_ + (float)local_740._4_4_ * auVar255._4_4_;
          auVar121._8_4_ =
               fStack_6f8 * auVar219._8_4_ +
               fStack_718 * auVar274._8_4_ + fStack_738 * auVar255._8_4_;
          auVar121._12_4_ =
               fStack_6f4 * auVar219._12_4_ +
               fStack_714 * auVar274._12_4_ + fStack_734 * auVar255._12_4_;
          auVar121._16_4_ =
               fStack_6f0 * auVar219._16_4_ +
               fStack_710 * auVar274._16_4_ + fStack_730 * auVar255._16_4_;
          auVar121._20_4_ =
               fStack_6ec * auVar219._20_4_ +
               fStack_70c * auVar274._20_4_ + fStack_72c * auVar255._20_4_;
          auVar121._24_4_ =
               fStack_6e8 * auVar219._24_4_ +
               fStack_708 * auVar274._24_4_ + fStack_728 * auVar255._24_4_;
          auVar121._28_4_ = auVar21._28_4_ + auVar139._28_4_ + auVar25._28_4_;
          auVar216._8_4_ = 0x7fffffff;
          auVar216._0_8_ = 0x7fffffff7fffffff;
          auVar216._12_4_ = 0x7fffffff;
          auVar216._16_4_ = 0x7fffffff;
          auVar216._20_4_ = 0x7fffffff;
          auVar216._24_4_ = 0x7fffffff;
          auVar216._28_4_ = 0x7fffffff;
          auVar339 = vandps_avx(auVar121,auVar216);
          auVar257._8_4_ = 0x3e99999a;
          auVar257._0_8_ = 0x3e99999a3e99999a;
          auVar257._12_4_ = 0x3e99999a;
          auVar257._16_4_ = 0x3e99999a;
          auVar257._20_4_ = 0x3e99999a;
          auVar257._24_4_ = 0x3e99999a;
          auVar257._28_4_ = 0x3e99999a;
          auVar339 = vcmpps_avx(auVar339,auVar257,1);
          local_6a0 = vorps_avx(auVar339,auVar174);
          auVar122._0_4_ =
               (float)local_700._0_4_ * auVar233._0_4_ +
               (float)local_720._0_4_ * (float)local_ba0._0_4_ +
               (float)local_740._0_4_ * (float)local_be0._0_4_;
          auVar122._4_4_ =
               (float)local_700._4_4_ * auVar233._4_4_ +
               (float)local_720._4_4_ * (float)local_ba0._4_4_ +
               (float)local_740._4_4_ * (float)local_be0._4_4_;
          auVar122._8_4_ =
               fStack_6f8 * auVar233._8_4_ + fStack_718 * fStack_b98 + fStack_738 * fStack_bd8;
          auVar122._12_4_ =
               fStack_6f4 * auVar233._12_4_ + fStack_714 * fStack_b94 + fStack_734 * fStack_bd4;
          auVar122._16_4_ =
               fStack_6f0 * auVar233._16_4_ + fStack_710 * fStack_b90 + fStack_730 * fStack_bd0;
          auVar122._20_4_ =
               fStack_6ec * auVar233._20_4_ + fStack_70c * fStack_b8c + fStack_72c * fStack_bcc;
          auVar122._24_4_ =
               fStack_6e8 * auVar233._24_4_ + fStack_708 * fStack_b88 + fStack_728 * fStack_bc8;
          auVar122._28_4_ = local_6a0._28_4_ + fStack_6e4 + auVar21._28_4_;
          auVar339 = vandps_avx(auVar122,auVar216);
          auVar339 = vcmpps_avx(auVar339,auVar257,1);
          auVar339 = vorps_avx(auVar339,auVar174);
          auVar143._8_4_ = 3;
          auVar143._0_8_ = 0x300000003;
          auVar143._12_4_ = 3;
          auVar143._16_4_ = 3;
          auVar143._20_4_ = 3;
          auVar143._24_4_ = 3;
          auVar143._28_4_ = 3;
          auVar175._8_4_ = 2;
          auVar175._0_8_ = 0x200000002;
          auVar175._12_4_ = 2;
          auVar175._16_4_ = 2;
          auVar175._20_4_ = 2;
          auVar175._24_4_ = 2;
          auVar175._28_4_ = 2;
          auVar339 = vblendvps_avx(auVar175,auVar143,auVar339);
          local_6c0 = ZEXT432(local_c88);
          local_6e0 = vpshufd_avx(ZEXT416(local_c88),0);
          auVar228 = vpcmpgtd_avx(auVar339._16_16_,local_6e0);
          auStack_6d0 = auVar26._16_16_;
          auVar208 = vpcmpgtd_avx(auVar339._0_16_,local_6e0);
          auVar144._16_16_ = auVar228;
          auVar144._0_16_ = auVar208;
          local_680 = vblendps_avx(ZEXT1632(auVar208),auVar144,0xf0);
          local_4c0 = vandnps_avx(local_680,auVar27);
          local_880._4_4_ = local_760._4_4_ + fVar343;
          local_880._0_4_ = local_760._0_4_ + fVar19;
          fStack_878 = local_760._8_4_ + fVar20;
          fStack_874 = local_760._12_4_ + fVar345;
          fStack_870 = local_760._16_4_ + fVar19;
          fStack_86c = local_760._20_4_ + fVar343;
          fStack_868 = local_760._24_4_ + fVar20;
          fStack_864 = local_760._28_4_ + fVar345;
          while( true ) {
            local_ab0 = auVar24._0_4_;
            fStack_aac = auVar24._4_4_;
            fStack_aa8 = auVar24._8_4_;
            fStack_aa4 = auVar24._12_4_;
            local_a90 = auVar16._0_4_;
            fStack_a8c = auVar16._4_4_;
            fStack_a88 = auVar16._8_4_;
            fStack_a84 = auVar16._12_4_;
            local_aa0 = auVar23._0_4_;
            fStack_a9c = auVar23._4_4_;
            fStack_a98 = auVar23._8_4_;
            fStack_a94 = auVar23._12_4_;
            local_bf0 = auVar15._0_4_;
            fStack_bec = auVar15._4_4_;
            fStack_be8 = auVar15._8_4_;
            fStack_be4 = auVar15._12_4_;
            if ((((((((local_4c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_4c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_4c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_4c0 >> 0x7f,0) == '\0') &&
                  (local_4c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_4c0 >> 0xbf,0) == '\0') &&
                (local_4c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_4c0[0x1f]) break;
            auVar145._8_4_ = 0x7f800000;
            auVar145._0_8_ = 0x7f8000007f800000;
            auVar145._12_4_ = 0x7f800000;
            auVar145._16_4_ = 0x7f800000;
            auVar145._20_4_ = 0x7f800000;
            auVar145._24_4_ = 0x7f800000;
            auVar145._28_4_ = 0x7f800000;
            auVar339 = vblendvps_avx(auVar145,local_760,local_4c0);
            auVar26 = vshufps_avx(auVar339,auVar339,0xb1);
            auVar26 = vminps_avx(auVar339,auVar26);
            auVar25 = vshufpd_avx(auVar26,auVar26,5);
            auVar26 = vminps_avx(auVar26,auVar25);
            auVar25 = vperm2f128_avx(auVar26,auVar26,1);
            auVar26 = vminps_avx(auVar26,auVar25);
            auVar26 = vcmpps_avx(auVar339,auVar26,0);
            auVar25 = local_4c0 & auVar26;
            auVar339 = local_4c0;
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0x7f,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0xbf,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar25[0x1f] < '\0') {
              auVar339 = vandps_avx(auVar26,local_4c0);
            }
            uVar89 = vmovmskps_avx(auVar339);
            uVar98 = 0;
            if (uVar89 != 0) {
              for (; (uVar89 >> uVar98 & 1) == 0; uVar98 = uVar98 + 1) {
              }
            }
            uVar91 = (ulong)uVar98;
            *(undefined4 *)(local_4c0 + uVar91 * 4) = 0;
            fVar126 = local_1a0[uVar91];
            uVar98 = *(uint *)(local_4a0 + uVar91 * 4);
            fVar341 = auVar130._0_4_;
            if ((float)local_8f0._0_4_ < 0.0) {
              auVar291 = ZEXT1664(auVar291._0_16_);
              fVar341 = sqrtf((float)local_8f0._0_4_);
              uVar91 = extraout_RAX;
            }
            auVar208 = vminps_avx(auVar15,auVar23);
            auVar228 = vmaxps_avx(auVar15,auVar23);
            auVar190 = vminps_avx(auVar16,auVar24);
            auVar161 = vminps_avx(auVar208,auVar190);
            auVar208 = vmaxps_avx(auVar16,auVar24);
            auVar190 = vmaxps_avx(auVar228,auVar208);
            auVar189._8_4_ = 0x7fffffff;
            auVar189._0_8_ = 0x7fffffff7fffffff;
            auVar189._12_4_ = 0x7fffffff;
            auVar228 = vandps_avx(auVar161,auVar189);
            auVar208 = vandps_avx(auVar190,auVar189);
            auVar228 = vmaxps_avx(auVar228,auVar208);
            auVar208 = vmovshdup_avx(auVar228);
            auVar208 = vmaxss_avx(auVar208,auVar228);
            auVar228 = vshufpd_avx(auVar228,auVar228,1);
            auVar228 = vmaxss_avx(auVar228,auVar208);
            local_920 = auVar228._0_4_ * 1.9073486e-06;
            local_860._0_16_ = vshufps_avx(auVar190,auVar190,0xff);
            auVar228 = vinsertps_avx(ZEXT416(uVar98),ZEXT416((uint)fVar126),0x10);
            for (uVar97 = 0; bVar100 = (byte)uVar91, uVar97 != 5; uVar97 = uVar97 + 1) {
              auVar208 = vshufps_avx(auVar228,auVar228,0);
              auVar106._0_4_ = auVar208._0_4_ * (float)local_8e0._0_4_ + 0.0;
              auVar106._4_4_ = auVar208._4_4_ * (float)local_8e0._4_4_ + 0.0;
              auVar106._8_4_ = auVar208._8_4_ * fStack_8d8 + 0.0;
              auVar106._12_4_ = auVar208._12_4_ * fStack_8d4 + 0.0;
              auVar208 = vmovshdup_avx(auVar228);
              fVar248 = auVar208._0_4_;
              fVar280 = 1.0 - fVar248;
              fVar153 = fVar248 * fVar248;
              fVar270 = fVar248 * 3.0;
              fVar126 = fVar270 + -5.0;
              fVar279 = fVar280 * fVar280;
              auVar208 = ZEXT416((uint)(fVar248 * fVar248 * -fVar280 * 0.5));
              auVar208 = vshufps_avx(auVar208,auVar208,0);
              auVar190 = ZEXT416((uint)((fVar279 * (fVar280 * 3.0 + -5.0) + 2.0) * 0.5));
              auVar190 = vshufps_avx(auVar190,auVar190,0);
              auVar161 = ZEXT416((uint)((fVar153 * fVar126 + 2.0) * 0.5));
              auVar161 = vshufps_avx(auVar161,auVar161,0);
              auVar107 = ZEXT416((uint)(fVar280 * fVar280 * -fVar248 * 0.5));
              auVar107 = vshufps_avx(auVar107,auVar107,0);
              auVar162._0_4_ =
                   auVar107._0_4_ * local_bf0 +
                   auVar161._0_4_ * local_aa0 +
                   auVar190._0_4_ * local_a90 + auVar208._0_4_ * local_ab0;
              auVar162._4_4_ =
                   auVar107._4_4_ * fStack_bec +
                   auVar161._4_4_ * fStack_a9c +
                   auVar190._4_4_ * fStack_a8c + auVar208._4_4_ * fStack_aac;
              auVar162._8_4_ =
                   auVar107._8_4_ * fStack_be8 +
                   auVar161._8_4_ * fStack_a98 +
                   auVar190._8_4_ * fStack_a88 + auVar208._8_4_ * fStack_aa8;
              auVar162._12_4_ =
                   auVar107._12_4_ * fStack_be4 +
                   auVar161._12_4_ * fStack_a94 +
                   auVar190._12_4_ * fStack_a84 + auVar208._12_4_ * fStack_aa4;
              _local_9e0 = auVar162;
              auVar190 = vsubps_avx(auVar106,auVar162);
              auVar208 = vdpps_avx(auVar190,auVar190,0x7f);
              fVar281 = auVar208._0_4_;
              if (fVar281 < 0.0) {
                local_960._0_4_ = fVar153;
                local_980._0_4_ = fVar248 * 9.0;
                local_9a0._0_4_ = fVar126;
                local_9c0._0_4_ = fVar279;
                local_840._0_4_ = fVar280 * -2.0;
                fVar258 = sqrtf(fVar281);
                uVar91 = extraout_RAX_00;
                fVar126 = (float)local_9a0._0_4_;
                fVar263 = (float)local_980._0_4_;
                fVar260 = (float)local_840._0_4_;
                fVar153 = (float)local_960._0_4_;
                fVar279 = (float)local_9c0._0_4_;
              }
              else {
                auVar161 = vsqrtss_avx(auVar208,auVar208);
                fVar258 = auVar161._0_4_;
                fVar263 = fVar248 * 9.0;
                fVar260 = fVar280 * -2.0;
              }
              auVar161 = ZEXT416((uint)((fVar153 + fVar248 * fVar260) * 0.5));
              auVar161 = vshufps_avx(auVar161,auVar161,0);
              auVar107 = ZEXT416((uint)(((fVar280 + fVar280) * (fVar270 + 2.0) +
                                        fVar280 * fVar280 * -3.0) * 0.5));
              auVar107 = vshufps_avx(auVar107,auVar107,0);
              auVar101 = ZEXT416((uint)((fVar126 * (fVar248 + fVar248) + fVar248 * fVar270) * 0.5));
              auVar101 = vshufps_avx(auVar101,auVar101,0);
              auVar103 = ZEXT416((uint)((fVar248 * (fVar280 + fVar280) - fVar279) * 0.5));
              auVar103 = vshufps_avx(auVar103,auVar103,0);
              auVar355._0_4_ =
                   local_bf0 * auVar103._0_4_ +
                   local_aa0 * auVar101._0_4_ +
                   local_ab0 * auVar161._0_4_ + local_a90 * auVar107._0_4_;
              auVar355._4_4_ =
                   fStack_bec * auVar103._4_4_ +
                   fStack_a9c * auVar101._4_4_ +
                   fStack_aac * auVar161._4_4_ + fStack_a8c * auVar107._4_4_;
              auVar355._8_4_ =
                   fStack_be8 * auVar103._8_4_ +
                   fStack_a98 * auVar101._8_4_ +
                   fStack_aa8 * auVar161._8_4_ + fStack_a88 * auVar107._8_4_;
              auVar355._12_4_ =
                   fStack_be4 * auVar103._12_4_ +
                   fStack_a94 * auVar101._12_4_ +
                   fStack_aa4 * auVar161._12_4_ + fStack_a84 * auVar107._12_4_;
              auVar103 = vpermilps_avx(ZEXT416((uint)(fVar270 + -1.0)),0);
              auVar102 = vpermilps_avx(ZEXT416((uint)(fVar248 * -9.0 + 4.0)),0);
              auVar161 = vshufps_avx(ZEXT416((uint)(fVar263 + -5.0)),ZEXT416((uint)(fVar263 + -5.0))
                                     ,0);
              auVar107 = ZEXT416((uint)(fVar248 * -3.0 + 2.0));
              auVar101 = vshufps_avx(auVar107,auVar107,0);
              auVar107 = vdpps_avx(auVar355,auVar355,0x7f);
              auVar131._0_4_ =
                   local_bf0 * auVar101._0_4_ +
                   local_aa0 * auVar161._0_4_ +
                   local_a90 * auVar102._0_4_ + local_ab0 * auVar103._0_4_;
              auVar131._4_4_ =
                   fStack_bec * auVar101._4_4_ +
                   fStack_a9c * auVar161._4_4_ +
                   fStack_a8c * auVar102._4_4_ + fStack_aac * auVar103._4_4_;
              auVar131._8_4_ =
                   fStack_be8 * auVar101._8_4_ +
                   fStack_a98 * auVar161._8_4_ +
                   fStack_a88 * auVar102._8_4_ + fStack_aa8 * auVar103._8_4_;
              auVar131._12_4_ =
                   fStack_be4 * auVar101._12_4_ +
                   fStack_a94 * auVar161._12_4_ +
                   fStack_a84 * auVar102._12_4_ + fStack_aa4 * auVar103._12_4_;
              auVar161 = vblendps_avx(auVar107,_DAT_01f45a50,0xe);
              auVar101 = vrsqrtss_avx(auVar161,auVar161);
              fVar153 = auVar101._0_4_;
              fVar126 = auVar107._0_4_;
              auVar101 = vdpps_avx(auVar355,auVar131,0x7f);
              auVar103 = vshufps_avx(auVar107,auVar107,0);
              auVar132._0_4_ = auVar131._0_4_ * auVar103._0_4_;
              auVar132._4_4_ = auVar131._4_4_ * auVar103._4_4_;
              auVar132._8_4_ = auVar131._8_4_ * auVar103._8_4_;
              auVar132._12_4_ = auVar131._12_4_ * auVar103._12_4_;
              auVar101 = vshufps_avx(auVar101,auVar101,0);
              auVar209._0_4_ = auVar355._0_4_ * auVar101._0_4_;
              auVar209._4_4_ = auVar355._4_4_ * auVar101._4_4_;
              auVar209._8_4_ = auVar355._8_4_ * auVar101._8_4_;
              auVar209._12_4_ = auVar355._12_4_ * auVar101._12_4_;
              auVar102 = vsubps_avx(auVar132,auVar209);
              auVar101 = vrcpss_avx(auVar161,auVar161);
              auVar161 = vmaxss_avx(ZEXT416((uint)local_920),
                                    ZEXT416((uint)(auVar228._0_4_ * fVar341 * 1.9073486e-06)));
              auVar101 = ZEXT416((uint)(auVar101._0_4_ * (2.0 - fVar126 * auVar101._0_4_)));
              auVar101 = vshufps_avx(auVar101,auVar101,0);
              uVar79 = CONCAT44(auVar355._4_4_,auVar355._0_4_);
              auVar229._0_8_ = uVar79 ^ 0x8000000080000000;
              auVar229._8_4_ = -auVar355._8_4_;
              auVar229._12_4_ = -auVar355._12_4_;
              auVar103 = ZEXT416((uint)(fVar153 * 1.5 + fVar126 * -0.5 * fVar153 * fVar153 * fVar153
                                       ));
              auVar103 = vshufps_avx(auVar103,auVar103,0);
              auVar191._0_4_ = auVar103._0_4_ * auVar102._0_4_ * auVar101._0_4_;
              auVar191._4_4_ = auVar103._4_4_ * auVar102._4_4_ * auVar101._4_4_;
              auVar191._8_4_ = auVar103._8_4_ * auVar102._8_4_ * auVar101._8_4_;
              auVar191._12_4_ = auVar103._12_4_ * auVar102._12_4_ * auVar101._12_4_;
              auVar253._0_4_ = auVar355._0_4_ * auVar103._0_4_;
              auVar253._4_4_ = auVar355._4_4_ * auVar103._4_4_;
              auVar253._8_4_ = auVar355._8_4_ * auVar103._8_4_;
              auVar253._12_4_ = auVar355._12_4_ * auVar103._12_4_;
              if (fVar126 < 0.0) {
                local_960._0_16_ = auVar229;
                fVar126 = sqrtf(fVar126);
                uVar91 = extraout_RAX_01;
                auVar229 = local_960._0_16_;
              }
              else {
                auVar107 = vsqrtss_avx(auVar107,auVar107);
                fVar126 = auVar107._0_4_;
              }
              auVar107 = vdpps_avx(auVar190,auVar253,0x7f);
              fVar126 = (local_920 / fVar126) * (fVar258 + 1.0) +
                        auVar161._0_4_ + fVar258 * local_920;
              auVar101 = vdpps_avx(auVar229,auVar253,0x7f);
              auVar103 = vdpps_avx(auVar190,auVar191,0x7f);
              auVar102 = vdpps_avx(_local_8e0,auVar253,0x7f);
              auVar104 = vdpps_avx(auVar190,auVar229,0x7f);
              fVar153 = auVar101._0_4_ + auVar103._0_4_;
              fVar270 = auVar107._0_4_;
              auVar108._0_4_ = fVar270 * fVar270;
              auVar108._4_4_ = auVar107._4_4_ * auVar107._4_4_;
              auVar108._8_4_ = auVar107._8_4_ * auVar107._8_4_;
              auVar108._12_4_ = auVar107._12_4_ * auVar107._12_4_;
              auVar103 = vsubps_avx(auVar208,auVar108);
              auVar101 = vdpps_avx(auVar190,_local_8e0,0x7f);
              fVar279 = auVar104._0_4_ - fVar270 * fVar153;
              fVar280 = auVar101._0_4_ - fVar270 * auVar102._0_4_;
              auVar101 = vrsqrtss_avx(auVar103,auVar103);
              fVar248 = auVar103._0_4_;
              fVar270 = auVar101._0_4_;
              fVar270 = fVar270 * 1.5 + fVar248 * -0.5 * fVar270 * fVar270 * fVar270;
              if (fVar248 < 0.0) {
                local_960._0_16_ = auVar107;
                local_980._0_4_ = fVar279;
                local_9a0._0_4_ = fVar280;
                local_9c0._0_4_ = fVar270;
                fVar248 = sqrtf(fVar248);
                uVar91 = extraout_RAX_02;
                fVar270 = (float)local_9c0._0_4_;
                fVar279 = (float)local_980._0_4_;
                fVar280 = (float)local_9a0._0_4_;
                auVar107 = local_960._0_16_;
              }
              else {
                auVar101 = vsqrtss_avx(auVar103,auVar103);
                fVar248 = auVar101._0_4_;
              }
              auVar291 = ZEXT1664(auVar208);
              auVar104 = vpermilps_avx(_local_9e0,0xff);
              auVar128 = vshufps_avx(auVar355,auVar355,0xff);
              fVar279 = fVar279 * fVar270 - auVar128._0_4_;
              auVar210._0_8_ = auVar102._0_8_ ^ 0x8000000080000000;
              auVar210._8_4_ = auVar102._8_4_ ^ 0x80000000;
              auVar210._12_4_ = auVar102._12_4_ ^ 0x80000000;
              auVar230._0_4_ = -fVar279;
              auVar230._4_4_ = 0x80000000;
              auVar230._8_4_ = 0x80000000;
              auVar230._12_4_ = 0x80000000;
              auVar101 = vinsertps_avx(auVar230,ZEXT416((uint)(fVar280 * fVar270)),0x1c);
              auVar102 = vmovsldup_avx(ZEXT416((uint)(fVar153 * fVar280 * fVar270 -
                                                     auVar102._0_4_ * fVar279)));
              auVar101 = vdivps_avx(auVar101,auVar102);
              auVar103 = vinsertps_avx(ZEXT416((uint)fVar153),auVar210,0x10);
              auVar103 = vdivps_avx(auVar103,auVar102);
              auVar102 = vmovsldup_avx(auVar107);
              auVar133 = ZEXT416((uint)(fVar248 - auVar104._0_4_));
              auVar104 = vmovsldup_avx(auVar133);
              auVar163._0_4_ = auVar102._0_4_ * auVar101._0_4_ + auVar104._0_4_ * auVar103._0_4_;
              auVar163._4_4_ = auVar102._4_4_ * auVar101._4_4_ + auVar104._4_4_ * auVar103._4_4_;
              auVar163._8_4_ = auVar102._8_4_ * auVar101._8_4_ + auVar104._8_4_ * auVar103._8_4_;
              auVar163._12_4_ =
                   auVar102._12_4_ * auVar101._12_4_ + auVar104._12_4_ * auVar103._12_4_;
              auVar228 = vsubps_avx(auVar228,auVar163);
              auVar164._8_4_ = 0x7fffffff;
              auVar164._0_8_ = 0x7fffffff7fffffff;
              auVar164._12_4_ = 0x7fffffff;
              auVar107 = vandps_avx(auVar107,auVar164);
              if (auVar107._0_4_ < fVar126) {
                auVar192._8_4_ = 0x7fffffff;
                auVar192._0_8_ = 0x7fffffff7fffffff;
                auVar192._12_4_ = 0x7fffffff;
                auVar107 = vandps_avx(auVar133,auVar192);
                if (auVar107._0_4_ <
                    (float)local_860._0_4_ * 1.9073486e-06 + auVar161._0_4_ + fVar126) {
                  bVar99 = uVar97 < 5;
                  fVar126 = auVar228._0_4_ + (float)local_8d0._0_4_;
                  if (fVar126 < fVar334) {
                    bVar100 = 0;
                    goto LAB_0092c0f7;
                  }
                  fVar341 = *(float *)(ray + k * 4 + 0x80);
                  if (fVar126 <= fVar341) {
                    auVar161 = vmovshdup_avx(auVar228);
                    bVar100 = 0;
                    if ((auVar161._0_4_ < 0.0) || (1.0 < auVar161._0_4_)) goto LAB_0092c0f7;
                    auVar161 = vrsqrtss_avx(auVar208,auVar208);
                    fVar153 = auVar161._0_4_;
                    pGVar10 = (context->scene->geometries).items[uVar94].ptr;
                    if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (bVar100 = 1, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        auVar161 = ZEXT416((uint)(fVar153 * 1.5 +
                                                 fVar281 * -0.5 * fVar153 * fVar153 * fVar153));
                        auVar161 = vshufps_avx(auVar161,auVar161,0);
                        local_ba0._0_4_ = auVar190._0_4_;
                        local_ba0._4_4_ = auVar190._4_4_;
                        fStack_b98 = auVar190._8_4_;
                        fStack_b94 = auVar190._12_4_;
                        auVar165._0_4_ = auVar161._0_4_ * (float)local_ba0._0_4_;
                        auVar165._4_4_ = auVar161._4_4_ * (float)local_ba0._4_4_;
                        auVar165._8_4_ = auVar161._8_4_ * fStack_b98;
                        auVar165._12_4_ = auVar161._12_4_ * fStack_b94;
                        auVar109._0_4_ = auVar355._0_4_ + auVar128._0_4_ * auVar165._0_4_;
                        auVar109._4_4_ = auVar355._4_4_ + auVar128._4_4_ * auVar165._4_4_;
                        auVar109._8_4_ = auVar355._8_4_ + auVar128._8_4_ * auVar165._8_4_;
                        auVar109._12_4_ = auVar355._12_4_ + auVar128._12_4_ * auVar165._12_4_;
                        auVar190 = vshufps_avx(auVar165,auVar165,0xc9);
                        auVar161 = vshufps_avx(auVar355,auVar355,0xc9);
                        auVar166._0_4_ = auVar161._0_4_ * auVar165._0_4_;
                        auVar166._4_4_ = auVar161._4_4_ * auVar165._4_4_;
                        auVar166._8_4_ = auVar161._8_4_ * auVar165._8_4_;
                        auVar166._12_4_ = auVar161._12_4_ * auVar165._12_4_;
                        auVar193._0_4_ = auVar355._0_4_ * auVar190._0_4_;
                        auVar193._4_4_ = auVar355._4_4_ * auVar190._4_4_;
                        auVar193._8_4_ = auVar355._8_4_ * auVar190._8_4_;
                        auVar193._12_4_ = auVar355._12_4_ * auVar190._12_4_;
                        auVar107 = vsubps_avx(auVar193,auVar166);
                        auVar190 = vshufps_avx(auVar107,auVar107,0xc9);
                        auVar161 = vshufps_avx(auVar109,auVar109,0xc9);
                        auVar194._0_4_ = auVar161._0_4_ * auVar190._0_4_;
                        auVar194._4_4_ = auVar161._4_4_ * auVar190._4_4_;
                        auVar194._8_4_ = auVar161._8_4_ * auVar190._8_4_;
                        auVar194._12_4_ = auVar161._12_4_ * auVar190._12_4_;
                        auVar190 = vshufps_avx(auVar107,auVar107,0xd2);
                        auVar110._0_4_ = auVar109._0_4_ * auVar190._0_4_;
                        auVar110._4_4_ = auVar109._4_4_ * auVar190._4_4_;
                        auVar110._8_4_ = auVar109._8_4_ * auVar190._8_4_;
                        auVar110._12_4_ = auVar109._12_4_ * auVar190._12_4_;
                        auVar190 = vsubps_avx(auVar194,auVar110);
                        local_7d0 = vshufps_avx(auVar228,auVar228,0x55);
                        local_800 = (RTCHitN  [16])vshufps_avx(auVar190,auVar190,0x55);
                        auStack_7f0 = vshufps_avx(auVar190,auVar190,0xaa);
                        local_7e0 = vshufps_avx(auVar190,auVar190,0);
                        local_7c0 = ZEXT816(0) << 0x20;
                        local_7b0 = local_820._0_8_;
                        uStack_7a8 = local_820._8_8_;
                        local_7a0 = local_810;
                        vcmpps_avx(ZEXT1632(local_810),ZEXT1632(local_810),0xf);
                        uStack_78c = context->user->instID[0];
                        local_790 = uStack_78c;
                        uStack_788 = uStack_78c;
                        uStack_784 = uStack_78c;
                        uStack_780 = context->user->instPrimID[0];
                        uStack_77c = uStack_780;
                        uStack_778 = uStack_780;
                        uStack_774 = uStack_780;
                        *(float *)(ray + k * 4 + 0x80) = fVar126;
                        auVar228 = *(undefined1 (*) [16])
                                    (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                        local_8a0._0_16_ = auVar228;
                        local_a10.valid = (int *)local_8a0;
                        local_a10.geometryUserPtr = pGVar10->userPtr;
                        local_a10.context = context->user;
                        local_a10.hit = local_800;
                        local_a10.N = 4;
                        local_a10.ray = (RTCRayN *)ray;
                        if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar291 = ZEXT1664(auVar208);
                          (*pGVar10->occlusionFilterN)(&local_a10);
                          auVar228 = local_8a0._0_16_;
                        }
                        if (auVar228 == (undefined1  [16])0x0) {
                          auVar228 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                          auVar228 = auVar228 ^ _DAT_01f46b70;
                        }
                        else {
                          p_Var14 = context->args->filter;
                          if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar291 = ZEXT1664(auVar291._0_16_);
                            (*p_Var14)(&local_a10);
                            auVar228 = local_8a0._0_16_;
                          }
                          auVar208 = vpcmpeqd_avx(auVar228,_DAT_01f45a50);
                          auVar228 = auVar208 ^ _DAT_01f46b70;
                          auVar167._8_4_ = 0xff800000;
                          auVar167._0_8_ = 0xff800000ff800000;
                          auVar167._12_4_ = 0xff800000;
                          auVar208 = vblendvps_avx(auVar167,*(undefined1 (*) [16])
                                                             (local_a10.ray + 0x80),auVar208);
                          *(undefined1 (*) [16])(local_a10.ray + 0x80) = auVar208;
                        }
                        auVar134._8_8_ = 0x100000001;
                        auVar134._0_8_ = 0x100000001;
                        bVar100 = (auVar134 & auVar228) != (undefined1  [16])0x0;
                        if (!(bool)bVar100) {
                          *(float *)(ray + k * 4 + 0x80) = fVar341;
                        }
                      }
                      goto LAB_0092c0f7;
                    }
                  }
                  bVar100 = 0;
                  goto LAB_0092c0f7;
                }
              }
            }
            bVar99 = false;
LAB_0092c0f7:
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar117._4_4_ = uVar8;
            auVar117._0_4_ = uVar8;
            auVar117._8_4_ = uVar8;
            auVar117._12_4_ = uVar8;
            auVar117._16_4_ = uVar8;
            auVar117._20_4_ = uVar8;
            auVar117._24_4_ = uVar8;
            auVar117._28_4_ = uVar8;
            bVar93 = bVar93 | bVar99 & bVar100;
            auVar339 = vcmpps_avx(_local_880,auVar117,2);
            local_4c0 = vandps_avx(auVar339,local_4c0);
          }
          auVar123._0_4_ = auVar28._0_4_ + fVar19;
          auVar123._4_4_ = auVar28._4_4_ + fVar343;
          auVar123._8_4_ = auVar28._8_4_ + fVar20;
          auVar123._12_4_ = auVar28._12_4_ + fVar345;
          auVar123._16_4_ = auVar28._16_4_ + fVar19;
          auVar123._20_4_ = auVar28._20_4_ + fVar343;
          auVar123._24_4_ = auVar28._24_4_ + fVar20;
          auVar123._28_4_ = auVar28._28_4_ + fVar345;
          auVar228 = vshufps_avx(auVar117._0_16_,auVar117._0_16_,0);
          auVar146._16_16_ = auVar228;
          auVar146._0_16_ = auVar228;
          auVar339 = vcmpps_avx(auVar123,auVar146,2);
          _local_880 = vandps_avx(auVar339,auVar139);
          auVar124._8_4_ = 3;
          auVar124._0_8_ = 0x300000003;
          auVar124._12_4_ = 3;
          auVar124._16_4_ = 3;
          auVar124._20_4_ = 3;
          auVar124._24_4_ = 3;
          auVar124._28_4_ = 3;
          auVar147._8_4_ = 2;
          auVar147._0_8_ = 0x200000002;
          auVar147._12_4_ = 2;
          auVar147._16_4_ = 2;
          auVar147._20_4_ = 2;
          auVar147._24_4_ = 2;
          auVar147._28_4_ = 2;
          auVar139 = vblendvps_avx(auVar147,auVar124,local_6a0);
          auVar228 = vpcmpgtd_avx(auVar139._16_16_,local_6e0);
          auVar208 = vpshufd_avx(local_6c0._0_16_,0);
          auVar208 = vpcmpgtd_avx(auVar139._0_16_,auVar208);
          auVar148._16_16_ = auVar228;
          auVar148._0_16_ = auVar208;
          auVar139 = vblendps_avx(ZEXT1632(auVar208),auVar148,0xf0);
          local_8a0 = vandnps_avx(auVar139,_local_880);
          local_760 = _local_460;
          local_b60._4_4_ = fVar343 + (float)local_460._4_4_;
          local_b60._0_4_ = fVar19 + (float)local_460._0_4_;
          fStack_b58 = fVar20 + fStack_458;
          fStack_b54 = fVar345 + fStack_454;
          fStack_b50 = fVar19 + fStack_450;
          fStack_b4c = fVar343 + fStack_44c;
          fStack_b48 = fVar20 + fStack_448;
          fStack_b44 = fVar345 + fStack_444;
          auVar359 = ZEXT3264(local_940);
          for (; (((((((local_8a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_8a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_8a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_8a0 >> 0x7f,0) != '\0') ||
                   (local_8a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_8a0 >> 0xbf,0) != '\0') ||
                 (local_8a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_8a0[0x1f] < '\0'; local_8a0 = vandps_avx(auVar339,local_8a0)) {
            auVar149._8_4_ = 0x7f800000;
            auVar149._0_8_ = 0x7f8000007f800000;
            auVar149._12_4_ = 0x7f800000;
            auVar149._16_4_ = 0x7f800000;
            auVar149._20_4_ = 0x7f800000;
            auVar149._24_4_ = 0x7f800000;
            auVar149._28_4_ = 0x7f800000;
            auVar339 = vblendvps_avx(auVar149,local_760,local_8a0);
            auVar26 = vshufps_avx(auVar339,auVar339,0xb1);
            auVar26 = vminps_avx(auVar339,auVar26);
            auVar25 = vshufpd_avx(auVar26,auVar26,5);
            auVar26 = vminps_avx(auVar26,auVar25);
            auVar25 = vperm2f128_avx(auVar26,auVar26,1);
            auVar26 = vminps_avx(auVar26,auVar25);
            auVar26 = vcmpps_avx(auVar339,auVar26,0);
            auVar25 = local_8a0 & auVar26;
            auVar339 = local_8a0;
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0x7f,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0xbf,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar25[0x1f] < '\0') {
              auVar339 = vandps_avx(auVar26,local_8a0);
            }
            uVar89 = vmovmskps_avx(auVar339);
            uVar98 = 0;
            if (uVar89 != 0) {
              for (; (uVar89 >> uVar98 & 1) == 0; uVar98 = uVar98 + 1) {
              }
            }
            uVar91 = (ulong)uVar98;
            *(undefined4 *)(local_8a0 + uVar91 * 4) = 0;
            fVar126 = local_1c0[uVar91];
            uVar98 = *(uint *)(local_440 + uVar91 * 4);
            fVar341 = auVar22._0_4_;
            if ((float)local_8f0._0_4_ < 0.0) {
              auVar291 = ZEXT1664(auVar291._0_16_);
              fVar341 = sqrtf((float)local_8f0._0_4_);
              auVar359 = ZEXT3264(local_940);
              uVar91 = extraout_RAX_03;
            }
            auVar208 = vminps_avx(auVar15,auVar23);
            auVar228 = vmaxps_avx(auVar15,auVar23);
            auVar190 = vminps_avx(auVar16,auVar24);
            auVar161 = vminps_avx(auVar208,auVar190);
            auVar208 = vmaxps_avx(auVar16,auVar24);
            auVar190 = vmaxps_avx(auVar228,auVar208);
            auVar195._8_4_ = 0x7fffffff;
            auVar195._0_8_ = 0x7fffffff7fffffff;
            auVar195._12_4_ = 0x7fffffff;
            auVar228 = vandps_avx(auVar161,auVar195);
            auVar208 = vandps_avx(auVar190,auVar195);
            auVar228 = vmaxps_avx(auVar228,auVar208);
            auVar208 = vmovshdup_avx(auVar228);
            auVar208 = vmaxss_avx(auVar208,auVar228);
            auVar228 = vshufpd_avx(auVar228,auVar228,1);
            auVar228 = vmaxss_avx(auVar228,auVar208);
            local_920 = auVar228._0_4_ * 1.9073486e-06;
            local_960._0_4_ = fVar341 * 1.9073486e-06;
            local_860._0_16_ = vshufps_avx(auVar190,auVar190,0xff);
            auVar228 = vinsertps_avx(ZEXT416(uVar98),ZEXT416((uint)fVar126),0x10);
            for (uVar97 = 0; bVar100 = (byte)uVar91, uVar97 != 5; uVar97 = uVar97 + 1) {
              auVar208 = vshufps_avx(auVar228,auVar228,0);
              auVar111._0_4_ = auVar208._0_4_ * (float)local_8e0._0_4_ + 0.0;
              auVar111._4_4_ = auVar208._4_4_ * (float)local_8e0._4_4_ + 0.0;
              auVar111._8_4_ = auVar208._8_4_ * fStack_8d8 + 0.0;
              auVar111._12_4_ = auVar208._12_4_ * fStack_8d4 + 0.0;
              auVar208 = vmovshdup_avx(auVar228);
              fVar280 = auVar208._0_4_;
              fVar270 = 1.0 - fVar280;
              fVar341 = fVar280 * 3.0;
              fVar126 = fVar341 + -5.0;
              fVar153 = fVar270 * fVar270;
              auVar208 = ZEXT416((uint)(fVar280 * fVar280 * -fVar270 * 0.5));
              auVar208 = vshufps_avx(auVar208,auVar208,0);
              auVar190 = ZEXT416((uint)((fVar153 * (fVar270 * 3.0 + -5.0) + 2.0) * 0.5));
              auVar190 = vshufps_avx(auVar190,auVar190,0);
              auVar161 = ZEXT416((uint)((fVar280 * fVar280 * fVar126 + 2.0) * 0.5));
              auVar161 = vshufps_avx(auVar161,auVar161,0);
              auVar107 = ZEXT416((uint)(fVar270 * fVar270 * -fVar280 * 0.5));
              auVar107 = vshufps_avx(auVar107,auVar107,0);
              auVar168._0_4_ =
                   auVar107._0_4_ * local_bf0 +
                   auVar161._0_4_ * local_aa0 +
                   auVar190._0_4_ * local_a90 + auVar208._0_4_ * local_ab0;
              auVar168._4_4_ =
                   auVar107._4_4_ * fStack_bec +
                   auVar161._4_4_ * fStack_a9c +
                   auVar190._4_4_ * fStack_a8c + auVar208._4_4_ * fStack_aac;
              auVar168._8_4_ =
                   auVar107._8_4_ * fStack_be8 +
                   auVar161._8_4_ * fStack_a98 +
                   auVar190._8_4_ * fStack_a88 + auVar208._8_4_ * fStack_aa8;
              auVar168._12_4_ =
                   auVar107._12_4_ * fStack_be4 +
                   auVar161._12_4_ * fStack_a94 +
                   auVar190._12_4_ * fStack_a84 + auVar208._12_4_ * fStack_aa4;
              _local_9e0 = auVar168;
              auVar190 = vsubps_avx(auVar111,auVar168);
              auVar208 = vdpps_avx(auVar190,auVar190,0x7f);
              fVar279 = auVar208._0_4_;
              if (fVar279 < 0.0) {
                local_980._0_4_ = fVar280 * 9.0;
                local_9a0._0_4_ = fVar126;
                local_9c0._0_4_ = fVar153;
                local_840._0_4_ = fVar270 * -2.0;
                fVar281 = sqrtf(fVar279);
                uVar91 = extraout_RAX_04;
                fVar126 = (float)local_9a0._0_4_;
                fVar258 = (float)local_980._0_4_;
                fVar248 = (float)local_840._0_4_;
                fVar153 = (float)local_9c0._0_4_;
              }
              else {
                auVar161 = vsqrtss_avx(auVar208,auVar208);
                fVar281 = auVar161._0_4_;
                fVar258 = fVar280 * 9.0;
                fVar248 = fVar270 * -2.0;
              }
              auVar161 = ZEXT416((uint)((fVar280 * fVar280 + fVar280 * fVar248) * 0.5));
              auVar161 = vshufps_avx(auVar161,auVar161,0);
              auVar107 = ZEXT416((uint)(((fVar270 + fVar270) * (fVar341 + 2.0) +
                                        fVar270 * fVar270 * -3.0) * 0.5));
              auVar107 = vshufps_avx(auVar107,auVar107,0);
              auVar101 = ZEXT416((uint)((fVar126 * (fVar280 + fVar280) + fVar280 * fVar341) * 0.5));
              auVar101 = vshufps_avx(auVar101,auVar101,0);
              auVar103 = ZEXT416((uint)((fVar280 * (fVar270 + fVar270) - fVar153) * 0.5));
              auVar103 = vshufps_avx(auVar103,auVar103,0);
              auVar338._0_4_ =
                   local_bf0 * auVar103._0_4_ +
                   local_aa0 * auVar101._0_4_ +
                   local_ab0 * auVar161._0_4_ + local_a90 * auVar107._0_4_;
              auVar338._4_4_ =
                   fStack_bec * auVar103._4_4_ +
                   fStack_a9c * auVar101._4_4_ +
                   fStack_aac * auVar161._4_4_ + fStack_a8c * auVar107._4_4_;
              auVar338._8_4_ =
                   fStack_be8 * auVar103._8_4_ +
                   fStack_a98 * auVar101._8_4_ +
                   fStack_aa8 * auVar161._8_4_ + fStack_a88 * auVar107._8_4_;
              auVar338._12_4_ =
                   fStack_be4 * auVar103._12_4_ +
                   fStack_a94 * auVar101._12_4_ +
                   fStack_aa4 * auVar161._12_4_ + fStack_a84 * auVar107._12_4_;
              auVar103 = vpermilps_avx(ZEXT416((uint)(fVar341 + -1.0)),0);
              auVar102 = vpermilps_avx(ZEXT416((uint)(fVar280 * -9.0 + 4.0)),0);
              auVar161 = vshufps_avx(ZEXT416((uint)(fVar258 + -5.0)),ZEXT416((uint)(fVar258 + -5.0))
                                     ,0);
              auVar107 = ZEXT416((uint)(fVar280 * -3.0 + 2.0));
              auVar101 = vshufps_avx(auVar107,auVar107,0);
              auVar107 = vdpps_avx(auVar338,auVar338,0x7f);
              auVar135._0_4_ =
                   local_bf0 * auVar101._0_4_ +
                   local_aa0 * auVar161._0_4_ +
                   local_a90 * auVar102._0_4_ + local_ab0 * auVar103._0_4_;
              auVar135._4_4_ =
                   fStack_bec * auVar101._4_4_ +
                   fStack_a9c * auVar161._4_4_ +
                   fStack_a8c * auVar102._4_4_ + fStack_aac * auVar103._4_4_;
              auVar135._8_4_ =
                   fStack_be8 * auVar101._8_4_ +
                   fStack_a98 * auVar161._8_4_ +
                   fStack_a88 * auVar102._8_4_ + fStack_aa8 * auVar103._8_4_;
              auVar135._12_4_ =
                   fStack_be4 * auVar101._12_4_ +
                   fStack_a94 * auVar161._12_4_ +
                   fStack_a84 * auVar102._12_4_ + fStack_aa4 * auVar103._12_4_;
              auVar161 = vblendps_avx(auVar107,_DAT_01f45a50,0xe);
              auVar101 = vrsqrtss_avx(auVar161,auVar161);
              fVar341 = auVar101._0_4_;
              fVar126 = auVar107._0_4_;
              auVar101 = vdpps_avx(auVar338,auVar135,0x7f);
              auVar103 = vshufps_avx(auVar107,auVar107,0);
              auVar136._0_4_ = auVar135._0_4_ * auVar103._0_4_;
              auVar136._4_4_ = auVar135._4_4_ * auVar103._4_4_;
              auVar136._8_4_ = auVar135._8_4_ * auVar103._8_4_;
              auVar136._12_4_ = auVar135._12_4_ * auVar103._12_4_;
              auVar101 = vshufps_avx(auVar101,auVar101,0);
              auVar211._0_4_ = auVar338._0_4_ * auVar101._0_4_;
              auVar211._4_4_ = auVar338._4_4_ * auVar101._4_4_;
              auVar211._8_4_ = auVar338._8_4_ * auVar101._8_4_;
              auVar211._12_4_ = auVar338._12_4_ * auVar101._12_4_;
              auVar102 = vsubps_avx(auVar136,auVar211);
              auVar101 = vrcpss_avx(auVar161,auVar161);
              auVar161 = vmaxss_avx(ZEXT416((uint)local_920),
                                    ZEXT416((uint)(auVar228._0_4_ * (float)local_960._0_4_)));
              auVar101 = ZEXT416((uint)(auVar101._0_4_ * (2.0 - fVar126 * auVar101._0_4_)));
              auVar101 = vshufps_avx(auVar101,auVar101,0);
              uVar79 = CONCAT44(auVar338._4_4_,auVar338._0_4_);
              auVar231._0_8_ = uVar79 ^ 0x8000000080000000;
              auVar231._8_4_ = -auVar338._8_4_;
              auVar231._12_4_ = -auVar338._12_4_;
              auVar103 = ZEXT416((uint)(fVar341 * 1.5 + fVar126 * -0.5 * fVar341 * fVar341 * fVar341
                                       ));
              auVar103 = vshufps_avx(auVar103,auVar103,0);
              auVar196._0_4_ = auVar103._0_4_ * auVar102._0_4_ * auVar101._0_4_;
              auVar196._4_4_ = auVar103._4_4_ * auVar102._4_4_ * auVar101._4_4_;
              auVar196._8_4_ = auVar103._8_4_ * auVar102._8_4_ * auVar101._8_4_;
              auVar196._12_4_ = auVar103._12_4_ * auVar102._12_4_ * auVar101._12_4_;
              auVar254._0_4_ = auVar338._0_4_ * auVar103._0_4_;
              auVar254._4_4_ = auVar338._4_4_ * auVar103._4_4_;
              auVar254._8_4_ = auVar338._8_4_ * auVar103._8_4_;
              auVar254._12_4_ = auVar338._12_4_ * auVar103._12_4_;
              if (fVar126 < 0.0) {
                fVar126 = sqrtf(fVar126);
                uVar91 = extraout_RAX_05;
              }
              else {
                auVar107 = vsqrtss_avx(auVar107,auVar107);
                fVar126 = auVar107._0_4_;
              }
              auVar107 = vdpps_avx(auVar190,auVar254,0x7f);
              fVar126 = (local_920 / fVar126) * (fVar281 + 1.0) +
                        fVar281 * local_920 + auVar161._0_4_;
              auVar101 = vdpps_avx(auVar231,auVar254,0x7f);
              auVar103 = vdpps_avx(auVar190,auVar196,0x7f);
              auVar102 = vdpps_avx(_local_8e0,auVar254,0x7f);
              auVar104 = vdpps_avx(auVar190,auVar231,0x7f);
              fVar341 = auVar101._0_4_ + auVar103._0_4_;
              fVar153 = auVar107._0_4_;
              auVar112._0_4_ = fVar153 * fVar153;
              auVar112._4_4_ = auVar107._4_4_ * auVar107._4_4_;
              auVar112._8_4_ = auVar107._8_4_ * auVar107._8_4_;
              auVar112._12_4_ = auVar107._12_4_ * auVar107._12_4_;
              auVar103 = vsubps_avx(auVar208,auVar112);
              auVar101 = vdpps_avx(auVar190,_local_8e0,0x7f);
              fVar270 = auVar104._0_4_ - fVar153 * fVar341;
              fVar280 = auVar101._0_4_ - fVar153 * auVar102._0_4_;
              auVar101 = vrsqrtss_avx(auVar103,auVar103);
              fVar281 = auVar103._0_4_;
              fVar153 = auVar101._0_4_;
              fVar153 = fVar153 * 1.5 + fVar281 * -0.5 * fVar153 * fVar153 * fVar153;
              if (fVar281 < 0.0) {
                local_980._0_4_ = fVar270;
                local_9a0._0_4_ = fVar280;
                local_9c0._0_4_ = fVar153;
                fVar281 = sqrtf(fVar281);
                uVar91 = extraout_RAX_06;
                fVar153 = (float)local_9c0._0_4_;
                fVar270 = (float)local_980._0_4_;
                fVar280 = (float)local_9a0._0_4_;
              }
              else {
                auVar101 = vsqrtss_avx(auVar103,auVar103);
                fVar281 = auVar101._0_4_;
              }
              auVar291 = ZEXT1664(auVar208);
              auVar359 = ZEXT3264(local_940);
              auVar104 = vpermilps_avx(_local_9e0,0xff);
              auVar128 = vshufps_avx(auVar338,auVar338,0xff);
              fVar270 = fVar270 * fVar153 - auVar128._0_4_;
              auVar212._0_8_ = auVar102._0_8_ ^ 0x8000000080000000;
              auVar212._8_4_ = auVar102._8_4_ ^ 0x80000000;
              auVar212._12_4_ = auVar102._12_4_ ^ 0x80000000;
              auVar232._0_4_ = -fVar270;
              auVar232._4_4_ = 0x80000000;
              auVar232._8_4_ = 0x80000000;
              auVar232._12_4_ = 0x80000000;
              auVar101 = vinsertps_avx(auVar232,ZEXT416((uint)(fVar280 * fVar153)),0x1c);
              auVar102 = vmovsldup_avx(ZEXT416((uint)(fVar341 * fVar280 * fVar153 -
                                                     auVar102._0_4_ * fVar270)));
              auVar101 = vdivps_avx(auVar101,auVar102);
              auVar103 = vinsertps_avx(ZEXT416((uint)fVar341),auVar212,0x10);
              auVar103 = vdivps_avx(auVar103,auVar102);
              auVar102 = vmovsldup_avx(auVar107);
              auVar133 = ZEXT416((uint)(fVar281 - auVar104._0_4_));
              auVar104 = vmovsldup_avx(auVar133);
              auVar169._0_4_ = auVar102._0_4_ * auVar101._0_4_ + auVar104._0_4_ * auVar103._0_4_;
              auVar169._4_4_ = auVar102._4_4_ * auVar101._4_4_ + auVar104._4_4_ * auVar103._4_4_;
              auVar169._8_4_ = auVar102._8_4_ * auVar101._8_4_ + auVar104._8_4_ * auVar103._8_4_;
              auVar169._12_4_ =
                   auVar102._12_4_ * auVar101._12_4_ + auVar104._12_4_ * auVar103._12_4_;
              auVar228 = vsubps_avx(auVar228,auVar169);
              auVar170._8_4_ = 0x7fffffff;
              auVar170._0_8_ = 0x7fffffff7fffffff;
              auVar170._12_4_ = 0x7fffffff;
              auVar107 = vandps_avx(auVar107,auVar170);
              if (auVar107._0_4_ < fVar126) {
                auVar197._8_4_ = 0x7fffffff;
                auVar197._0_8_ = 0x7fffffff7fffffff;
                auVar197._12_4_ = 0x7fffffff;
                auVar107 = vandps_avx(auVar133,auVar197);
                if (auVar107._0_4_ <
                    (float)local_860._0_4_ * 1.9073486e-06 + auVar161._0_4_ + fVar126) {
                  bVar99 = uVar97 < 5;
                  fVar126 = auVar228._0_4_ + (float)local_8d0._0_4_;
                  if (fVar126 < fVar334) {
                    bVar100 = 0;
                    goto LAB_0092ccce;
                  }
                  fVar341 = *(float *)(ray + k * 4 + 0x80);
                  if (fVar126 <= fVar341) {
                    auVar161 = vmovshdup_avx(auVar228);
                    bVar100 = 0;
                    if ((auVar161._0_4_ < 0.0) || (1.0 < auVar161._0_4_)) goto LAB_0092ccce;
                    auVar161 = vrsqrtss_avx(auVar208,auVar208);
                    fVar153 = auVar161._0_4_;
                    pGVar10 = (context->scene->geometries).items[uVar94].ptr;
                    if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (bVar100 = 1, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        auVar161 = ZEXT416((uint)(fVar153 * 1.5 +
                                                 fVar279 * -0.5 * fVar153 * fVar153 * fVar153));
                        auVar161 = vshufps_avx(auVar161,auVar161,0);
                        local_ba0._0_4_ = auVar190._0_4_;
                        local_ba0._4_4_ = auVar190._4_4_;
                        fStack_b98 = auVar190._8_4_;
                        fStack_b94 = auVar190._12_4_;
                        auVar171._0_4_ = auVar161._0_4_ * (float)local_ba0._0_4_;
                        auVar171._4_4_ = auVar161._4_4_ * (float)local_ba0._4_4_;
                        auVar171._8_4_ = auVar161._8_4_ * fStack_b98;
                        auVar171._12_4_ = auVar161._12_4_ * fStack_b94;
                        auVar113._0_4_ = auVar338._0_4_ + auVar128._0_4_ * auVar171._0_4_;
                        auVar113._4_4_ = auVar338._4_4_ + auVar128._4_4_ * auVar171._4_4_;
                        auVar113._8_4_ = auVar338._8_4_ + auVar128._8_4_ * auVar171._8_4_;
                        auVar113._12_4_ = auVar338._12_4_ + auVar128._12_4_ * auVar171._12_4_;
                        auVar190 = vshufps_avx(auVar171,auVar171,0xc9);
                        auVar161 = vshufps_avx(auVar338,auVar338,0xc9);
                        auVar172._0_4_ = auVar161._0_4_ * auVar171._0_4_;
                        auVar172._4_4_ = auVar161._4_4_ * auVar171._4_4_;
                        auVar172._8_4_ = auVar161._8_4_ * auVar171._8_4_;
                        auVar172._12_4_ = auVar161._12_4_ * auVar171._12_4_;
                        auVar198._0_4_ = auVar338._0_4_ * auVar190._0_4_;
                        auVar198._4_4_ = auVar338._4_4_ * auVar190._4_4_;
                        auVar198._8_4_ = auVar338._8_4_ * auVar190._8_4_;
                        auVar198._12_4_ = auVar338._12_4_ * auVar190._12_4_;
                        auVar107 = vsubps_avx(auVar198,auVar172);
                        auVar190 = vshufps_avx(auVar107,auVar107,0xc9);
                        auVar161 = vshufps_avx(auVar113,auVar113,0xc9);
                        auVar199._0_4_ = auVar161._0_4_ * auVar190._0_4_;
                        auVar199._4_4_ = auVar161._4_4_ * auVar190._4_4_;
                        auVar199._8_4_ = auVar161._8_4_ * auVar190._8_4_;
                        auVar199._12_4_ = auVar161._12_4_ * auVar190._12_4_;
                        auVar190 = vshufps_avx(auVar107,auVar107,0xd2);
                        auVar114._0_4_ = auVar113._0_4_ * auVar190._0_4_;
                        auVar114._4_4_ = auVar113._4_4_ * auVar190._4_4_;
                        auVar114._8_4_ = auVar113._8_4_ * auVar190._8_4_;
                        auVar114._12_4_ = auVar113._12_4_ * auVar190._12_4_;
                        auVar190 = vsubps_avx(auVar199,auVar114);
                        local_7d0 = vshufps_avx(auVar228,auVar228,0x55);
                        local_800 = (RTCHitN  [16])vshufps_avx(auVar190,auVar190,0x55);
                        auStack_7f0 = vshufps_avx(auVar190,auVar190,0xaa);
                        local_7e0 = vshufps_avx(auVar190,auVar190,0);
                        local_7c0 = ZEXT816(0) << 0x20;
                        local_7b0 = local_820._0_8_;
                        uStack_7a8 = local_820._8_8_;
                        local_7a0 = local_810;
                        vcmpps_avx(ZEXT1632(local_810),ZEXT1632(local_810),0xf);
                        uStack_78c = context->user->instID[0];
                        local_790 = uStack_78c;
                        uStack_788 = uStack_78c;
                        uStack_784 = uStack_78c;
                        uStack_780 = context->user->instPrimID[0];
                        uStack_77c = uStack_780;
                        uStack_778 = uStack_780;
                        uStack_774 = uStack_780;
                        *(float *)(ray + k * 4 + 0x80) = fVar126;
                        local_8c0 = *(undefined1 (*) [16])
                                     (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                        local_a10.valid = (int *)local_8c0;
                        local_a10.geometryUserPtr = pGVar10->userPtr;
                        local_a10.context = context->user;
                        local_a10.hit = local_800;
                        local_a10.N = 4;
                        local_a10.ray = (RTCRayN *)ray;
                        if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar291 = ZEXT1664(auVar208);
                          (*pGVar10->occlusionFilterN)(&local_a10);
                          auVar359 = ZEXT3264(local_940);
                        }
                        if (local_8c0 == (undefined1  [16])0x0) {
                          auVar228 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                          auVar228 = auVar228 ^ _DAT_01f46b70;
                        }
                        else {
                          p_Var14 = context->args->filter;
                          if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar291 = ZEXT1664(auVar291._0_16_);
                            (*p_Var14)(&local_a10);
                            auVar359 = ZEXT3264(local_940);
                          }
                          auVar208 = vpcmpeqd_avx(local_8c0,_DAT_01f45a50);
                          auVar228 = auVar208 ^ _DAT_01f46b70;
                          auVar173._8_4_ = 0xff800000;
                          auVar173._0_8_ = 0xff800000ff800000;
                          auVar173._12_4_ = 0xff800000;
                          auVar208 = vblendvps_avx(auVar173,*(undefined1 (*) [16])
                                                             (local_a10.ray + 0x80),auVar208);
                          *(undefined1 (*) [16])(local_a10.ray + 0x80) = auVar208;
                        }
                        auVar137._8_8_ = 0x100000001;
                        auVar137._0_8_ = 0x100000001;
                        bVar100 = (auVar137 & auVar228) != (undefined1  [16])0x0;
                        if (!(bool)bVar100) {
                          *(float *)(ray + k * 4 + 0x80) = fVar341;
                        }
                      }
                      goto LAB_0092ccce;
                    }
                  }
                  bVar100 = 0;
                  goto LAB_0092ccce;
                }
              }
            }
            bVar99 = false;
LAB_0092ccce:
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar117._4_4_ = uVar8;
            auVar117._0_4_ = uVar8;
            auVar117._8_4_ = uVar8;
            auVar117._12_4_ = uVar8;
            auVar117._16_4_ = uVar8;
            auVar117._20_4_ = uVar8;
            auVar117._24_4_ = uVar8;
            auVar117._28_4_ = uVar8;
            bVar93 = bVar93 | bVar99 & bVar100;
            auVar339 = vcmpps_avx(_local_b60,auVar117,2);
          }
          auVar339 = vandps_avx(auVar27,local_680);
          auVar139 = vandps_avx(auVar139,_local_880);
          auVar176._0_4_ = fVar19 + local_4a0._0_4_;
          auVar176._4_4_ = fVar343 + local_4a0._4_4_;
          auVar176._8_4_ = fVar20 + local_4a0._8_4_;
          auVar176._12_4_ = fVar345 + local_4a0._12_4_;
          auVar176._16_4_ = fVar19 + local_4a0._16_4_;
          auVar176._20_4_ = fVar343 + local_4a0._20_4_;
          auVar176._24_4_ = fVar20 + local_4a0._24_4_;
          auVar176._28_4_ = fVar345 + local_4a0._28_4_;
          auVar228 = vshufps_avx(auVar117._0_16_,auVar117._0_16_,0);
          auVar217._16_16_ = auVar228;
          auVar217._0_16_ = auVar228;
          auVar26 = vcmpps_avx(auVar176,auVar217,2);
          auVar339 = vandps_avx(auVar26,auVar339);
          auVar240._0_4_ = fVar19 + local_460._0_4_;
          auVar240._4_4_ = fVar343 + local_460._4_4_;
          auVar240._8_4_ = fVar20 + local_460._8_4_;
          auVar240._12_4_ = fVar345 + local_460._12_4_;
          auVar240._16_4_ = fVar19 + local_460._16_4_;
          auVar240._20_4_ = fVar343 + local_460._20_4_;
          auVar240._24_4_ = fVar20 + local_460._24_4_;
          auVar240._28_4_ = fVar345 + local_460._28_4_;
          auVar26 = vcmpps_avx(auVar240,auVar217,2);
          auVar219 = ZEXT3264(auVar26);
          auVar139 = vandps_avx(auVar26,auVar139);
          auVar139 = vorps_avx(auVar339,auVar139);
          if ((((((((auVar139 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar139 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar139 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar139 >> 0x7f,0) != '\0') ||
                (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar139 >> 0xbf,0) != '\0') ||
              (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar139[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar90 * 0x60) = auVar139;
            auVar139 = vblendvps_avx(_local_460,_local_4a0,auVar339);
            *(undefined1 (*) [32])(auStack_160 + uVar90 * 0x60) = auVar139;
            uVar91 = vmovlps_avx(local_650);
            (&uStack_140)[uVar90 * 0xc] = uVar91;
            auStack_138[uVar90 * 0x18] = local_c88 + 1;
            uVar90 = (ulong)((int)uVar90 + 1);
          }
          auVar318 = ZEXT3264(CONCAT428(0x7fffffff,
                                        CONCAT424(0x7fffffff,
                                                  CONCAT420(0x7fffffff,
                                                            CONCAT416(0x7fffffff,
                                                                      CONCAT412(0x7fffffff,
                                                                                CONCAT48(0x7fffffff,
                                                                                                                                                                                  
                                                  0x7fffffff7fffffff)))))));
        }
      }
    }
    while( true ) {
      uVar98 = (uint)uVar90;
      if (uVar98 == 0) {
        if (bVar93 != 0) goto LAB_0092d360;
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar115._4_4_ = uVar8;
        auVar115._0_4_ = uVar8;
        auVar115._8_4_ = uVar8;
        auVar115._12_4_ = uVar8;
        auVar17 = vcmpps_avx(local_660,auVar115,2);
        uVar94 = vmovmskps_avx(auVar17);
        uVar94 = (uint)local_8a8 - 1 & (uint)local_8a8 & uVar94;
        goto LAB_0092a5a7;
      }
      uVar90 = (ulong)(uVar98 - 1);
      lVar95 = uVar90 * 0x60;
      auVar139 = *(undefined1 (*) [32])(auStack_160 + lVar95);
      auVar125._0_4_ = fVar19 + auVar139._0_4_;
      auVar125._4_4_ = fVar343 + auVar139._4_4_;
      auVar125._8_4_ = fVar20 + auVar139._8_4_;
      auVar125._12_4_ = fVar345 + auVar139._12_4_;
      auVar125._16_4_ = fVar19 + auVar139._16_4_;
      auVar125._20_4_ = fVar343 + auVar139._20_4_;
      auVar125._24_4_ = fVar20 + auVar139._24_4_;
      auVar125._28_4_ = fVar345 + auVar139._28_4_;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar202._4_4_ = uVar8;
      auVar202._0_4_ = uVar8;
      auVar202._8_4_ = uVar8;
      auVar202._12_4_ = uVar8;
      auVar202._16_4_ = uVar8;
      auVar202._20_4_ = uVar8;
      auVar202._24_4_ = uVar8;
      auVar202._28_4_ = uVar8;
      auVar339 = vcmpps_avx(auVar125,auVar202,2);
      _local_800 = vandps_avx(auVar339,*(undefined1 (*) [32])(auStack_180 + lVar95));
      auVar339 = *(undefined1 (*) [32])(auStack_180 + lVar95) & auVar339;
      if ((((((((auVar339 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar339 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar339 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar339 >> 0x7f,0) != '\0') ||
            (auVar339 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar339 >> 0xbf,0) != '\0') ||
          (auVar339 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar339[0x1f] < '\0') break;
      uVar90 = (ulong)(uVar98 - 1);
    }
    auVar177._8_4_ = 0x7f800000;
    auVar177._0_8_ = 0x7f8000007f800000;
    auVar177._12_4_ = 0x7f800000;
    auVar177._16_4_ = 0x7f800000;
    auVar177._20_4_ = 0x7f800000;
    auVar177._24_4_ = 0x7f800000;
    auVar177._28_4_ = 0x7f800000;
    auVar139 = vblendvps_avx(auVar177,auVar139,_local_800);
    auVar339 = vshufps_avx(auVar139,auVar139,0xb1);
    auVar339 = vminps_avx(auVar139,auVar339);
    auVar26 = vshufpd_avx(auVar339,auVar339,5);
    auVar339 = vminps_avx(auVar339,auVar26);
    auVar26 = vperm2f128_avx(auVar339,auVar339,1);
    auVar339 = vminps_avx(auVar339,auVar26);
    auVar339 = vcmpps_avx(auVar139,auVar339,0);
    auVar26 = _local_800 & auVar339;
    auVar139 = _local_800;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0x7f,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar26 >> 0xbf,0) != '\0') ||
        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar26[0x1f] < '\0')
    {
      auVar139 = vandps_avx(auVar339,_local_800);
    }
    auVar138._8_8_ = 0;
    auVar138._0_8_ = (&uStack_140)[uVar90 * 0xc];
    local_c88 = auStack_138[uVar90 * 0x18];
    uVar92 = vmovmskps_avx(auVar139);
    uVar89 = 0;
    if (uVar92 != 0) {
      for (; (uVar92 >> uVar89 & 1) == 0; uVar89 = uVar89 + 1) {
      }
    }
    *(undefined4 *)(local_800 + (ulong)uVar89 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar95) = _local_800;
    uVar92 = uVar98 - 1;
    if ((((((((_local_800 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_800 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_800 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_800 >> 0x7f,0) != '\0') ||
          (_local_800 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_800 >> 0xbf,0) != '\0') ||
        (_local_800 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_800[0x1f] < '\0') {
      uVar92 = uVar98;
    }
    auVar228 = vshufps_avx(auVar138,auVar138,0);
    auVar208 = vshufps_avx(auVar138,auVar138,0x55);
    auVar208 = vsubps_avx(auVar208,auVar228);
    local_4a0._4_4_ = auVar228._4_4_ + auVar208._4_4_ * 0.14285715;
    local_4a0._0_4_ = auVar228._0_4_ + auVar208._0_4_ * 0.0;
    fStack_498 = auVar228._8_4_ + auVar208._8_4_ * 0.2857143;
    fStack_494 = auVar228._12_4_ + auVar208._12_4_ * 0.42857146;
    fStack_490 = auVar228._0_4_ + auVar208._0_4_ * 0.5714286;
    fStack_48c = auVar228._4_4_ + auVar208._4_4_ * 0.71428573;
    fStack_488 = auVar228._8_4_ + auVar208._8_4_ * 0.8571429;
    fStack_484 = auVar228._12_4_ + auVar208._12_4_;
    auVar318 = ZEXT864(*(ulong *)(local_4a0 + (ulong)uVar89 * 4));
    uVar90 = (ulong)uVar92;
    auVar339 = auVar359._0_32_;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }